

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx::CurveNvIntersector1<8>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  uint uVar19;
  code *pcVar20;
  RTCFilterFunctionN p_Var21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  long lVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [12];
  undefined1 auVar128 [28];
  undefined1 auVar129 [28];
  undefined1 auVar130 [24];
  undefined1 auVar131 [28];
  int iVar132;
  Geometry *pGVar133;
  long lVar134;
  RTCIntersectArguments *pRVar135;
  uint uVar136;
  ulong uVar137;
  Geometry *pGVar138;
  undefined1 auVar171 [32];
  undefined1 auVar183 [16];
  long lVar139;
  bool bVar140;
  ulong uVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar158;
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar159;
  float fVar162;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar160;
  float fVar166;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar167;
  float fVar180;
  float fVar181;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar182;
  float fVar184;
  undefined1 auVar175 [32];
  float fVar185;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar188 [16];
  float fVar187;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar254 [16];
  float fVar186;
  undefined1 auVar192 [16];
  float fVar198;
  float fVar200;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar199;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar196 [32];
  float fVar204;
  undefined1 auVar197 [32];
  float fVar205;
  float fVar206;
  float fVar222;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar220;
  float fVar221;
  float fVar224;
  float fVar227;
  float fVar230;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar223;
  float fVar225;
  float fVar226;
  float fVar228;
  float fVar229;
  float fVar231;
  float fVar232;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  float fVar233;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar234 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar235 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar249;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar242 [64];
  float fVar250;
  float fVar261;
  float fVar262;
  undefined1 auVar251 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar255 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar263;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar268 [16];
  float fVar267;
  float fVar274;
  float fVar275;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float fVar276;
  undefined1 auVar272 [32];
  float fVar277;
  float fVar278;
  undefined1 auVar273 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar290;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  float fVar302;
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [64];
  float fVar303;
  float fVar304;
  float fVar313;
  float fVar315;
  float fVar317;
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar314;
  float fVar316;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [64];
  float fVar318;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [64];
  float fVar332;
  float fVar341;
  float fVar342;
  float fVar343;
  float in_register_0000151c;
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar344;
  float fVar345;
  float fVar349;
  float fVar351;
  float fVar353;
  undefined1 auVar346 [32];
  float fVar350;
  float fVar352;
  float fVar354;
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  float fVar355;
  float fVar356;
  float fVar359;
  float fVar361;
  float fVar363;
  float in_register_0000159c;
  undefined1 auVar357 [32];
  float fVar360;
  float fVar362;
  float fVar364;
  undefined1 auVar358 [32];
  float fVar365;
  float fVar368;
  float fVar369;
  float fVar370;
  float in_register_000015dc;
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_7a4;
  Precalculations *local_7a0;
  undefined4 local_794;
  undefined1 local_790 [8];
  undefined8 uStack_788;
  uint local_780;
  undefined4 uStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_750 [16];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [8];
  undefined1 auStack_718 [8];
  undefined1 auStack_710 [8];
  float fStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [48];
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined4 local_5f8;
  float local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  uint local_5e8;
  uint local_5e4;
  uint local_5e0;
  undefined1 local_5d0 [8];
  undefined8 uStack_5c8;
  undefined1 local_5c0 [8];
  undefined8 uStack_5b8;
  undefined1 local_5b0 [8];
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [64];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  uint local_2c0;
  uint local_2bc;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 local_260 [32];
  float local_240 [4];
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar18 = prim[1];
  uVar141 = (ulong)(byte)PVar18;
  lVar139 = uVar141 * 5;
  lVar114 = uVar141 * 0x19;
  fVar205 = *(float *)(prim + lVar114 + 0x12);
  auVar183 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar114 + 6));
  auVar251._0_4_ = fVar205 * (ray->dir).field_0.m128[0];
  auVar251._4_4_ = fVar205 * (ray->dir).field_0.m128[1];
  auVar251._8_4_ = fVar205 * (ray->dir).field_0.m128[2];
  auVar251._12_4_ = fVar205 * (ray->dir).field_0.m128[3];
  auVar254 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 4 + 6)));
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 4 + 10)));
  auVar168._0_4_ = fVar205 * auVar183._0_4_;
  auVar168._4_4_ = fVar205 * auVar183._4_4_;
  auVar168._8_4_ = fVar205 * auVar183._8_4_;
  auVar168._12_4_ = fVar205 * auVar183._12_4_;
  auVar147._16_16_ = auVar191;
  auVar147._0_16_ = auVar254;
  auVar254 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar139 + 6)));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar139 + 10)));
  auVar193._16_16_ = auVar191;
  auVar193._0_16_ = auVar254;
  auVar306 = vcvtdq2ps_avx(auVar193);
  auVar254 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 6 + 6)));
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 6 + 10)));
  auVar212._16_16_ = auVar191;
  auVar212._0_16_ = auVar254;
  auVar254 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 0xb + 6)));
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 0xb + 10)));
  auVar23 = vcvtdq2ps_avx(auVar212);
  auVar213._16_16_ = auVar191;
  auVar213._0_16_ = auVar254;
  auVar24 = vcvtdq2ps_avx(auVar213);
  uVar137 = (ulong)((uint)(byte)PVar18 * 0xc);
  auVar254 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 6)));
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 10)));
  auVar269._16_16_ = auVar191;
  auVar269._0_16_ = auVar254;
  auVar254 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + uVar141 + 6)));
  auVar25 = vcvtdq2ps_avx(auVar269);
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + uVar141 + 10)));
  auVar279._16_16_ = auVar191;
  auVar279._0_16_ = auVar254;
  lVar134 = uVar141 * 9;
  uVar137 = (ulong)(uint)((int)lVar134 * 2);
  auVar254 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 6)));
  auVar26 = vcvtdq2ps_avx(auVar279);
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 10)));
  auVar280._16_16_ = auVar191;
  auVar280._0_16_ = auVar254;
  auVar27 = vcvtdq2ps_avx(auVar280);
  auVar254 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + uVar141 + 6)));
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + uVar141 + 10)));
  auVar305._16_16_ = auVar191;
  auVar305._0_16_ = auVar254;
  uVar137 = (ulong)(uint)((int)lVar139 << 2);
  auVar254 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 6)));
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 10)));
  auVar28 = vcvtdq2ps_avx(auVar305);
  auVar319._16_16_ = auVar191;
  auVar319._0_16_ = auVar254;
  auVar29 = vcvtdq2ps_avx(auVar319);
  auVar254 = vshufps_avx(auVar251,auVar251,0);
  auVar191 = vshufps_avx(auVar251,auVar251,0x55);
  auVar183 = vshufps_avx(auVar251,auVar251,0xaa);
  fVar205 = auVar183._0_4_;
  fVar220 = auVar183._4_4_;
  fVar221 = auVar183._8_4_;
  fVar222 = auVar183._12_4_;
  fVar224 = auVar191._0_4_;
  fVar227 = auVar191._4_4_;
  fVar230 = auVar191._8_4_;
  fVar233 = auVar191._12_4_;
  fVar243 = auVar254._0_4_;
  fVar244 = auVar254._4_4_;
  fVar245 = auVar254._8_4_;
  fVar246 = auVar254._12_4_;
  auVar333._0_4_ = fVar243 * auVar147._0_4_ + fVar224 * auVar306._0_4_ + fVar205 * auVar23._0_4_;
  auVar333._4_4_ = fVar244 * auVar147._4_4_ + fVar227 * auVar306._4_4_ + fVar220 * auVar23._4_4_;
  auVar333._8_4_ = fVar245 * auVar147._8_4_ + fVar230 * auVar306._8_4_ + fVar221 * auVar23._8_4_;
  auVar333._12_4_ = fVar246 * auVar147._12_4_ + fVar233 * auVar306._12_4_ + fVar222 * auVar23._12_4_
  ;
  auVar333._16_4_ = fVar243 * auVar147._16_4_ + fVar224 * auVar306._16_4_ + fVar205 * auVar23._16_4_
  ;
  auVar333._20_4_ = fVar244 * auVar147._20_4_ + fVar227 * auVar306._20_4_ + fVar220 * auVar23._20_4_
  ;
  auVar333._24_4_ = fVar245 * auVar147._24_4_ + fVar230 * auVar306._24_4_ + fVar221 * auVar23._24_4_
  ;
  auVar333._28_4_ = fVar233 + in_register_000015dc + in_register_0000151c;
  auVar328._0_4_ = fVar243 * auVar24._0_4_ + fVar224 * auVar25._0_4_ + auVar26._0_4_ * fVar205;
  auVar328._4_4_ = fVar244 * auVar24._4_4_ + fVar227 * auVar25._4_4_ + auVar26._4_4_ * fVar220;
  auVar328._8_4_ = fVar245 * auVar24._8_4_ + fVar230 * auVar25._8_4_ + auVar26._8_4_ * fVar221;
  auVar328._12_4_ = fVar246 * auVar24._12_4_ + fVar233 * auVar25._12_4_ + auVar26._12_4_ * fVar222;
  auVar328._16_4_ = fVar243 * auVar24._16_4_ + fVar224 * auVar25._16_4_ + auVar26._16_4_ * fVar205;
  auVar328._20_4_ = fVar244 * auVar24._20_4_ + fVar227 * auVar25._20_4_ + auVar26._20_4_ * fVar220;
  auVar328._24_4_ = fVar245 * auVar24._24_4_ + fVar230 * auVar25._24_4_ + auVar26._24_4_ * fVar221;
  auVar328._28_4_ = fVar233 + in_register_000015dc + in_register_0000159c;
  auVar255._0_4_ = fVar243 * auVar27._0_4_ + fVar224 * auVar28._0_4_ + auVar29._0_4_ * fVar205;
  auVar255._4_4_ = fVar244 * auVar27._4_4_ + fVar227 * auVar28._4_4_ + auVar29._4_4_ * fVar220;
  auVar255._8_4_ = fVar245 * auVar27._8_4_ + fVar230 * auVar28._8_4_ + auVar29._8_4_ * fVar221;
  auVar255._12_4_ = fVar246 * auVar27._12_4_ + fVar233 * auVar28._12_4_ + auVar29._12_4_ * fVar222;
  auVar255._16_4_ = fVar243 * auVar27._16_4_ + fVar224 * auVar28._16_4_ + auVar29._16_4_ * fVar205;
  auVar255._20_4_ = fVar244 * auVar27._20_4_ + fVar227 * auVar28._20_4_ + auVar29._20_4_ * fVar220;
  auVar255._24_4_ = fVar245 * auVar27._24_4_ + fVar230 * auVar28._24_4_ + auVar29._24_4_ * fVar221;
  auVar255._28_4_ = fVar246 + fVar233 + fVar222;
  auVar254 = vshufps_avx(auVar168,auVar168,0);
  auVar191 = vshufps_avx(auVar168,auVar168,0x55);
  auVar183 = vshufps_avx(auVar168,auVar168,0xaa);
  fVar220 = auVar183._0_4_;
  fVar221 = auVar183._4_4_;
  fVar222 = auVar183._8_4_;
  fVar224 = auVar183._12_4_;
  fVar244 = auVar191._0_4_;
  fVar245 = auVar191._4_4_;
  fVar246 = auVar191._8_4_;
  fVar247 = auVar191._12_4_;
  fVar227 = auVar254._0_4_;
  fVar230 = auVar254._4_4_;
  fVar233 = auVar254._8_4_;
  fVar243 = auVar254._12_4_;
  fVar205 = auVar147._28_4_;
  auVar270._0_4_ = fVar227 * auVar147._0_4_ + fVar244 * auVar306._0_4_ + fVar220 * auVar23._0_4_;
  auVar270._4_4_ = fVar230 * auVar147._4_4_ + fVar245 * auVar306._4_4_ + fVar221 * auVar23._4_4_;
  auVar270._8_4_ = fVar233 * auVar147._8_4_ + fVar246 * auVar306._8_4_ + fVar222 * auVar23._8_4_;
  auVar270._12_4_ = fVar243 * auVar147._12_4_ + fVar247 * auVar306._12_4_ + fVar224 * auVar23._12_4_
  ;
  auVar270._16_4_ = fVar227 * auVar147._16_4_ + fVar244 * auVar306._16_4_ + fVar220 * auVar23._16_4_
  ;
  auVar270._20_4_ = fVar230 * auVar147._20_4_ + fVar245 * auVar306._20_4_ + fVar221 * auVar23._20_4_
  ;
  auVar270._24_4_ = fVar233 * auVar147._24_4_ + fVar246 * auVar306._24_4_ + fVar222 * auVar23._24_4_
  ;
  auVar270._28_4_ = fVar205 + auVar306._28_4_ + auVar23._28_4_;
  auVar171._0_4_ = fVar227 * auVar24._0_4_ + auVar26._0_4_ * fVar220 + fVar244 * auVar25._0_4_;
  auVar171._4_4_ = fVar230 * auVar24._4_4_ + auVar26._4_4_ * fVar221 + fVar245 * auVar25._4_4_;
  auVar171._8_4_ = fVar233 * auVar24._8_4_ + auVar26._8_4_ * fVar222 + fVar246 * auVar25._8_4_;
  auVar171._12_4_ = fVar243 * auVar24._12_4_ + auVar26._12_4_ * fVar224 + fVar247 * auVar25._12_4_;
  auVar171._16_4_ = fVar227 * auVar24._16_4_ + auVar26._16_4_ * fVar220 + fVar244 * auVar25._16_4_;
  auVar171._20_4_ = fVar230 * auVar24._20_4_ + auVar26._20_4_ * fVar221 + fVar245 * auVar25._20_4_;
  auVar171._24_4_ = fVar233 * auVar24._24_4_ + auVar26._24_4_ * fVar222 + fVar246 * auVar25._24_4_;
  auVar171._28_4_ = fVar205 + auVar26._28_4_ + auVar23._28_4_;
  auVar281._8_4_ = 0x7fffffff;
  auVar281._0_8_ = 0x7fffffff7fffffff;
  auVar281._12_4_ = 0x7fffffff;
  auVar281._16_4_ = 0x7fffffff;
  auVar281._20_4_ = 0x7fffffff;
  auVar281._24_4_ = 0x7fffffff;
  auVar281._28_4_ = 0x7fffffff;
  auVar194._8_4_ = 0x219392ef;
  auVar194._0_8_ = 0x219392ef219392ef;
  auVar194._12_4_ = 0x219392ef;
  auVar194._16_4_ = 0x219392ef;
  auVar194._20_4_ = 0x219392ef;
  auVar194._24_4_ = 0x219392ef;
  auVar194._28_4_ = 0x219392ef;
  auVar147 = vandps_avx(auVar333,auVar281);
  auVar147 = vcmpps_avx(auVar147,auVar194,1);
  auVar306 = vblendvps_avx(auVar333,auVar194,auVar147);
  auVar147 = vandps_avx(auVar328,auVar281);
  auVar147 = vcmpps_avx(auVar147,auVar194,1);
  auVar23 = vblendvps_avx(auVar328,auVar194,auVar147);
  auVar147 = vandps_avx(auVar255,auVar281);
  auVar147 = vcmpps_avx(auVar147,auVar194,1);
  auVar147 = vblendvps_avx(auVar255,auVar194,auVar147);
  auVar195._0_4_ = fVar244 * auVar28._0_4_ + auVar29._0_4_ * fVar220 + fVar227 * auVar27._0_4_;
  auVar195._4_4_ = fVar245 * auVar28._4_4_ + auVar29._4_4_ * fVar221 + fVar230 * auVar27._4_4_;
  auVar195._8_4_ = fVar246 * auVar28._8_4_ + auVar29._8_4_ * fVar222 + fVar233 * auVar27._8_4_;
  auVar195._12_4_ = fVar247 * auVar28._12_4_ + auVar29._12_4_ * fVar224 + fVar243 * auVar27._12_4_;
  auVar195._16_4_ = fVar244 * auVar28._16_4_ + auVar29._16_4_ * fVar220 + fVar227 * auVar27._16_4_;
  auVar195._20_4_ = fVar245 * auVar28._20_4_ + auVar29._20_4_ * fVar221 + fVar230 * auVar27._20_4_;
  auVar195._24_4_ = fVar246 * auVar28._24_4_ + auVar29._24_4_ * fVar222 + fVar233 * auVar27._24_4_;
  auVar195._28_4_ = auVar25._28_4_ + fVar224 + fVar205;
  auVar24 = vrcpps_avx(auVar306);
  fVar205 = auVar24._0_4_;
  fVar220 = auVar24._4_4_;
  auVar25._4_4_ = auVar306._4_4_ * fVar220;
  auVar25._0_4_ = auVar306._0_4_ * fVar205;
  fVar221 = auVar24._8_4_;
  auVar25._8_4_ = auVar306._8_4_ * fVar221;
  fVar222 = auVar24._12_4_;
  auVar25._12_4_ = auVar306._12_4_ * fVar222;
  fVar224 = auVar24._16_4_;
  auVar25._16_4_ = auVar306._16_4_ * fVar224;
  fVar227 = auVar24._20_4_;
  auVar25._20_4_ = auVar306._20_4_ * fVar227;
  fVar230 = auVar24._24_4_;
  auVar25._24_4_ = auVar306._24_4_ * fVar230;
  auVar25._28_4_ = auVar306._28_4_;
  auVar291._8_4_ = 0x3f800000;
  auVar291._0_8_ = 0x3f8000003f800000;
  auVar291._12_4_ = 0x3f800000;
  auVar291._16_4_ = 0x3f800000;
  auVar291._20_4_ = 0x3f800000;
  auVar291._24_4_ = 0x3f800000;
  auVar291._28_4_ = 0x3f800000;
  auVar25 = vsubps_avx(auVar291,auVar25);
  auVar306 = vrcpps_avx(auVar23);
  fVar205 = fVar205 + fVar205 * auVar25._0_4_;
  fVar220 = fVar220 + fVar220 * auVar25._4_4_;
  fVar221 = fVar221 + fVar221 * auVar25._8_4_;
  fVar222 = fVar222 + fVar222 * auVar25._12_4_;
  fVar224 = fVar224 + fVar224 * auVar25._16_4_;
  fVar227 = fVar227 + fVar227 * auVar25._20_4_;
  fVar230 = fVar230 + fVar230 * auVar25._24_4_;
  fVar250 = auVar306._0_4_;
  fVar261 = auVar306._4_4_;
  auVar26._4_4_ = fVar261 * auVar23._4_4_;
  auVar26._0_4_ = fVar250 * auVar23._0_4_;
  fVar262 = auVar306._8_4_;
  auVar26._8_4_ = fVar262 * auVar23._8_4_;
  fVar263 = auVar306._12_4_;
  auVar26._12_4_ = fVar263 * auVar23._12_4_;
  fVar264 = auVar306._16_4_;
  auVar26._16_4_ = fVar264 * auVar23._16_4_;
  fVar265 = auVar306._20_4_;
  auVar26._20_4_ = fVar265 * auVar23._20_4_;
  fVar266 = auVar306._24_4_;
  auVar26._24_4_ = fVar266 * auVar23._24_4_;
  auVar26._28_4_ = auVar24._28_4_;
  auVar306 = vsubps_avx(auVar291,auVar26);
  fVar250 = fVar250 + fVar250 * auVar306._0_4_;
  fVar261 = fVar261 + fVar261 * auVar306._4_4_;
  fVar262 = fVar262 + fVar262 * auVar306._8_4_;
  fVar263 = fVar263 + fVar263 * auVar306._12_4_;
  fVar264 = fVar264 + fVar264 * auVar306._16_4_;
  fVar265 = fVar265 + fVar265 * auVar306._20_4_;
  fVar266 = fVar266 + fVar266 * auVar306._24_4_;
  auVar306 = vrcpps_avx(auVar147);
  fVar233 = auVar306._0_4_;
  fVar243 = auVar306._4_4_;
  auVar27._4_4_ = fVar243 * auVar147._4_4_;
  auVar27._0_4_ = fVar233 * auVar147._0_4_;
  fVar244 = auVar306._8_4_;
  auVar27._8_4_ = fVar244 * auVar147._8_4_;
  fVar245 = auVar306._12_4_;
  auVar27._12_4_ = fVar245 * auVar147._12_4_;
  fVar246 = auVar306._16_4_;
  auVar27._16_4_ = fVar246 * auVar147._16_4_;
  fVar247 = auVar306._20_4_;
  auVar27._20_4_ = fVar247 * auVar147._20_4_;
  fVar248 = auVar306._24_4_;
  auVar27._24_4_ = fVar248 * auVar147._24_4_;
  auVar27._28_4_ = auVar23._28_4_;
  auVar147 = vsubps_avx(auVar291,auVar27);
  fVar233 = fVar233 + fVar233 * auVar147._0_4_;
  fVar243 = fVar243 + fVar243 * auVar147._4_4_;
  fVar244 = fVar244 + fVar244 * auVar147._8_4_;
  fVar245 = fVar245 + fVar245 * auVar147._12_4_;
  fVar246 = fVar246 + fVar246 * auVar147._16_4_;
  fVar247 = fVar247 + fVar247 * auVar147._20_4_;
  fVar248 = fVar248 + fVar248 * auVar147._24_4_;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = *(ulong *)(prim + uVar141 * 7 + 6);
  auVar254 = vpmovsxwd_avx(auVar254);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + uVar141 * 7 + 0xe);
  auVar191 = vpmovsxwd_avx(auVar191);
  auVar148._16_16_ = auVar191;
  auVar148._0_16_ = auVar254;
  auVar147 = vcvtdq2ps_avx(auVar148);
  auVar147 = vsubps_avx(auVar147,auVar270);
  auVar145._0_4_ = fVar205 * auVar147._0_4_;
  auVar145._4_4_ = fVar220 * auVar147._4_4_;
  auVar145._8_4_ = fVar221 * auVar147._8_4_;
  auVar145._12_4_ = fVar222 * auVar147._12_4_;
  auVar23._16_4_ = fVar224 * auVar147._16_4_;
  auVar23._0_16_ = auVar145;
  auVar23._20_4_ = fVar227 * auVar147._20_4_;
  auVar23._24_4_ = fVar230 * auVar147._24_4_;
  auVar23._28_4_ = auVar147._28_4_;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + lVar134 + 6);
  auVar254 = vpmovsxwd_avx(auVar183);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar134 + 0xe);
  auVar191 = vpmovsxwd_avx(auVar9);
  auVar282._16_16_ = auVar191;
  auVar282._0_16_ = auVar254;
  auVar147 = vcvtdq2ps_avx(auVar282);
  auVar147 = vsubps_avx(auVar147,auVar270);
  auVar207._0_4_ = fVar205 * auVar147._0_4_;
  auVar207._4_4_ = fVar220 * auVar147._4_4_;
  auVar207._8_4_ = fVar221 * auVar147._8_4_;
  auVar207._12_4_ = fVar222 * auVar147._12_4_;
  auVar28._16_4_ = fVar224 * auVar147._16_4_;
  auVar28._0_16_ = auVar207;
  auVar28._20_4_ = fVar227 * auVar147._20_4_;
  auVar28._24_4_ = fVar230 * auVar147._24_4_;
  auVar28._28_4_ = auVar24._28_4_ + auVar25._28_4_;
  lVar139 = (ulong)(byte)PVar18 * 0x10;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar139 + 6);
  auVar254 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar139 + 0xe);
  auVar191 = vpmovsxwd_avx(auVar11);
  lVar139 = lVar139 + uVar141 * -2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar139 + 6);
  auVar183 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar139 + 0xe);
  auVar9 = vpmovsxwd_avx(auVar13);
  auVar271._16_16_ = auVar9;
  auVar271._0_16_ = auVar183;
  auVar147 = vcvtdq2ps_avx(auVar271);
  auVar147 = vsubps_avx(auVar147,auVar171);
  auVar268._0_4_ = fVar250 * auVar147._0_4_;
  auVar268._4_4_ = fVar261 * auVar147._4_4_;
  auVar268._8_4_ = fVar262 * auVar147._8_4_;
  auVar268._12_4_ = fVar263 * auVar147._12_4_;
  auVar24._16_4_ = fVar264 * auVar147._16_4_;
  auVar24._0_16_ = auVar268;
  auVar24._20_4_ = fVar265 * auVar147._20_4_;
  auVar24._24_4_ = fVar266 * auVar147._24_4_;
  auVar24._28_4_ = auVar147._28_4_;
  auVar283._16_16_ = auVar191;
  auVar283._0_16_ = auVar254;
  auVar147 = vcvtdq2ps_avx(auVar283);
  auVar147 = vsubps_avx(auVar147,auVar171);
  auVar169._0_4_ = fVar250 * auVar147._0_4_;
  auVar169._4_4_ = fVar261 * auVar147._4_4_;
  auVar169._8_4_ = fVar262 * auVar147._8_4_;
  auVar169._12_4_ = fVar263 * auVar147._12_4_;
  auVar306._16_4_ = fVar264 * auVar147._16_4_;
  auVar306._0_16_ = auVar169;
  auVar306._20_4_ = fVar265 * auVar147._20_4_;
  auVar306._24_4_ = fVar266 * auVar147._24_4_;
  auVar306._28_4_ = auVar147._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar137 + uVar141 + 6);
  auVar254 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar137 + uVar141 + 0xe);
  auVar191 = vpmovsxwd_avx(auVar15);
  auVar256._16_16_ = auVar191;
  auVar256._0_16_ = auVar254;
  auVar147 = vcvtdq2ps_avx(auVar256);
  auVar147 = vsubps_avx(auVar147,auVar195);
  auVar252._0_4_ = fVar233 * auVar147._0_4_;
  auVar252._4_4_ = fVar243 * auVar147._4_4_;
  auVar252._8_4_ = fVar244 * auVar147._8_4_;
  auVar252._12_4_ = fVar245 * auVar147._12_4_;
  auVar29._16_4_ = fVar246 * auVar147._16_4_;
  auVar29._0_16_ = auVar252;
  auVar29._20_4_ = fVar247 * auVar147._20_4_;
  auVar29._24_4_ = fVar248 * auVar147._24_4_;
  auVar29._28_4_ = auVar147._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar141 * 0x17 + 6);
  auVar254 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar141 * 0x17 + 0xe);
  auVar191 = vpmovsxwd_avx(auVar17);
  auVar284._16_16_ = auVar191;
  auVar284._0_16_ = auVar254;
  auVar147 = vcvtdq2ps_avx(auVar284);
  auVar147 = vsubps_avx(auVar147,auVar195);
  auVar188._0_4_ = fVar233 * auVar147._0_4_;
  auVar188._4_4_ = fVar243 * auVar147._4_4_;
  auVar188._8_4_ = fVar244 * auVar147._8_4_;
  auVar188._12_4_ = fVar245 * auVar147._12_4_;
  auVar30._16_4_ = fVar246 * auVar147._16_4_;
  auVar30._0_16_ = auVar188;
  auVar30._20_4_ = fVar247 * auVar147._20_4_;
  auVar30._24_4_ = fVar248 * auVar147._24_4_;
  auVar30._28_4_ = auVar147._28_4_;
  auVar254 = vpminsd_avx(auVar23._16_16_,auVar28._16_16_);
  auVar191 = vpminsd_avx(auVar145,auVar207);
  auVar292._16_16_ = auVar254;
  auVar292._0_16_ = auVar191;
  auVar183 = auVar306._16_16_;
  auVar312 = ZEXT1664(auVar183);
  auVar254 = vpminsd_avx(auVar24._16_16_,auVar183);
  auVar191 = vpminsd_avx(auVar268,auVar169);
  auVar329._16_16_ = auVar254;
  auVar329._0_16_ = auVar191;
  auVar147 = vmaxps_avx(auVar292,auVar329);
  auVar254 = vpminsd_avx(auVar29._16_16_,auVar30._16_16_);
  auVar191 = vpminsd_avx(auVar252,auVar188);
  auVar346._16_16_ = auVar254;
  auVar346._0_16_ = auVar191;
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar357._4_4_ = uVar7;
  auVar357._0_4_ = uVar7;
  auVar357._8_4_ = uVar7;
  auVar357._12_4_ = uVar7;
  auVar357._16_4_ = uVar7;
  auVar357._20_4_ = uVar7;
  auVar357._24_4_ = uVar7;
  auVar357._28_4_ = uVar7;
  auVar306 = vmaxps_avx(auVar346,auVar357);
  auVar147 = vmaxps_avx(auVar147,auVar306);
  local_80._4_4_ = auVar147._4_4_ * 0.99999964;
  local_80._0_4_ = auVar147._0_4_ * 0.99999964;
  local_80._8_4_ = auVar147._8_4_ * 0.99999964;
  local_80._12_4_ = auVar147._12_4_ * 0.99999964;
  local_80._16_4_ = auVar147._16_4_ * 0.99999964;
  local_80._20_4_ = auVar147._20_4_ * 0.99999964;
  local_80._24_4_ = auVar147._24_4_ * 0.99999964;
  local_80._28_4_ = auVar147._28_4_;
  auVar295 = ZEXT3264(local_80);
  auVar254 = vpmaxsd_avx(auVar23._16_16_,auVar28._16_16_);
  auVar191 = vpmaxsd_avx(auVar145,auVar207);
  auVar149._16_16_ = auVar254;
  auVar149._0_16_ = auVar191;
  auVar254 = vpmaxsd_avx(auVar24._16_16_,auVar183);
  auVar191 = vpmaxsd_avx(auVar268,auVar169);
  auVar172._16_16_ = auVar254;
  auVar172._0_16_ = auVar191;
  auVar147 = vminps_avx(auVar149,auVar172);
  auVar254 = vpmaxsd_avx(auVar29._16_16_,auVar30._16_16_);
  auVar191 = vpmaxsd_avx(auVar252,auVar188);
  fVar205 = ray->tfar;
  auVar214._4_4_ = fVar205;
  auVar214._0_4_ = fVar205;
  auVar214._8_4_ = fVar205;
  auVar214._12_4_ = fVar205;
  auVar214._16_4_ = fVar205;
  auVar214._20_4_ = fVar205;
  auVar214._24_4_ = fVar205;
  auVar214._28_4_ = fVar205;
  auVar173._16_16_ = auVar254;
  auVar173._0_16_ = auVar191;
  auVar306 = vminps_avx(auVar173,auVar214);
  auVar147 = vminps_avx(auVar147,auVar306);
  auVar22._4_4_ = auVar147._4_4_ * 1.0000004;
  auVar22._0_4_ = auVar147._0_4_ * 1.0000004;
  auVar22._8_4_ = auVar147._8_4_ * 1.0000004;
  auVar22._12_4_ = auVar147._12_4_ * 1.0000004;
  auVar22._16_4_ = auVar147._16_4_ * 1.0000004;
  auVar22._20_4_ = auVar147._20_4_ * 1.0000004;
  auVar22._24_4_ = auVar147._24_4_ * 1.0000004;
  auVar22._28_4_ = auVar147._28_4_;
  auVar147 = vcmpps_avx(local_80,auVar22,2);
  auVar254 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar174._16_16_ = auVar254;
  auVar174._0_16_ = auVar254;
  auVar306 = vcvtdq2ps_avx(auVar174);
  auVar306 = vcmpps_avx(_DAT_01faff40,auVar306,1);
  auVar147 = vandps_avx(auVar147,auVar306);
  uVar136 = vmovmskps_avx(auVar147);
  if (uVar136 != 0) {
    uVar136 = uVar136 & 0xff;
    local_4e0._32_8_ = mm_lookupmask_ps._16_8_;
    local_4e0._40_8_ = mm_lookupmask_ps._24_8_;
    local_4e0._48_8_ = mm_lookupmask_ps._16_8_;
    local_4e0._56_8_ = mm_lookupmask_ps._24_8_;
    local_7a0 = pre;
    do {
      uVar141 = (ulong)uVar136;
      auVar306 = auVar312._0_32_;
      auVar147 = auVar295._0_32_;
      lVar139 = 0;
      if (uVar141 != 0) {
        for (; (uVar136 >> lVar139 & 1) == 0; lVar139 = lVar139 + 1) {
        }
      }
      uVar141 = uVar141 - 1 & uVar141;
      local_794 = *(undefined4 *)(prim + lVar139 * 4 + 6);
      lVar139 = lVar139 * 0x40;
      lVar134 = 0;
      if (uVar141 != 0) {
        for (; (uVar141 >> lVar134 & 1) == 0; lVar134 = lVar134 + 1) {
        }
      }
      uVar136 = *(uint *)(prim + 2);
      pGVar138 = (context->scene->geometries).items[uVar136].ptr;
      _local_790 = *(undefined1 (*) [16])(prim + lVar139 + lVar114 + 0x16);
      if (((uVar141 != 0) && (uVar137 = uVar141 - 1 & uVar141, uVar137 != 0)) &&
         (lVar134 = 0, uVar137 != 0)) {
        for (; (uVar137 >> lVar134 & 1) == 0; lVar134 = lVar134 + 1) {
        }
      }
      _local_5b0 = *(undefined1 (*) [16])(prim + lVar139 + lVar114 + 0x26);
      _local_5c0 = *(undefined1 (*) [16])(prim + lVar139 + lVar114 + 0x36);
      _local_5d0 = *(undefined1 (*) [16])(prim + lVar139 + lVar114 + 0x46);
      uVar19 = (uint)pGVar138[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar8 = (ray->org).field_0;
      auVar183 = vsubps_avx(_local_790,(undefined1  [16])aVar8);
      auVar12 = _local_790;
      auVar254 = vshufps_avx(auVar183,auVar183,0);
      auVar191 = vshufps_avx(auVar183,auVar183,0x55);
      auVar183 = vshufps_avx(auVar183,auVar183,0xaa);
      fVar205 = (local_7a0->ray_space).vx.field_0.m128[0];
      fVar220 = (local_7a0->ray_space).vx.field_0.m128[1];
      fVar221 = (local_7a0->ray_space).vx.field_0.m128[2];
      fVar222 = (local_7a0->ray_space).vx.field_0.m128[3];
      fVar224 = (local_7a0->ray_space).vy.field_0.m128[0];
      fVar227 = (local_7a0->ray_space).vy.field_0.m128[1];
      fVar230 = (local_7a0->ray_space).vy.field_0.m128[2];
      fVar233 = (local_7a0->ray_space).vy.field_0.m128[3];
      fVar243 = (local_7a0->ray_space).vz.field_0.m128[0];
      fVar244 = (local_7a0->ray_space).vz.field_0.m128[1];
      fVar245 = (local_7a0->ray_space).vz.field_0.m128[2];
      fVar246 = (local_7a0->ray_space).vz.field_0.m128[3];
      auVar208._0_4_ =
           auVar254._0_4_ * fVar205 + auVar183._0_4_ * fVar243 + auVar191._0_4_ * fVar224;
      auVar208._4_4_ =
           auVar254._4_4_ * fVar220 + auVar183._4_4_ * fVar244 + auVar191._4_4_ * fVar227;
      auVar208._8_4_ =
           auVar254._8_4_ * fVar221 + auVar183._8_4_ * fVar245 + auVar191._8_4_ * fVar230;
      auVar208._12_4_ =
           auVar254._12_4_ * fVar222 + auVar183._12_4_ * fVar246 + auVar191._12_4_ * fVar233;
      auVar254 = vblendps_avx(auVar208,_local_790,8);
      auVar9 = vsubps_avx(_local_5b0,(undefined1  [16])aVar8);
      auVar191 = vshufps_avx(auVar9,auVar9,0);
      auVar183 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar234._0_4_ = auVar191._0_4_ * fVar205 + auVar9._0_4_ * fVar243 + auVar183._0_4_ * fVar224;
      auVar234._4_4_ = auVar191._4_4_ * fVar220 + auVar9._4_4_ * fVar244 + auVar183._4_4_ * fVar227;
      auVar234._8_4_ = auVar191._8_4_ * fVar221 + auVar9._8_4_ * fVar245 + auVar183._8_4_ * fVar230;
      auVar234._12_4_ =
           auVar191._12_4_ * fVar222 + auVar9._12_4_ * fVar246 + auVar183._12_4_ * fVar233;
      auVar191 = vblendps_avx(auVar234,_local_5b0,8);
      auVar10 = vsubps_avx(_local_5c0,(undefined1  [16])aVar8);
      auVar183 = vshufps_avx(auVar10,auVar10,0);
      auVar9 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar253._0_4_ = auVar183._0_4_ * fVar205 + auVar9._0_4_ * fVar224 + auVar10._0_4_ * fVar243;
      auVar253._4_4_ = auVar183._4_4_ * fVar220 + auVar9._4_4_ * fVar227 + auVar10._4_4_ * fVar244;
      auVar253._8_4_ = auVar183._8_4_ * fVar221 + auVar9._8_4_ * fVar230 + auVar10._8_4_ * fVar245;
      auVar253._12_4_ =
           auVar183._12_4_ * fVar222 + auVar9._12_4_ * fVar233 + auVar10._12_4_ * fVar246;
      auVar183 = vblendps_avx(auVar253,_local_5c0,8);
      local_5a0._0_16_ = (undefined1  [16])aVar8;
      auVar11 = vsubps_avx(_local_5d0,(undefined1  [16])aVar8);
      auVar9 = vshufps_avx(auVar11,auVar11,0);
      auVar10 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar170._0_4_ = auVar9._0_4_ * fVar205 + auVar11._0_4_ * fVar243 + auVar10._0_4_ * fVar224;
      auVar170._4_4_ = auVar9._4_4_ * fVar220 + auVar11._4_4_ * fVar244 + auVar10._4_4_ * fVar227;
      auVar170._8_4_ = auVar9._8_4_ * fVar221 + auVar11._8_4_ * fVar245 + auVar10._8_4_ * fVar230;
      auVar170._12_4_ =
           auVar9._12_4_ * fVar222 + auVar11._12_4_ * fVar246 + auVar10._12_4_ * fVar233;
      auVar9 = vblendps_avx(auVar170,_local_5d0,8);
      auVar235._8_4_ = 0x7fffffff;
      auVar235._0_8_ = 0x7fffffff7fffffff;
      auVar235._12_4_ = 0x7fffffff;
      auVar254 = vandps_avx(auVar254,auVar235);
      auVar191 = vandps_avx(auVar191,auVar235);
      auVar10 = vmaxps_avx(auVar254,auVar191);
      auVar254 = vandps_avx(auVar183,auVar235);
      auVar191 = vandps_avx(auVar9,auVar235);
      auVar254 = vmaxps_avx(auVar254,auVar191);
      auVar254 = vmaxps_avx(auVar10,auVar254);
      auVar191 = vmovshdup_avx(auVar254);
      auVar191 = vmaxss_avx(auVar191,auVar254);
      auVar254 = vshufpd_avx(auVar254,auVar254,1);
      auVar254 = vmaxss_avx(auVar254,auVar191);
      lVar139 = (long)(int)uVar19 * 0x44;
      fVar250 = *(float *)(bspline_basis0 + lVar139 + 0x908);
      fVar261 = *(float *)(bspline_basis0 + lVar139 + 0x90c);
      fVar262 = *(float *)(bspline_basis0 + lVar139 + 0x910);
      fVar263 = *(float *)(bspline_basis0 + lVar139 + 0x914);
      fVar264 = *(float *)(bspline_basis0 + lVar139 + 0x918);
      fVar265 = *(float *)(bspline_basis0 + lVar139 + 0x91c);
      fVar266 = *(float *)(bspline_basis0 + lVar139 + 0x920);
      auVar191 = vshufps_avx(auVar253,auVar253,0);
      register0x00001250 = auVar191;
      _local_700 = auVar191;
      auVar183 = vshufps_avx(auVar253,auVar253,0x55);
      register0x00001290 = auVar183;
      _local_740 = auVar183;
      fVar290 = *(float *)(bspline_basis0 + lVar139 + 0xd8c);
      fVar223 = *(float *)(bspline_basis0 + lVar139 + 0xd90);
      fVar325 = *(float *)(bspline_basis0 + lVar139 + 0xd94);
      fVar296 = *(float *)(bspline_basis0 + lVar139 + 0xd98);
      fVar297 = *(float *)(bspline_basis0 + lVar139 + 0xd9c);
      fVar226 = *(float *)(bspline_basis0 + lVar139 + 0xda0);
      fVar326 = *(float *)(bspline_basis0 + lVar139 + 0xda4);
      fVar205 = *(float *)(bspline_basis0 + lVar139 + 0xda8);
      auVar9 = vshufps_avx(auVar170,auVar170,0);
      register0x00001550 = auVar9;
      _local_440 = auVar9;
      fVar344 = auVar9._0_4_;
      fVar349 = auVar9._4_4_;
      fVar351 = auVar9._8_4_;
      fVar353 = auVar9._12_4_;
      fVar167 = auVar191._0_4_;
      fVar180 = auVar191._4_4_;
      fVar181 = auVar191._8_4_;
      fVar182 = auVar191._12_4_;
      auVar191 = vshufps_avx(auVar170,auVar170,0x55);
      register0x00001490 = auVar191;
      _local_6a0 = auVar191;
      fVar318 = auVar191._0_4_;
      fVar322 = auVar191._4_4_;
      fVar323 = auVar191._8_4_;
      fVar324 = auVar191._12_4_;
      fVar186 = auVar183._0_4_;
      fVar198 = auVar183._4_4_;
      fVar200 = auVar183._8_4_;
      fVar202 = auVar183._12_4_;
      auVar13 = _local_5c0;
      auVar191 = vshufps_avx(_local_5c0,_local_5c0,0xff);
      register0x00001310 = auVar191;
      _local_120 = auVar191;
      auVar11 = _local_5d0;
      auVar183 = vshufps_avx(_local_5d0,_local_5d0,0xff);
      register0x00001410 = auVar183;
      _local_140 = auVar183;
      fVar246 = auVar183._0_4_;
      fVar247 = auVar183._4_4_;
      fVar248 = auVar183._8_4_;
      fVar298 = auVar183._12_4_;
      fVar243 = auVar191._0_4_;
      fVar244 = auVar191._4_4_;
      fVar245 = auVar191._8_4_;
      auVar183 = vshufps_avx(auVar234,auVar234,0);
      register0x000015d0 = auVar183;
      _local_420 = auVar183;
      local_480 = *(float *)(bspline_basis0 + lVar139 + 0x484);
      fStack_47c = *(float *)(bspline_basis0 + lVar139 + 0x488);
      fStack_478 = *(float *)(bspline_basis0 + lVar139 + 0x48c);
      fStack_474 = *(float *)(bspline_basis0 + lVar139 + 0x490);
      fStack_470 = *(float *)(bspline_basis0 + lVar139 + 0x494);
      fStack_46c = *(float *)(bspline_basis0 + lVar139 + 0x498);
      fStack_468 = *(float *)(bspline_basis0 + lVar139 + 0x49c);
      fVar365 = auVar183._0_4_;
      fVar368 = auVar183._4_4_;
      fVar369 = auVar183._8_4_;
      fVar370 = auVar183._12_4_;
      auVar183 = vshufps_avx(auVar234,auVar234,0x55);
      register0x00001210 = auVar183;
      _local_e0 = auVar183;
      fVar142 = auVar183._0_4_;
      fVar158 = auVar183._4_4_;
      fVar161 = auVar183._8_4_;
      fVar162 = auVar183._12_4_;
      auVar14 = _local_5b0;
      auVar183 = vshufps_avx(_local_5b0,_local_5b0,0xff);
      register0x00001590 = auVar183;
      _local_a0 = auVar183;
      fStack_464 = (float)*(undefined4 *)(bspline_basis0 + lVar139 + 0x4a0);
      fVar355 = auVar183._0_4_;
      fVar359 = auVar183._4_4_;
      fVar361 = auVar183._8_4_;
      fVar363 = auVar183._12_4_;
      auVar183 = vshufps_avx(auVar208,auVar208,0);
      register0x00001390 = auVar183;
      _local_180 = auVar183;
      pauVar1 = (undefined1 (*) [16])(bspline_basis0 + lVar139);
      fVar220 = *(float *)*pauVar1;
      fVar221 = *(float *)(bspline_basis0 + lVar139 + 4);
      fVar222 = *(float *)(bspline_basis0 + lVar139 + 8);
      auVar127 = *(undefined1 (*) [12])*pauVar1;
      fVar299 = *(float *)(bspline_basis0 + lVar139 + 0xc);
      fStack_370 = *(float *)(bspline_basis0 + lVar139 + 0x10);
      fStack_36c = *(float *)(bspline_basis0 + lVar139 + 0x14);
      fStack_368 = *(float *)(bspline_basis0 + lVar139 + 0x18);
      fVar267 = auVar183._0_4_;
      fVar274 = auVar183._4_4_;
      fVar275 = auVar183._8_4_;
      fVar276 = auVar183._12_4_;
      auVar330._0_4_ =
           fVar267 * fVar220 + fVar365 * local_480 + fVar167 * fVar250 + fVar344 * fVar290;
      auVar330._4_4_ =
           fVar274 * fVar221 + fVar368 * fStack_47c + fVar180 * fVar261 + fVar349 * fVar223;
      auVar330._8_4_ =
           fVar275 * fVar222 + fVar369 * fStack_478 + fVar181 * fVar262 + fVar351 * fVar325;
      auVar330._12_4_ =
           fVar276 * fVar299 + fVar370 * fStack_474 + fVar182 * fVar263 + fVar353 * fVar296;
      auVar330._16_4_ =
           fVar267 * fStack_370 + fVar365 * fStack_470 + fVar167 * fVar264 + fVar344 * fVar297;
      auVar330._20_4_ =
           fVar274 * fStack_36c + fVar368 * fStack_46c + fVar180 * fVar265 + fVar349 * fVar226;
      auVar330._24_4_ =
           fVar275 * fStack_368 + fVar369 * fStack_468 + fVar181 * fVar266 + fVar351 * fVar326;
      auVar330._28_4_ = fVar205 + fVar182 + 0.0 + 0.0;
      auVar9 = vshufps_avx(auVar208,auVar208,0x55);
      register0x00001290 = auVar9;
      _local_100 = auVar9;
      fVar187 = auVar9._0_4_;
      fVar199 = auVar9._4_4_;
      fVar201 = auVar9._8_4_;
      fVar203 = auVar9._12_4_;
      auVar334._0_4_ =
           fVar187 * fVar220 + fVar142 * local_480 + fVar186 * fVar250 + fVar318 * fVar290;
      auVar334._4_4_ =
           fVar199 * fVar221 + fVar158 * fStack_47c + fVar198 * fVar261 + fVar322 * fVar223;
      auVar334._8_4_ =
           fVar201 * fVar222 + fVar161 * fStack_478 + fVar200 * fVar262 + fVar323 * fVar325;
      auVar334._12_4_ =
           fVar203 * fVar299 + fVar162 * fStack_474 + fVar202 * fVar263 + fVar324 * fVar296;
      auVar334._16_4_ =
           fVar187 * fStack_370 + fVar142 * fStack_470 + fVar186 * fVar264 + fVar318 * fVar297;
      auVar334._20_4_ =
           fVar199 * fStack_36c + fVar158 * fStack_46c + fVar198 * fVar265 + fVar322 * fVar226;
      auVar334._24_4_ =
           fVar201 * fStack_368 + fVar161 * fStack_468 + fVar200 * fVar266 + fVar323 * fVar326;
      auVar334._28_4_ = fVar162 + fVar202 + 0.0 + 0.0;
      auVar9 = vpermilps_avx(_local_790,0xff);
      register0x00001450 = auVar9;
      _local_160 = auVar9;
      _local_380 = *pauVar1;
      auVar15 = _local_380;
      uStack_364 = *(undefined4 *)(bspline_basis0 + lVar139 + 0x1c);
      fVar303 = auVar9._0_4_;
      fVar313 = auVar9._4_4_;
      fVar315 = auVar9._8_4_;
      fVar143 = fVar303 * fVar220 + fVar355 * local_480 + fVar243 * fVar250 + fVar246 * fVar290;
      fVar159 = fVar313 * fVar221 + fVar359 * fStack_47c + fVar244 * fVar261 + fVar247 * fVar223;
      fStack_778 = fVar315 * fVar222 + fVar361 * fStack_478 + fVar245 * fVar262 + fVar248 * fVar325;
      fStack_774 = auVar9._12_4_ * fVar299 +
                   fVar363 * fStack_474 + auVar191._12_4_ * fVar263 + fVar298 * fVar296;
      fStack_770 = fVar303 * fStack_370 +
                   fVar355 * fStack_470 + fVar243 * fVar264 + fVar246 * fVar297;
      fStack_76c = fVar313 * fStack_36c +
                   fVar359 * fStack_46c + fVar244 * fVar265 + fVar247 * fVar226;
      fStack_768 = fVar315 * fStack_368 +
                   fVar361 * fStack_468 + fVar245 * fVar266 + fVar248 * fVar326;
      fStack_764 = *(float *)(bspline_basis0 + lVar139 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar204 = *(float *)(bspline_basis1 + lVar139 + 0x908);
      fVar229 = *(float *)(bspline_basis1 + lVar139 + 0x90c);
      fVar327 = *(float *)(bspline_basis1 + lVar139 + 0x910);
      fVar300 = *(float *)(bspline_basis1 + lVar139 + 0x914);
      fVar301 = *(float *)(bspline_basis1 + lVar139 + 0x918);
      fVar232 = *(float *)(bspline_basis1 + lVar139 + 0x91c);
      fVar184 = *(float *)(bspline_basis1 + lVar139 + 0x920);
      fVar220 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar139 + 0xd8c);
      fVar221 = *(float *)(bspline_basis1 + lVar139 + 0xd90);
      fVar222 = *(float *)(bspline_basis1 + lVar139 + 0xd94);
      fVar224 = *(float *)(bspline_basis1 + lVar139 + 0xd98);
      fVar227 = *(float *)(bspline_basis1 + lVar139 + 0xd9c);
      fVar230 = *(float *)(bspline_basis1 + lVar139 + 0xda0);
      fVar233 = *(float *)(bspline_basis1 + lVar139 + 0xda4);
      auVar128 = *(undefined1 (*) [28])(bspline_basis1 + lVar139 + 0xd8c);
      fVar144 = *(float *)(bspline_basis1 + lVar139 + 0x484);
      fVar160 = *(float *)(bspline_basis1 + lVar139 + 0x488);
      fVar249 = *(float *)(bspline_basis1 + lVar139 + 0x48c);
      fVar277 = *(float *)(bspline_basis1 + lVar139 + 0x490);
      fVar163 = *(float *)(bspline_basis1 + lVar139 + 0x494);
      fVar164 = *(float *)(bspline_basis1 + lVar139 + 0x498);
      fVar165 = *(float *)(bspline_basis1 + lVar139 + 0x49c);
      fVar206 = *(float *)(bspline_basis1 + lVar139);
      fVar166 = *(float *)(bspline_basis1 + lVar139 + 4);
      fVar185 = *(float *)(bspline_basis1 + lVar139 + 8);
      fVar278 = *(float *)(bspline_basis1 + lVar139 + 0xc);
      fVar225 = *(float *)(bspline_basis1 + lVar139 + 0x10);
      fVar228 = *(float *)(bspline_basis1 + lVar139 + 0x14);
      fVar231 = *(float *)(bspline_basis1 + lVar139 + 0x18);
      local_360._0_4_ =
           fVar206 * fVar267 + fVar365 * fVar144 + fVar204 * fVar167 + fVar344 * fVar220;
      local_360._4_4_ =
           fVar166 * fVar274 + fVar368 * fVar160 + fVar229 * fVar180 + fVar349 * fVar221;
      local_360._8_4_ =
           fVar185 * fVar275 + fVar369 * fVar249 + fVar327 * fVar181 + fVar351 * fVar222;
      local_360._12_4_ =
           fVar278 * fVar276 + fVar370 * fVar277 + fVar300 * fVar182 + fVar353 * fVar224;
      local_360._16_4_ =
           fVar225 * fVar267 + fVar365 * fVar163 + fVar301 * fVar167 + fVar344 * fVar227;
      local_360._20_4_ =
           fVar228 * fVar274 + fVar368 * fVar164 + fVar232 * fVar180 + fVar349 * fVar230;
      local_360._24_4_ =
           fVar231 * fVar275 + fVar369 * fVar165 + fVar184 * fVar181 + fVar351 * fVar233;
      local_360._28_4_ = fVar363 + fVar353 + fStack_764 + 0.0;
      local_520._0_4_ =
           fVar206 * fVar187 + fVar142 * fVar144 + fVar204 * fVar186 + fVar318 * fVar220;
      local_520._4_4_ =
           fVar166 * fVar199 + fVar158 * fVar160 + fVar229 * fVar198 + fVar322 * fVar221;
      fStack_518 = fVar185 * fVar201 + fVar161 * fVar249 + fVar327 * fVar200 + fVar323 * fVar222;
      fStack_514 = fVar278 * fVar203 + fVar162 * fVar277 + fVar300 * fVar202 + fVar324 * fVar224;
      fStack_510 = fVar225 * fVar187 + fVar142 * fVar163 + fVar301 * fVar186 + fVar318 * fVar227;
      fStack_50c = fVar228 * fVar199 + fVar158 * fVar164 + fVar232 * fVar198 + fVar322 * fVar230;
      fStack_508 = fVar231 * fVar201 + fVar161 * fVar165 + fVar184 * fVar200 + fVar323 * fVar233;
      fStack_504 = fVar203 + fVar353 + fVar205 + 0.0;
      local_680._0_4_ =
           fVar355 * fVar144 + fVar243 * fVar204 + fVar246 * fVar220 + fVar303 * fVar206;
      local_680._4_4_ =
           fVar359 * fVar160 + fVar244 * fVar229 + fVar247 * fVar221 + fVar313 * fVar166;
      local_680._8_4_ =
           fVar361 * fVar249 + fVar245 * fVar327 + fVar248 * fVar222 + fVar315 * fVar185;
      local_680._12_4_ =
           fVar363 * fVar277 + auVar191._12_4_ * fVar300 + fVar298 * fVar224 +
           auVar9._12_4_ * fVar278;
      local_680._16_4_ =
           fVar355 * fVar163 + fVar243 * fVar301 + fVar246 * fVar227 + fVar303 * fVar225;
      local_680._20_4_ =
           fVar359 * fVar164 + fVar244 * fVar232 + fVar247 * fVar230 + fVar313 * fVar228;
      local_680._24_4_ =
           fVar361 * fVar165 + fVar245 * fVar184 + fVar248 * fVar233 + fVar315 * fVar231;
      local_680._28_4_ = fVar353 + fVar298 + fVar205 + fVar203;
      local_3a0 = vsubps_avx(local_360,auVar330);
      auVar25 = vsubps_avx(_local_520,auVar334);
      fVar205 = local_3a0._0_4_;
      fVar221 = local_3a0._4_4_;
      auVar31._4_4_ = auVar334._4_4_ * fVar221;
      auVar31._0_4_ = auVar334._0_4_ * fVar205;
      fVar224 = local_3a0._8_4_;
      auVar31._8_4_ = auVar334._8_4_ * fVar224;
      fVar230 = local_3a0._12_4_;
      auVar31._12_4_ = auVar334._12_4_ * fVar230;
      fVar243 = local_3a0._16_4_;
      auVar31._16_4_ = auVar334._16_4_ * fVar243;
      fVar245 = local_3a0._20_4_;
      auVar31._20_4_ = auVar334._20_4_ * fVar245;
      fVar247 = local_3a0._24_4_;
      auVar31._24_4_ = auVar334._24_4_ * fVar247;
      auVar31._28_4_ = fVar203;
      fVar220 = auVar25._0_4_;
      fVar222 = auVar25._4_4_;
      auVar32._4_4_ = auVar330._4_4_ * fVar222;
      auVar32._0_4_ = auVar330._0_4_ * fVar220;
      fVar227 = auVar25._8_4_;
      auVar32._8_4_ = auVar330._8_4_ * fVar227;
      fVar233 = auVar25._12_4_;
      auVar32._12_4_ = auVar330._12_4_ * fVar233;
      fVar244 = auVar25._16_4_;
      auVar32._16_4_ = auVar330._16_4_ * fVar244;
      fVar246 = auVar25._20_4_;
      auVar32._20_4_ = auVar330._20_4_ * fVar246;
      fVar248 = auVar25._24_4_;
      auVar32._24_4_ = auVar330._24_4_ * fVar248;
      auVar32._28_4_ = fStack_504;
      auVar24 = vsubps_avx(auVar31,auVar32);
      auVar120._4_4_ = fVar159;
      auVar120._0_4_ = fVar143;
      auVar120._8_4_ = fStack_778;
      auVar120._12_4_ = fStack_774;
      auVar120._16_4_ = fStack_770;
      auVar120._20_4_ = fStack_76c;
      auVar120._24_4_ = fStack_768;
      auVar120._28_4_ = fStack_764;
      auVar23 = vmaxps_avx(auVar120,local_680._0_32_);
      auVar33._4_4_ = auVar23._4_4_ * auVar23._4_4_ * (fVar221 * fVar221 + fVar222 * fVar222);
      auVar33._0_4_ = auVar23._0_4_ * auVar23._0_4_ * (fVar205 * fVar205 + fVar220 * fVar220);
      auVar33._8_4_ = auVar23._8_4_ * auVar23._8_4_ * (fVar224 * fVar224 + fVar227 * fVar227);
      auVar33._12_4_ = auVar23._12_4_ * auVar23._12_4_ * (fVar230 * fVar230 + fVar233 * fVar233);
      auVar33._16_4_ = auVar23._16_4_ * auVar23._16_4_ * (fVar243 * fVar243 + fVar244 * fVar244);
      auVar33._20_4_ = auVar23._20_4_ * auVar23._20_4_ * (fVar245 * fVar245 + fVar246 * fVar246);
      auVar33._24_4_ = auVar23._24_4_ * auVar23._24_4_ * (fVar247 * fVar247 + fVar248 * fVar248);
      auVar33._28_4_ = auVar25._28_4_ + fStack_504;
      auVar34._4_4_ = auVar24._4_4_ * auVar24._4_4_;
      auVar34._0_4_ = auVar24._0_4_ * auVar24._0_4_;
      auVar34._8_4_ = auVar24._8_4_ * auVar24._8_4_;
      auVar34._12_4_ = auVar24._12_4_ * auVar24._12_4_;
      auVar34._16_4_ = auVar24._16_4_ * auVar24._16_4_;
      auVar34._20_4_ = auVar24._20_4_ * auVar24._20_4_;
      auVar34._24_4_ = auVar24._24_4_ * auVar24._24_4_;
      auVar34._28_4_ = auVar24._28_4_;
      auVar23 = vcmpps_avx(auVar34,auVar33,2);
      auVar209._0_4_ = (float)(int)uVar19;
      auVar209._4_12_ = auVar183._4_12_;
      _local_460 = auVar209;
      auVar191 = vshufps_avx(auVar209,auVar209,0);
      auVar215._16_16_ = auVar191;
      auVar215._0_16_ = auVar191;
      auVar24 = vcmpps_avx(_DAT_01faff40,auVar215,1);
      auVar219 = ZEXT3264(auVar24);
      auVar191 = vpermilps_avx(auVar208,0xaa);
      register0x00001450 = auVar191;
      _local_1a0 = auVar191;
      auVar183 = vpermilps_avx(auVar234,0xaa);
      register0x00001550 = auVar183;
      _local_400 = auVar183;
      auVar9 = vpermilps_avx(auVar253,0xaa);
      register0x00001590 = auVar9;
      _local_340 = auVar9;
      auVar10 = vpermilps_avx(auVar170,0xaa);
      auVar242 = ZEXT1664(auVar10);
      register0x00001510 = auVar10;
      _local_620 = auVar10;
      auVar26 = auVar24 & auVar23;
      local_750 = ZEXT416((uint)(auVar254._0_4_ * 4.7683716e-07));
      fVar205 = fVar318;
      fVar220 = fVar322;
      fVar221 = fVar323;
      fVar222 = fVar324;
      fVar224 = fVar186;
      fVar227 = fVar198;
      fVar230 = fVar200;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar26 >> 0x7f,0) == '\0') &&
            (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar26 >> 0xbf,0) == '\0') &&
          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f])
      {
        auVar295 = ZEXT3264(auVar147);
        auVar312 = ZEXT3264(auVar306);
LAB_01024c90:
        auVar331 = ZEXT3264(_local_700);
        bVar140 = false;
        _local_5d0 = auVar11;
        _local_5c0 = auVar13;
        _local_5b0 = auVar14;
      }
      else {
        auVar23 = vandps_avx(auVar23,auVar24);
        fVar304 = auVar191._0_4_;
        fVar314 = auVar191._4_4_;
        fVar316 = auVar191._8_4_;
        fVar317 = auVar191._12_4_;
        fVar345 = auVar183._0_4_;
        fVar350 = auVar183._4_4_;
        fVar352 = auVar183._8_4_;
        fVar354 = auVar183._12_4_;
        fVar356 = auVar9._0_4_;
        fVar360 = auVar9._4_4_;
        fVar362 = auVar9._8_4_;
        fVar364 = auVar9._12_4_;
        local_4a0._0_4_ = auVar128._0_4_;
        local_4a0._4_4_ = auVar128._4_4_;
        fStack_498 = auVar128._8_4_;
        fStack_494 = auVar128._12_4_;
        fStack_490 = auVar128._16_4_;
        fStack_48c = auVar128._20_4_;
        fStack_488 = auVar128._24_4_;
        fVar332 = auVar10._0_4_;
        fVar341 = auVar10._4_4_;
        fVar342 = auVar10._8_4_;
        fVar343 = auVar10._12_4_;
        fVar233 = auVar24._28_4_ +
                  *(float *)(bspline_basis1 + lVar139 + 0x924) +
                  *(float *)(bspline_basis1 + lVar139 + 0xda8);
        local_4a0._0_4_ =
             fVar304 * fVar206 +
             fVar345 * fVar144 + fVar356 * fVar204 + fVar332 * (float)local_4a0._0_4_;
        local_4a0._4_4_ =
             fVar314 * fVar166 +
             fVar350 * fVar160 + fVar360 * fVar229 + fVar341 * (float)local_4a0._4_4_;
        fStack_498 = fVar316 * fVar185 +
                     fVar352 * fVar249 + fVar362 * fVar327 + fVar342 * fStack_498;
        fStack_494 = fVar317 * fVar278 +
                     fVar354 * fVar277 + fVar364 * fVar300 + fVar343 * fStack_494;
        fStack_490 = fVar304 * fVar225 +
                     fVar345 * fVar163 + fVar356 * fVar301 + fVar332 * fStack_490;
        fStack_48c = fVar314 * fVar228 +
                     fVar350 * fVar164 + fVar360 * fVar232 + fVar341 * fStack_48c;
        fStack_488 = fVar316 * fVar231 +
                     fVar352 * fVar165 + fVar362 * fVar184 + fVar342 * fStack_488;
        fStack_484 = auVar23._28_4_ + fVar233;
        local_380._0_4_ = auVar127._0_4_;
        local_380._4_4_ = auVar127._4_4_;
        fStack_378 = auVar127._8_4_;
        local_540 = fVar304 * (float)local_380._0_4_ +
                    fVar345 * local_480 + fVar356 * fVar250 + fVar332 * fVar290;
        fStack_53c = fVar314 * (float)local_380._4_4_ +
                     fVar350 * fStack_47c + fVar360 * fVar261 + fVar341 * fVar223;
        fStack_538 = fVar316 * fStack_378 +
                     fVar352 * fStack_478 + fVar362 * fVar262 + fVar342 * fVar325;
        fStack_534 = fVar317 * fVar299 +
                     fVar354 * fStack_474 + fVar364 * fVar263 + fVar343 * fVar296;
        fStack_530 = fVar304 * fStack_370 +
                     fVar345 * fStack_470 + fVar356 * fVar264 + fVar332 * fVar297;
        fStack_52c = fVar314 * fStack_36c +
                     fVar350 * fStack_46c + fVar360 * fVar265 + fVar341 * fVar226;
        fStack_528 = fVar316 * fStack_368 +
                     fVar352 * fStack_468 + fVar362 * fVar266 + fVar342 * fVar326;
        fStack_524 = fStack_484 + fVar233 + auVar23._28_4_ + auVar24._28_4_;
        fVar233 = *(float *)(bspline_basis0 + lVar139 + 0x1210);
        fVar243 = *(float *)(bspline_basis0 + lVar139 + 0x1214);
        fVar244 = *(float *)(bspline_basis0 + lVar139 + 0x1218);
        fVar245 = *(float *)(bspline_basis0 + lVar139 + 0x121c);
        fVar246 = *(float *)(bspline_basis0 + lVar139 + 0x1220);
        fVar247 = *(float *)(bspline_basis0 + lVar139 + 0x1224);
        fVar248 = *(float *)(bspline_basis0 + lVar139 + 0x1228);
        fVar250 = *(float *)(bspline_basis0 + lVar139 + 0x1694);
        fVar261 = *(float *)(bspline_basis0 + lVar139 + 0x1698);
        fVar262 = *(float *)(bspline_basis0 + lVar139 + 0x169c);
        fVar263 = *(float *)(bspline_basis0 + lVar139 + 0x16a0);
        fVar264 = *(float *)(bspline_basis0 + lVar139 + 0x16a4);
        fVar265 = *(float *)(bspline_basis0 + lVar139 + 0x16a8);
        fVar266 = *(float *)(bspline_basis0 + lVar139 + 0x16ac);
        fVar290 = *(float *)(bspline_basis0 + lVar139 + 0x1b18);
        fVar223 = *(float *)(bspline_basis0 + lVar139 + 0x1b1c);
        fVar325 = *(float *)(bspline_basis0 + lVar139 + 0x1b20);
        fVar296 = *(float *)(bspline_basis0 + lVar139 + 0x1b24);
        fVar297 = *(float *)(bspline_basis0 + lVar139 + 0x1b28);
        fVar226 = *(float *)(bspline_basis0 + lVar139 + 0x1b2c);
        fVar326 = *(float *)(bspline_basis0 + lVar139 + 0x1b30);
        fVar299 = *(float *)(bspline_basis0 + lVar139 + 0x1f9c);
        fVar204 = *(float *)(bspline_basis0 + lVar139 + 0x1fa0);
        fVar229 = *(float *)(bspline_basis0 + lVar139 + 0x1fa4);
        fVar327 = *(float *)(bspline_basis0 + lVar139 + 0x1fa8);
        fVar300 = *(float *)(bspline_basis0 + lVar139 + 0x1fac);
        fVar301 = *(float *)(bspline_basis0 + lVar139 + 0x1fb0);
        fVar232 = *(float *)(bspline_basis0 + lVar139 + 0x1fb4);
        fVar184 = *(float *)(bspline_basis0 + lVar139 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar139 + 0x1fb8);
        fVar302 = *(float *)(bspline_basis0 + lVar139 + 0x16b0) + fVar184;
        auVar175._0_4_ =
             fVar187 * fVar233 + fVar290 * fVar186 + fVar318 * fVar299 + fVar142 * fVar250;
        auVar175._4_4_ =
             fVar199 * fVar243 + fVar223 * fVar198 + fVar322 * fVar204 + fVar158 * fVar261;
        auVar175._8_4_ =
             fVar201 * fVar244 + fVar325 * fVar200 + fVar323 * fVar229 + fVar161 * fVar262;
        auVar175._12_4_ =
             fVar203 * fVar245 + fVar296 * fVar202 + fVar324 * fVar327 + fVar162 * fVar263;
        auVar175._16_4_ =
             fVar187 * fVar246 + fVar297 * fVar186 + fVar318 * fVar300 + fVar142 * fVar264;
        auVar175._20_4_ =
             fVar199 * fVar247 + fVar226 * fVar198 + fVar322 * fVar301 + fVar158 * fVar265;
        auVar175._24_4_ =
             fVar201 * fVar248 + fVar326 * fVar200 + fVar323 * fVar232 + fVar161 * fVar266;
        auVar175._28_4_ =
             fVar184 + fVar317 + *(float *)(bspline_basis1 + lVar139 + 0x1c) +
                       fVar317 + *(float *)(bspline_basis1 + lVar139 + 0x4a0);
        auVar285._0_4_ =
             fVar345 * fVar250 + fVar356 * fVar290 + fVar332 * fVar299 + fVar304 * fVar233;
        auVar285._4_4_ =
             fVar350 * fVar261 + fVar360 * fVar223 + fVar341 * fVar204 + fVar314 * fVar243;
        auVar285._8_4_ =
             fVar352 * fVar262 + fVar362 * fVar325 + fVar342 * fVar229 + fVar316 * fVar244;
        auVar285._12_4_ =
             fVar354 * fVar263 + fVar364 * fVar296 + fVar343 * fVar327 + fVar317 * fVar245;
        auVar285._16_4_ =
             fVar345 * fVar264 + fVar356 * fVar297 + fVar332 * fVar300 + fVar304 * fVar246;
        auVar285._20_4_ =
             fVar350 * fVar265 + fVar360 * fVar226 + fVar341 * fVar301 + fVar314 * fVar247;
        auVar285._24_4_ =
             fVar352 * fVar266 + fVar362 * fVar326 + fVar342 * fVar232 + fVar316 * fVar248;
        auVar285._28_4_ = fVar302 + *(float *)(bspline_basis0 + lVar139 + 0x122c);
        fVar184 = *(float *)(bspline_basis1 + lVar139 + 0x1b18);
        fVar144 = *(float *)(bspline_basis1 + lVar139 + 0x1b1c);
        fVar160 = *(float *)(bspline_basis1 + lVar139 + 0x1b20);
        fVar249 = *(float *)(bspline_basis1 + lVar139 + 0x1b24);
        fVar277 = *(float *)(bspline_basis1 + lVar139 + 0x1b28);
        fVar163 = *(float *)(bspline_basis1 + lVar139 + 0x1b2c);
        fVar164 = *(float *)(bspline_basis1 + lVar139 + 0x1b30);
        fVar165 = *(float *)(bspline_basis1 + lVar139 + 0x1f9c);
        fVar206 = *(float *)(bspline_basis1 + lVar139 + 0x1fa0);
        fVar166 = *(float *)(bspline_basis1 + lVar139 + 0x1fa4);
        fVar185 = *(float *)(bspline_basis1 + lVar139 + 0x1fa8);
        fVar278 = *(float *)(bspline_basis1 + lVar139 + 0x1fac);
        fVar225 = *(float *)(bspline_basis1 + lVar139 + 0x1fb0);
        fVar228 = *(float *)(bspline_basis1 + lVar139 + 0x1fb4);
        fVar231 = *(float *)(bspline_basis1 + lVar139 + 0x1694);
        fVar298 = *(float *)(bspline_basis1 + lVar139 + 0x1698);
        fVar303 = *(float *)(bspline_basis1 + lVar139 + 0x169c);
        fVar313 = *(float *)(bspline_basis1 + lVar139 + 0x16a0);
        fVar315 = *(float *)(bspline_basis1 + lVar139 + 0x16a4);
        fVar355 = *(float *)(bspline_basis1 + lVar139 + 0x16a8);
        fVar359 = *(float *)(bspline_basis1 + lVar139 + 0x16ac);
        fVar361 = *(float *)(bspline_basis1 + lVar139 + 0x1210);
        fVar363 = *(float *)(bspline_basis1 + lVar139 + 0x1214);
        fVar115 = *(float *)(bspline_basis1 + lVar139 + 0x1218);
        fVar116 = *(float *)(bspline_basis1 + lVar139 + 0x121c);
        fVar117 = *(float *)(bspline_basis1 + lVar139 + 0x1220);
        fVar118 = *(float *)(bspline_basis1 + lVar139 + 0x1224);
        fVar119 = *(float *)(bspline_basis1 + lVar139 + 0x1228);
        auVar293._0_4_ =
             fVar267 * fVar361 + fVar365 * fVar231 + fVar167 * fVar184 + fVar344 * fVar165;
        auVar293._4_4_ =
             fVar274 * fVar363 + fVar368 * fVar298 + fVar180 * fVar144 + fVar349 * fVar206;
        auVar293._8_4_ =
             fVar275 * fVar115 + fVar369 * fVar303 + fVar181 * fVar160 + fVar351 * fVar166;
        auVar293._12_4_ =
             fVar276 * fVar116 + fVar370 * fVar313 + fVar182 * fVar249 + fVar353 * fVar185;
        auVar293._16_4_ =
             fVar267 * fVar117 + fVar365 * fVar315 + fVar167 * fVar277 + fVar344 * fVar278;
        auVar293._20_4_ =
             fVar274 * fVar118 + fVar368 * fVar355 + fVar180 * fVar163 + fVar349 * fVar225;
        auVar293._24_4_ =
             fVar275 * fVar119 + fVar369 * fVar359 + fVar181 * fVar164 + fVar351 * fVar228;
        auVar293._28_4_ = fVar182 + fVar182 + fVar317 + fVar302;
        auVar307._0_4_ =
             fVar187 * fVar361 + fVar142 * fVar231 + fVar184 * fVar186 + fVar318 * fVar165;
        auVar307._4_4_ =
             fVar199 * fVar363 + fVar158 * fVar298 + fVar144 * fVar198 + fVar322 * fVar206;
        auVar307._8_4_ =
             fVar201 * fVar115 + fVar161 * fVar303 + fVar160 * fVar200 + fVar323 * fVar166;
        auVar307._12_4_ =
             fVar203 * fVar116 + fVar162 * fVar313 + fVar249 * fVar202 + fVar324 * fVar185;
        auVar307._16_4_ =
             fVar187 * fVar117 + fVar142 * fVar315 + fVar277 * fVar186 + fVar318 * fVar278;
        auVar307._20_4_ =
             fVar199 * fVar118 + fVar158 * fVar355 + fVar163 * fVar198 + fVar322 * fVar225;
        auVar307._24_4_ =
             fVar201 * fVar119 + fVar161 * fVar359 + fVar164 * fVar200 + fVar323 * fVar228;
        auVar307._28_4_ = fVar182 + fVar182 + fVar182 + fVar317;
        auVar196._0_4_ =
             fVar304 * fVar361 + fVar345 * fVar231 + fVar356 * fVar184 + fVar165 * fVar332;
        auVar196._4_4_ =
             fVar314 * fVar363 + fVar350 * fVar298 + fVar360 * fVar144 + fVar206 * fVar341;
        auVar196._8_4_ =
             fVar316 * fVar115 + fVar352 * fVar303 + fVar362 * fVar160 + fVar166 * fVar342;
        auVar196._12_4_ =
             fVar317 * fVar116 + fVar354 * fVar313 + fVar364 * fVar249 + fVar185 * fVar343;
        auVar196._16_4_ =
             fVar304 * fVar117 + fVar345 * fVar315 + fVar356 * fVar277 + fVar278 * fVar332;
        auVar196._20_4_ =
             fVar314 * fVar118 + fVar350 * fVar355 + fVar360 * fVar163 + fVar225 * fVar341;
        auVar196._24_4_ =
             fVar316 * fVar119 + fVar352 * fVar359 + fVar362 * fVar164 + fVar228 * fVar342;
        auVar196._28_4_ =
             *(float *)(bspline_basis1 + lVar139 + 0x122c) +
             *(float *)(bspline_basis1 + lVar139 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar139 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar139 + 0x1fb8);
        auVar238._8_4_ = 0x7fffffff;
        auVar238._0_8_ = 0x7fffffff7fffffff;
        auVar238._12_4_ = 0x7fffffff;
        auVar238._16_4_ = 0x7fffffff;
        auVar238._20_4_ = 0x7fffffff;
        auVar238._24_4_ = 0x7fffffff;
        auVar238._28_4_ = 0x7fffffff;
        auVar122._4_4_ =
             fVar274 * fVar243 + fVar368 * fVar261 + fVar180 * fVar223 + fVar349 * fVar204;
        auVar122._0_4_ =
             fVar267 * fVar233 + fVar365 * fVar250 + fVar167 * fVar290 + fVar344 * fVar299;
        auVar122._8_4_ =
             fVar275 * fVar244 + fVar369 * fVar262 + fVar181 * fVar325 + fVar351 * fVar229;
        auVar122._12_4_ =
             fVar276 * fVar245 + fVar370 * fVar263 + fVar182 * fVar296 + fVar353 * fVar327;
        auVar122._16_4_ =
             fVar267 * fVar246 + fVar365 * fVar264 + fVar167 * fVar297 + fVar344 * fVar300;
        auVar122._20_4_ =
             fVar274 * fVar247 + fVar368 * fVar265 + fVar180 * fVar226 + fVar349 * fVar301;
        auVar122._24_4_ =
             fVar275 * fVar248 + fVar369 * fVar266 + fVar181 * fVar326 + fVar351 * fVar232;
        auVar122._28_4_ =
             *(float *)(bspline_basis0 + lVar139 + 0x16b0) +
             *(float *)(bspline_basis0 + lVar139 + 0x1fb8) +
             fVar317 + *(float *)(bspline_basis1 + lVar139 + 0x4a0);
        auVar24 = vandps_avx(auVar122,auVar238);
        auVar26 = vandps_avx(auVar175,auVar238);
        auVar26 = vmaxps_avx(auVar24,auVar26);
        auVar24 = vandps_avx(auVar285,auVar238);
        auVar24 = vmaxps_avx(auVar26,auVar24);
        auVar254 = vpermilps_avx(local_750,0);
        auVar286._16_16_ = auVar254;
        auVar286._0_16_ = auVar254;
        auVar24 = vcmpps_avx(auVar24,auVar286,1);
        auVar27 = vblendvps_avx(auVar122,local_3a0,auVar24);
        auVar28 = vblendvps_avx(auVar175,auVar25,auVar24);
        auVar24 = vandps_avx(auVar293,auVar238);
        auVar26 = vandps_avx(auVar307,auVar238);
        auVar29 = vmaxps_avx(auVar24,auVar26);
        auVar24 = vandps_avx(auVar196,auVar238);
        auVar24 = vmaxps_avx(auVar29,auVar24);
        auVar29 = vcmpps_avx(auVar24,auVar286,1);
        auVar24 = vblendvps_avx(auVar293,local_3a0,auVar29);
        auVar25 = vblendvps_avx(auVar307,auVar25,auVar29);
        fVar144 = auVar27._0_4_;
        fVar160 = auVar27._4_4_;
        fVar249 = auVar27._8_4_;
        fVar277 = auVar27._12_4_;
        fVar163 = auVar27._16_4_;
        fVar164 = auVar27._20_4_;
        fVar165 = auVar27._24_4_;
        fVar206 = auVar24._0_4_;
        fVar166 = auVar24._4_4_;
        fVar185 = auVar24._8_4_;
        fVar278 = auVar24._12_4_;
        fVar225 = auVar24._16_4_;
        fVar228 = auVar24._20_4_;
        fVar231 = auVar24._24_4_;
        fStack_544 = -auVar24._28_4_;
        fVar233 = auVar28._0_4_;
        fVar246 = auVar28._4_4_;
        fVar261 = auVar28._8_4_;
        fVar265 = auVar28._12_4_;
        fVar325 = auVar28._16_4_;
        fVar326 = auVar28._20_4_;
        fVar327 = auVar28._24_4_;
        auVar150._0_4_ = fVar233 * fVar233 + fVar144 * fVar144;
        auVar150._4_4_ = fVar246 * fVar246 + fVar160 * fVar160;
        auVar150._8_4_ = fVar261 * fVar261 + fVar249 * fVar249;
        auVar150._12_4_ = fVar265 * fVar265 + fVar277 * fVar277;
        auVar150._16_4_ = fVar325 * fVar325 + fVar163 * fVar163;
        auVar150._20_4_ = fVar326 * fVar326 + fVar164 * fVar164;
        auVar150._24_4_ = fVar327 * fVar327 + fVar165 * fVar165;
        auVar150._28_4_ = auVar307._28_4_ + auVar27._28_4_;
        auVar27 = vrsqrtps_avx(auVar150);
        fVar243 = auVar27._0_4_;
        fVar244 = auVar27._4_4_;
        auVar35._4_4_ = fVar244 * 1.5;
        auVar35._0_4_ = fVar243 * 1.5;
        fVar245 = auVar27._8_4_;
        auVar35._8_4_ = fVar245 * 1.5;
        fVar247 = auVar27._12_4_;
        auVar35._12_4_ = fVar247 * 1.5;
        fVar248 = auVar27._16_4_;
        auVar35._16_4_ = fVar248 * 1.5;
        fVar250 = auVar27._20_4_;
        auVar35._20_4_ = fVar250 * 1.5;
        fVar262 = auVar27._24_4_;
        fVar184 = auVar26._28_4_;
        auVar35._24_4_ = fVar262 * 1.5;
        auVar35._28_4_ = fVar184;
        auVar36._4_4_ = fVar244 * fVar244 * fVar244 * auVar150._4_4_ * 0.5;
        auVar36._0_4_ = fVar243 * fVar243 * fVar243 * auVar150._0_4_ * 0.5;
        auVar36._8_4_ = fVar245 * fVar245 * fVar245 * auVar150._8_4_ * 0.5;
        auVar36._12_4_ = fVar247 * fVar247 * fVar247 * auVar150._12_4_ * 0.5;
        auVar36._16_4_ = fVar248 * fVar248 * fVar248 * auVar150._16_4_ * 0.5;
        auVar36._20_4_ = fVar250 * fVar250 * fVar250 * auVar150._20_4_ * 0.5;
        auVar36._24_4_ = fVar262 * fVar262 * fVar262 * auVar150._24_4_ * 0.5;
        auVar36._28_4_ = auVar150._28_4_;
        auVar26 = vsubps_avx(auVar35,auVar36);
        fVar243 = auVar26._0_4_;
        fVar247 = auVar26._4_4_;
        fVar262 = auVar26._8_4_;
        fVar266 = auVar26._12_4_;
        fVar296 = auVar26._16_4_;
        fVar299 = auVar26._20_4_;
        fVar300 = auVar26._24_4_;
        fVar244 = auVar25._0_4_;
        fVar248 = auVar25._4_4_;
        fVar263 = auVar25._8_4_;
        fVar290 = auVar25._12_4_;
        fVar297 = auVar25._16_4_;
        fVar204 = auVar25._20_4_;
        fVar301 = auVar25._24_4_;
        auVar151._0_4_ = fVar244 * fVar244 + fVar206 * fVar206;
        auVar151._4_4_ = fVar248 * fVar248 + fVar166 * fVar166;
        auVar151._8_4_ = fVar263 * fVar263 + fVar185 * fVar185;
        auVar151._12_4_ = fVar290 * fVar290 + fVar278 * fVar278;
        auVar151._16_4_ = fVar297 * fVar297 + fVar225 * fVar225;
        auVar151._20_4_ = fVar204 * fVar204 + fVar228 * fVar228;
        auVar151._24_4_ = fVar301 * fVar301 + fVar231 * fVar231;
        auVar151._28_4_ = auVar24._28_4_ + auVar26._28_4_;
        auVar24 = vrsqrtps_avx(auVar151);
        fVar245 = auVar24._0_4_;
        fVar250 = auVar24._4_4_;
        auVar37._4_4_ = fVar250 * 1.5;
        auVar37._0_4_ = fVar245 * 1.5;
        fVar264 = auVar24._8_4_;
        auVar37._8_4_ = fVar264 * 1.5;
        fVar223 = auVar24._12_4_;
        auVar37._12_4_ = fVar223 * 1.5;
        fVar226 = auVar24._16_4_;
        auVar37._16_4_ = fVar226 * 1.5;
        fVar229 = auVar24._20_4_;
        auVar37._20_4_ = fVar229 * 1.5;
        fVar232 = auVar24._24_4_;
        auVar37._24_4_ = fVar232 * 1.5;
        auVar37._28_4_ = fVar184;
        auVar38._4_4_ = fVar250 * fVar250 * fVar250 * auVar151._4_4_ * 0.5;
        auVar38._0_4_ = fVar245 * fVar245 * fVar245 * auVar151._0_4_ * 0.5;
        auVar38._8_4_ = fVar264 * fVar264 * fVar264 * auVar151._8_4_ * 0.5;
        auVar38._12_4_ = fVar223 * fVar223 * fVar223 * auVar151._12_4_ * 0.5;
        auVar38._16_4_ = fVar226 * fVar226 * fVar226 * auVar151._16_4_ * 0.5;
        auVar38._20_4_ = fVar229 * fVar229 * fVar229 * auVar151._20_4_ * 0.5;
        auVar38._24_4_ = fVar232 * fVar232 * fVar232 * auVar151._24_4_ * 0.5;
        auVar38._28_4_ = auVar151._28_4_;
        auVar24 = vsubps_avx(auVar37,auVar38);
        fVar245 = auVar24._0_4_;
        fVar250 = auVar24._4_4_;
        fVar264 = auVar24._8_4_;
        fVar223 = auVar24._12_4_;
        fVar226 = auVar24._16_4_;
        fVar229 = auVar24._20_4_;
        fVar232 = auVar24._24_4_;
        local_560 = fVar143 * fVar233 * fVar243;
        fStack_55c = fVar159 * fVar246 * fVar247;
        auVar39._4_4_ = fStack_55c;
        auVar39._0_4_ = local_560;
        fStack_558 = fStack_778 * fVar261 * fVar262;
        auVar39._8_4_ = fStack_558;
        fStack_554 = fStack_774 * fVar265 * fVar266;
        auVar39._12_4_ = fStack_554;
        fStack_550 = fStack_770 * fVar325 * fVar296;
        auVar39._16_4_ = fStack_550;
        fStack_54c = fStack_76c * fVar326 * fVar299;
        auVar39._20_4_ = fStack_54c;
        fStack_548 = fStack_768 * fVar327 * fVar300;
        auVar39._24_4_ = fStack_548;
        auVar39._28_4_ = fStack_544;
        local_560 = local_560 + auVar330._0_4_;
        fStack_55c = fStack_55c + auVar330._4_4_;
        fStack_558 = fStack_558 + auVar330._8_4_;
        fStack_554 = fStack_554 + auVar330._12_4_;
        fStack_550 = fStack_550 + auVar330._16_4_;
        fStack_54c = fStack_54c + auVar330._20_4_;
        fStack_548 = fStack_548 + auVar330._24_4_;
        fStack_544 = fStack_544 + auVar330._28_4_;
        fVar233 = fVar143 * fVar243 * -fVar144;
        fVar246 = fVar159 * fVar247 * -fVar160;
        auVar40._4_4_ = fVar246;
        auVar40._0_4_ = fVar233;
        fVar261 = fStack_778 * fVar262 * -fVar249;
        auVar40._8_4_ = fVar261;
        fVar265 = fStack_774 * fVar266 * -fVar277;
        auVar40._12_4_ = fVar265;
        fVar325 = fStack_770 * fVar296 * -fVar163;
        auVar40._16_4_ = fVar325;
        fVar326 = fStack_76c * fVar299 * -fVar164;
        auVar40._20_4_ = fVar326;
        fVar327 = fStack_768 * fVar300 * -fVar165;
        auVar40._24_4_ = fVar327;
        auVar40._28_4_ = fVar184;
        local_580._4_4_ = fVar246 + auVar334._4_4_;
        local_580._0_4_ = fVar233 + auVar334._0_4_;
        fStack_578 = fVar261 + auVar334._8_4_;
        fStack_574 = fVar265 + auVar334._12_4_;
        fStack_570 = fVar325 + auVar334._16_4_;
        fStack_56c = fVar326 + auVar334._20_4_;
        fStack_568 = fVar327 + auVar334._24_4_;
        fStack_564 = fVar184 + auVar334._28_4_;
        fVar233 = fVar243 * 0.0 * fVar143;
        fVar243 = fVar247 * 0.0 * fVar159;
        auVar41._4_4_ = fVar243;
        auVar41._0_4_ = fVar233;
        fVar246 = fVar262 * 0.0 * fStack_778;
        auVar41._8_4_ = fVar246;
        fVar247 = fVar266 * 0.0 * fStack_774;
        auVar41._12_4_ = fVar247;
        fVar261 = fVar296 * 0.0 * fStack_770;
        auVar41._16_4_ = fVar261;
        fVar262 = fVar299 * 0.0 * fStack_76c;
        auVar41._20_4_ = fVar262;
        fVar265 = fVar300 * 0.0 * fStack_768;
        auVar41._24_4_ = fVar265;
        auVar41._28_4_ = fVar317;
        auVar124._4_4_ = fStack_53c;
        auVar124._0_4_ = local_540;
        auVar124._8_4_ = fStack_538;
        auVar124._12_4_ = fStack_534;
        auVar124._16_4_ = fStack_530;
        auVar124._20_4_ = fStack_52c;
        auVar124._24_4_ = fStack_528;
        auVar124._28_4_ = fStack_524;
        auVar287._0_4_ = fVar233 + local_540;
        auVar287._4_4_ = fVar243 + fStack_53c;
        auVar287._8_4_ = fVar246 + fStack_538;
        auVar287._12_4_ = fVar247 + fStack_534;
        auVar287._16_4_ = fVar261 + fStack_530;
        auVar287._20_4_ = fVar262 + fStack_52c;
        auVar287._24_4_ = fVar265 + fStack_528;
        auVar287._28_4_ = fVar317 + fStack_524;
        fVar233 = local_680._0_4_ * fVar244 * fVar245;
        fVar243 = local_680._4_4_ * fVar248 * fVar250;
        auVar42._4_4_ = fVar243;
        auVar42._0_4_ = fVar233;
        fVar244 = local_680._8_4_ * fVar263 * fVar264;
        auVar42._8_4_ = fVar244;
        fVar246 = local_680._12_4_ * fVar290 * fVar223;
        auVar42._12_4_ = fVar246;
        fVar247 = local_680._16_4_ * fVar297 * fVar226;
        auVar42._16_4_ = fVar247;
        fVar248 = local_680._20_4_ * fVar204 * fVar229;
        auVar42._20_4_ = fVar248;
        fVar261 = local_680._24_4_ * fVar301 * fVar232;
        auVar42._24_4_ = fVar261;
        auVar42._28_4_ = auVar25._28_4_;
        auVar29 = vsubps_avx(auVar330,auVar39);
        auVar308._0_4_ = local_360._0_4_ + fVar233;
        auVar308._4_4_ = local_360._4_4_ + fVar243;
        auVar308._8_4_ = local_360._8_4_ + fVar244;
        auVar308._12_4_ = local_360._12_4_ + fVar246;
        auVar308._16_4_ = local_360._16_4_ + fVar247;
        auVar308._20_4_ = local_360._20_4_ + fVar248;
        auVar308._24_4_ = local_360._24_4_ + fVar261;
        auVar308._28_4_ = local_360._28_4_ + auVar25._28_4_;
        fVar233 = local_680._0_4_ * -fVar206 * fVar245;
        fVar243 = local_680._4_4_ * -fVar166 * fVar250;
        auVar43._4_4_ = fVar243;
        auVar43._0_4_ = fVar233;
        fVar244 = local_680._8_4_ * -fVar185 * fVar264;
        auVar43._8_4_ = fVar244;
        fVar246 = local_680._12_4_ * -fVar278 * fVar223;
        auVar43._12_4_ = fVar246;
        fVar247 = local_680._16_4_ * -fVar225 * fVar226;
        auVar43._16_4_ = fVar247;
        fVar248 = local_680._20_4_ * -fVar228 * fVar229;
        auVar43._20_4_ = fVar248;
        fVar261 = local_680._24_4_ * -fVar231 * fVar232;
        auVar43._24_4_ = fVar261;
        auVar43._28_4_ = fVar354;
        auVar30 = vsubps_avx(auVar334,auVar40);
        auVar320._0_4_ = fVar233 + (float)local_520._0_4_;
        auVar320._4_4_ = fVar243 + (float)local_520._4_4_;
        auVar320._8_4_ = fVar244 + fStack_518;
        auVar320._12_4_ = fVar246 + fStack_514;
        auVar320._16_4_ = fVar247 + fStack_510;
        auVar320._20_4_ = fVar248 + fStack_50c;
        auVar320._24_4_ = fVar261 + fStack_508;
        auVar320._28_4_ = fVar354 + fStack_504;
        fVar233 = fVar245 * 0.0 * local_680._0_4_;
        fVar243 = fVar250 * 0.0 * local_680._4_4_;
        auVar44._4_4_ = fVar243;
        auVar44._0_4_ = fVar233;
        fVar244 = fVar264 * 0.0 * local_680._8_4_;
        auVar44._8_4_ = fVar244;
        fVar245 = fVar223 * 0.0 * local_680._12_4_;
        auVar44._12_4_ = fVar245;
        fVar246 = fVar226 * 0.0 * local_680._16_4_;
        auVar44._16_4_ = fVar246;
        fVar247 = fVar229 * 0.0 * local_680._20_4_;
        auVar44._20_4_ = fVar247;
        fVar248 = fVar232 * 0.0 * local_680._24_4_;
        auVar44._24_4_ = fVar248;
        auVar44._28_4_ = fVar364;
        auVar148 = vsubps_avx(auVar124,auVar41);
        auVar366._0_4_ = fVar233 + (float)local_4a0._0_4_;
        auVar366._4_4_ = fVar243 + (float)local_4a0._4_4_;
        auVar366._8_4_ = fVar244 + fStack_498;
        auVar366._12_4_ = fVar245 + fStack_494;
        auVar366._16_4_ = fVar246 + fStack_490;
        auVar366._20_4_ = fVar247 + fStack_48c;
        auVar366._24_4_ = fVar248 + fStack_488;
        auVar366._28_4_ = fVar364 + fStack_484;
        auVar24 = vsubps_avx(local_360,auVar42);
        auVar25 = vsubps_avx(_local_520,auVar43);
        auVar26 = vsubps_avx(_local_4a0,auVar44);
        auVar27 = vsubps_avx(auVar320,auVar30);
        auVar28 = vsubps_avx(auVar366,auVar148);
        auVar45._4_4_ = auVar148._4_4_ * auVar27._4_4_;
        auVar45._0_4_ = auVar148._0_4_ * auVar27._0_4_;
        auVar45._8_4_ = auVar148._8_4_ * auVar27._8_4_;
        auVar45._12_4_ = auVar148._12_4_ * auVar27._12_4_;
        auVar45._16_4_ = auVar148._16_4_ * auVar27._16_4_;
        auVar45._20_4_ = auVar148._20_4_ * auVar27._20_4_;
        auVar45._24_4_ = auVar148._24_4_ * auVar27._24_4_;
        auVar45._28_4_ = fVar364;
        auVar46._4_4_ = auVar30._4_4_ * auVar28._4_4_;
        auVar46._0_4_ = auVar30._0_4_ * auVar28._0_4_;
        auVar46._8_4_ = auVar30._8_4_ * auVar28._8_4_;
        auVar46._12_4_ = auVar30._12_4_ * auVar28._12_4_;
        auVar46._16_4_ = auVar30._16_4_ * auVar28._16_4_;
        auVar46._20_4_ = auVar30._20_4_ * auVar28._20_4_;
        auVar46._24_4_ = auVar30._24_4_ * auVar28._24_4_;
        auVar46._28_4_ = fStack_504;
        auVar22 = vsubps_avx(auVar46,auVar45);
        auVar47._4_4_ = auVar29._4_4_ * auVar28._4_4_;
        auVar47._0_4_ = auVar29._0_4_ * auVar28._0_4_;
        auVar47._8_4_ = auVar29._8_4_ * auVar28._8_4_;
        auVar47._12_4_ = auVar29._12_4_ * auVar28._12_4_;
        auVar47._16_4_ = auVar29._16_4_ * auVar28._16_4_;
        auVar47._20_4_ = auVar29._20_4_ * auVar28._20_4_;
        auVar47._24_4_ = auVar29._24_4_ * auVar28._24_4_;
        auVar47._28_4_ = auVar28._28_4_;
        auVar149 = vsubps_avx(auVar308,auVar29);
        auVar48._4_4_ = auVar148._4_4_ * auVar149._4_4_;
        auVar48._0_4_ = auVar148._0_4_ * auVar149._0_4_;
        auVar48._8_4_ = auVar148._8_4_ * auVar149._8_4_;
        auVar48._12_4_ = auVar148._12_4_ * auVar149._12_4_;
        auVar48._16_4_ = auVar148._16_4_ * auVar149._16_4_;
        auVar48._20_4_ = auVar148._20_4_ * auVar149._20_4_;
        auVar48._24_4_ = auVar148._24_4_ * auVar149._24_4_;
        auVar48._28_4_ = local_360._28_4_;
        auVar171 = vsubps_avx(auVar48,auVar47);
        auVar49._4_4_ = auVar149._4_4_ * auVar30._4_4_;
        auVar49._0_4_ = auVar149._0_4_ * auVar30._0_4_;
        auVar49._8_4_ = auVar149._8_4_ * auVar30._8_4_;
        auVar49._12_4_ = auVar149._12_4_ * auVar30._12_4_;
        auVar49._16_4_ = auVar149._16_4_ * auVar30._16_4_;
        auVar49._20_4_ = auVar149._20_4_ * auVar30._20_4_;
        auVar49._24_4_ = auVar149._24_4_ * auVar30._24_4_;
        auVar49._28_4_ = auVar28._28_4_;
        auVar50._4_4_ = auVar29._4_4_ * auVar27._4_4_;
        auVar50._0_4_ = auVar29._0_4_ * auVar27._0_4_;
        auVar50._8_4_ = auVar29._8_4_ * auVar27._8_4_;
        auVar50._12_4_ = auVar29._12_4_ * auVar27._12_4_;
        auVar50._16_4_ = auVar29._16_4_ * auVar27._16_4_;
        auVar50._20_4_ = auVar29._20_4_ * auVar27._20_4_;
        auVar50._24_4_ = auVar29._24_4_ * auVar27._24_4_;
        auVar50._28_4_ = auVar27._28_4_;
        auVar27 = vsubps_avx(auVar50,auVar49);
        auVar152._0_4_ = auVar22._0_4_ * 0.0 + auVar27._0_4_ + auVar171._0_4_ * 0.0;
        auVar152._4_4_ = auVar22._4_4_ * 0.0 + auVar27._4_4_ + auVar171._4_4_ * 0.0;
        auVar152._8_4_ = auVar22._8_4_ * 0.0 + auVar27._8_4_ + auVar171._8_4_ * 0.0;
        auVar152._12_4_ = auVar22._12_4_ * 0.0 + auVar27._12_4_ + auVar171._12_4_ * 0.0;
        auVar152._16_4_ = auVar22._16_4_ * 0.0 + auVar27._16_4_ + auVar171._16_4_ * 0.0;
        auVar152._20_4_ = auVar22._20_4_ * 0.0 + auVar27._20_4_ + auVar171._20_4_ * 0.0;
        auVar152._24_4_ = auVar22._24_4_ * 0.0 + auVar27._24_4_ + auVar171._24_4_ * 0.0;
        auVar152._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar171._28_4_;
        auVar22 = vcmpps_avx(auVar152,ZEXT432(0) << 0x20,2);
        auVar123._4_4_ = fStack_55c;
        auVar123._0_4_ = local_560;
        auVar123._8_4_ = fStack_558;
        auVar123._12_4_ = fStack_554;
        auVar123._16_4_ = fStack_550;
        auVar123._20_4_ = fStack_54c;
        auVar123._24_4_ = fStack_548;
        auVar123._28_4_ = fStack_544;
        auVar24 = vblendvps_avx(auVar24,auVar123,auVar22);
        _local_500 = vblendvps_avx(auVar25,_local_580,auVar22);
        auVar25 = vblendvps_avx(auVar26,auVar287,auVar22);
        auVar26 = vblendvps_avx(auVar29,auVar308,auVar22);
        auVar27 = vblendvps_avx(auVar30,auVar320,auVar22);
        auVar28 = vblendvps_avx(auVar148,auVar366,auVar22);
        auVar29 = vblendvps_avx(auVar308,auVar29,auVar22);
        auVar30 = vblendvps_avx(auVar320,auVar30,auVar22);
        _local_720 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
        _auStack_710 = auVar23._16_16_;
        auVar23 = vblendvps_avx(auVar366,auVar148,auVar22);
        auVar29 = vsubps_avx(auVar29,auVar24);
        auVar149 = vsubps_avx(auVar30,_local_500);
        auVar171 = vsubps_avx(auVar23,auVar25);
        auVar23 = vsubps_avx(_local_500,auVar27);
        fVar233 = auVar149._0_4_;
        fVar165 = auVar25._0_4_;
        fVar247 = auVar149._4_4_;
        fVar206 = auVar25._4_4_;
        auVar51._4_4_ = fVar206 * fVar247;
        auVar51._0_4_ = fVar165 * fVar233;
        fVar263 = auVar149._8_4_;
        fVar166 = auVar25._8_4_;
        auVar51._8_4_ = fVar166 * fVar263;
        fVar223 = auVar149._12_4_;
        fVar185 = auVar25._12_4_;
        auVar51._12_4_ = fVar185 * fVar223;
        fVar326 = auVar149._16_4_;
        fVar278 = auVar25._16_4_;
        auVar51._16_4_ = fVar278 * fVar326;
        fVar300 = auVar149._20_4_;
        fVar225 = auVar25._20_4_;
        auVar51._20_4_ = fVar225 * fVar300;
        fVar160 = auVar149._24_4_;
        fVar228 = auVar25._24_4_;
        auVar51._24_4_ = fVar228 * fVar160;
        auVar51._28_4_ = auVar30._28_4_;
        fVar243 = local_500._0_4_;
        fVar181 = auVar171._0_4_;
        fVar248 = local_500._4_4_;
        fVar182 = auVar171._4_4_;
        auVar52._4_4_ = fVar182 * fVar248;
        auVar52._0_4_ = fVar181 * fVar243;
        fVar264 = local_500._8_4_;
        fVar187 = auVar171._8_4_;
        auVar52._8_4_ = fVar187 * fVar264;
        fVar325 = local_500._12_4_;
        fVar199 = auVar171._12_4_;
        auVar52._12_4_ = fVar199 * fVar325;
        fVar299 = local_500._16_4_;
        fVar201 = auVar171._16_4_;
        auVar52._16_4_ = fVar201 * fVar299;
        fVar301 = local_500._20_4_;
        fVar203 = auVar171._20_4_;
        auVar52._20_4_ = fVar203 * fVar301;
        fVar249 = local_500._24_4_;
        fVar267 = auVar171._24_4_;
        uVar7 = auVar148._28_4_;
        auVar52._24_4_ = fVar267 * fVar249;
        auVar52._28_4_ = uVar7;
        auVar30 = vsubps_avx(auVar52,auVar51);
        fVar244 = auVar24._0_4_;
        fVar250 = auVar24._4_4_;
        auVar53._4_4_ = fVar182 * fVar250;
        auVar53._0_4_ = fVar181 * fVar244;
        fVar265 = auVar24._8_4_;
        auVar53._8_4_ = fVar187 * fVar265;
        fVar296 = auVar24._12_4_;
        auVar53._12_4_ = fVar199 * fVar296;
        fVar204 = auVar24._16_4_;
        auVar53._16_4_ = fVar201 * fVar204;
        fVar232 = auVar24._20_4_;
        auVar53._20_4_ = fVar203 * fVar232;
        fVar277 = auVar24._24_4_;
        auVar53._24_4_ = fVar267 * fVar277;
        auVar53._28_4_ = uVar7;
        fVar245 = auVar29._0_4_;
        auVar358._0_4_ = fVar165 * fVar245;
        fVar261 = auVar29._4_4_;
        auVar358._4_4_ = fVar206 * fVar261;
        fVar266 = auVar29._8_4_;
        auVar358._8_4_ = fVar166 * fVar266;
        fVar297 = auVar29._12_4_;
        auVar358._12_4_ = fVar185 * fVar297;
        fVar229 = auVar29._16_4_;
        auVar358._16_4_ = fVar278 * fVar229;
        fVar184 = auVar29._20_4_;
        auVar358._20_4_ = fVar225 * fVar184;
        fVar163 = auVar29._24_4_;
        auVar358._24_4_ = fVar228 * fVar163;
        auVar358._28_4_ = 0;
        auVar148 = vsubps_avx(auVar358,auVar53);
        auVar54._4_4_ = fVar248 * fVar261;
        auVar54._0_4_ = fVar243 * fVar245;
        auVar54._8_4_ = fVar264 * fVar266;
        auVar54._12_4_ = fVar325 * fVar297;
        auVar54._16_4_ = fVar299 * fVar229;
        auVar54._20_4_ = fVar301 * fVar184;
        auVar54._24_4_ = fVar249 * fVar163;
        auVar54._28_4_ = uVar7;
        auVar55._4_4_ = fVar250 * fVar247;
        auVar55._0_4_ = fVar244 * fVar233;
        auVar55._8_4_ = fVar265 * fVar263;
        auVar55._12_4_ = fVar296 * fVar223;
        auVar55._16_4_ = fVar204 * fVar326;
        auVar55._20_4_ = fVar232 * fVar300;
        auVar55._24_4_ = fVar277 * fVar160;
        auVar55._28_4_ = auVar366._28_4_;
        auVar172 = vsubps_avx(auVar55,auVar54);
        auVar173 = vsubps_avx(auVar25,auVar28);
        fVar246 = auVar172._28_4_ + auVar148._28_4_;
        auVar288._0_4_ = auVar172._0_4_ + auVar148._0_4_ * 0.0 + auVar30._0_4_ * 0.0;
        auVar288._4_4_ = auVar172._4_4_ + auVar148._4_4_ * 0.0 + auVar30._4_4_ * 0.0;
        auVar288._8_4_ = auVar172._8_4_ + auVar148._8_4_ * 0.0 + auVar30._8_4_ * 0.0;
        auVar288._12_4_ = auVar172._12_4_ + auVar148._12_4_ * 0.0 + auVar30._12_4_ * 0.0;
        auVar288._16_4_ = auVar172._16_4_ + auVar148._16_4_ * 0.0 + auVar30._16_4_ * 0.0;
        auVar288._20_4_ = auVar172._20_4_ + auVar148._20_4_ * 0.0 + auVar30._20_4_ * 0.0;
        auVar288._24_4_ = auVar172._24_4_ + auVar148._24_4_ * 0.0 + auVar30._24_4_ * 0.0;
        auVar288._28_4_ = fVar246 + auVar30._28_4_;
        fVar231 = auVar23._0_4_;
        fVar142 = auVar23._4_4_;
        auVar56._4_4_ = fVar142 * auVar28._4_4_;
        auVar56._0_4_ = fVar231 * auVar28._0_4_;
        fVar158 = auVar23._8_4_;
        auVar56._8_4_ = fVar158 * auVar28._8_4_;
        fVar161 = auVar23._12_4_;
        auVar56._12_4_ = fVar161 * auVar28._12_4_;
        fVar162 = auVar23._16_4_;
        auVar56._16_4_ = fVar162 * auVar28._16_4_;
        fVar167 = auVar23._20_4_;
        auVar56._20_4_ = fVar167 * auVar28._20_4_;
        fVar180 = auVar23._24_4_;
        auVar56._24_4_ = fVar180 * auVar28._24_4_;
        auVar56._28_4_ = fVar246;
        fVar246 = auVar173._0_4_;
        fVar262 = auVar173._4_4_;
        auVar57._4_4_ = auVar27._4_4_ * fVar262;
        auVar57._0_4_ = auVar27._0_4_ * fVar246;
        fVar290 = auVar173._8_4_;
        auVar57._8_4_ = auVar27._8_4_ * fVar290;
        fVar226 = auVar173._12_4_;
        auVar57._12_4_ = auVar27._12_4_ * fVar226;
        fVar327 = auVar173._16_4_;
        auVar57._16_4_ = auVar27._16_4_ * fVar327;
        fVar144 = auVar173._20_4_;
        auVar57._20_4_ = auVar27._20_4_ * fVar144;
        fVar164 = auVar173._24_4_;
        auVar57._24_4_ = auVar27._24_4_ * fVar164;
        auVar57._28_4_ = auVar172._28_4_;
        auVar23 = vsubps_avx(auVar57,auVar56);
        auVar148 = vsubps_avx(auVar24,auVar26);
        fVar274 = auVar148._0_4_;
        fVar275 = auVar148._4_4_;
        auVar58._4_4_ = fVar275 * auVar28._4_4_;
        auVar58._0_4_ = fVar274 * auVar28._0_4_;
        fVar276 = auVar148._8_4_;
        auVar58._8_4_ = fVar276 * auVar28._8_4_;
        fVar298 = auVar148._12_4_;
        auVar58._12_4_ = fVar298 * auVar28._12_4_;
        fVar303 = auVar148._16_4_;
        auVar58._16_4_ = fVar303 * auVar28._16_4_;
        fVar313 = auVar148._20_4_;
        auVar58._20_4_ = fVar313 * auVar28._20_4_;
        fVar315 = auVar148._24_4_;
        auVar58._24_4_ = fVar315 * auVar28._24_4_;
        auVar58._28_4_ = auVar28._28_4_;
        auVar59._4_4_ = auVar26._4_4_ * fVar262;
        auVar59._0_4_ = auVar26._0_4_ * fVar246;
        auVar59._8_4_ = auVar26._8_4_ * fVar290;
        auVar59._12_4_ = auVar26._12_4_ * fVar226;
        auVar59._16_4_ = auVar26._16_4_ * fVar327;
        auVar59._20_4_ = auVar26._20_4_ * fVar144;
        auVar59._24_4_ = auVar26._24_4_ * fVar164;
        auVar59._28_4_ = auVar30._28_4_;
        auVar30 = vsubps_avx(auVar58,auVar59);
        auVar60._4_4_ = auVar27._4_4_ * fVar275;
        auVar60._0_4_ = auVar27._0_4_ * fVar274;
        auVar60._8_4_ = auVar27._8_4_ * fVar276;
        auVar60._12_4_ = auVar27._12_4_ * fVar298;
        auVar60._16_4_ = auVar27._16_4_ * fVar303;
        auVar60._20_4_ = auVar27._20_4_ * fVar313;
        auVar60._24_4_ = auVar27._24_4_ * fVar315;
        auVar60._28_4_ = auVar28._28_4_;
        auVar61._4_4_ = auVar26._4_4_ * fVar142;
        auVar61._0_4_ = auVar26._0_4_ * fVar231;
        auVar61._8_4_ = auVar26._8_4_ * fVar158;
        auVar61._12_4_ = auVar26._12_4_ * fVar161;
        auVar61._16_4_ = auVar26._16_4_ * fVar162;
        auVar61._20_4_ = auVar26._20_4_ * fVar167;
        auVar61._24_4_ = auVar26._24_4_ * fVar180;
        auVar61._28_4_ = auVar26._28_4_;
        auVar26 = vsubps_avx(auVar61,auVar60);
        auVar239._0_4_ = auVar23._0_4_ * 0.0 + auVar26._0_4_ + auVar30._0_4_ * 0.0;
        auVar239._4_4_ = auVar23._4_4_ * 0.0 + auVar26._4_4_ + auVar30._4_4_ * 0.0;
        auVar239._8_4_ = auVar23._8_4_ * 0.0 + auVar26._8_4_ + auVar30._8_4_ * 0.0;
        auVar239._12_4_ = auVar23._12_4_ * 0.0 + auVar26._12_4_ + auVar30._12_4_ * 0.0;
        auVar239._16_4_ = auVar23._16_4_ * 0.0 + auVar26._16_4_ + auVar30._16_4_ * 0.0;
        auVar239._20_4_ = auVar23._20_4_ * 0.0 + auVar26._20_4_ + auVar30._20_4_ * 0.0;
        auVar239._24_4_ = auVar23._24_4_ * 0.0 + auVar26._24_4_ + auVar30._24_4_ * 0.0;
        auVar239._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar30._28_4_;
        auVar242 = ZEXT3264(auVar239);
        auVar23 = vmaxps_avx(auVar288,auVar239);
        auVar23 = vcmpps_avx(auVar23,ZEXT832(0) << 0x20,2);
        auVar254 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
        auVar254 = vpand_avx(auVar254,_local_720);
        auVar191 = vpmovsxwd_avx(auVar254);
        auVar183 = vpunpckhwd_avx(auVar254,auVar254);
        auVar216._16_16_ = auVar183;
        auVar216._0_16_ = auVar191;
        if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar216 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar216 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar216 >> 0x7f,0) == '\0') &&
              (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar183 >> 0x3f,0) == '\0') &&
            (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar183[0xf]) {
LAB_0102661f:
          auVar219 = ZEXT3264(auVar216);
          auVar259._8_8_ = local_4e0._40_8_;
          auVar259._0_8_ = local_4e0._32_8_;
          auVar259._16_8_ = local_4e0._48_8_;
          auVar259._24_8_ = local_4e0._56_8_;
          auVar295 = ZEXT3264(auVar147);
          auVar312 = ZEXT3264(auVar306);
          auVar337._4_4_ = fVar159;
          auVar337._0_4_ = fVar143;
          auVar337._8_4_ = fStack_778;
          auVar337._12_4_ = fStack_774;
          auVar337._16_4_ = fStack_770;
          auVar337._20_4_ = fStack_76c;
          auVar337._24_4_ = fStack_768;
          auVar337._28_4_ = fStack_764;
        }
        else {
          auVar62._4_4_ = fVar262 * fVar247;
          auVar62._0_4_ = fVar246 * fVar233;
          auVar62._8_4_ = fVar290 * fVar263;
          auVar62._12_4_ = fVar226 * fVar223;
          auVar62._16_4_ = fVar327 * fVar326;
          auVar62._20_4_ = fVar144 * fVar300;
          auVar62._24_4_ = fVar164 * fVar160;
          auVar62._28_4_ = auVar183._12_4_;
          auVar335._0_4_ = fVar231 * fVar181;
          auVar335._4_4_ = fVar142 * fVar182;
          auVar335._8_4_ = fVar158 * fVar187;
          auVar335._12_4_ = fVar161 * fVar199;
          auVar335._16_4_ = fVar162 * fVar201;
          auVar335._20_4_ = fVar167 * fVar203;
          auVar335._24_4_ = fVar180 * fVar267;
          auVar335._28_4_ = 0;
          auVar23 = vsubps_avx(auVar335,auVar62);
          auVar63._4_4_ = fVar275 * fVar182;
          auVar63._0_4_ = fVar274 * fVar181;
          auVar63._8_4_ = fVar276 * fVar187;
          auVar63._12_4_ = fVar298 * fVar199;
          auVar63._16_4_ = fVar303 * fVar201;
          auVar63._20_4_ = fVar313 * fVar203;
          auVar63._24_4_ = fVar315 * fVar267;
          auVar63._28_4_ = auVar171._28_4_;
          auVar64._4_4_ = fVar262 * fVar261;
          auVar64._0_4_ = fVar246 * fVar245;
          auVar64._8_4_ = fVar290 * fVar266;
          auVar64._12_4_ = fVar226 * fVar297;
          auVar64._16_4_ = fVar327 * fVar229;
          auVar64._20_4_ = fVar144 * fVar184;
          auVar64._24_4_ = fVar164 * fVar163;
          auVar64._28_4_ = auVar173._28_4_;
          auVar27 = vsubps_avx(auVar64,auVar63);
          auVar65._4_4_ = fVar142 * fVar261;
          auVar65._0_4_ = fVar231 * fVar245;
          auVar65._8_4_ = fVar158 * fVar266;
          auVar65._12_4_ = fVar161 * fVar297;
          auVar65._16_4_ = fVar162 * fVar229;
          auVar65._20_4_ = fVar167 * fVar184;
          auVar65._24_4_ = fVar180 * fVar163;
          auVar65._28_4_ = auVar29._28_4_;
          auVar66._4_4_ = fVar275 * fVar247;
          auVar66._0_4_ = fVar274 * fVar233;
          auVar66._8_4_ = fVar276 * fVar263;
          auVar66._12_4_ = fVar298 * fVar223;
          auVar66._16_4_ = fVar303 * fVar326;
          auVar66._20_4_ = fVar313 * fVar300;
          auVar66._24_4_ = fVar315 * fVar160;
          auVar66._28_4_ = auVar288._28_4_;
          auVar28 = vsubps_avx(auVar66,auVar65);
          auVar289._0_4_ = auVar23._0_4_ * 0.0 + auVar28._0_4_ + auVar27._0_4_ * 0.0;
          auVar289._4_4_ = auVar23._4_4_ * 0.0 + auVar28._4_4_ + auVar27._4_4_ * 0.0;
          auVar289._8_4_ = auVar23._8_4_ * 0.0 + auVar28._8_4_ + auVar27._8_4_ * 0.0;
          auVar289._12_4_ = auVar23._12_4_ * 0.0 + auVar28._12_4_ + auVar27._12_4_ * 0.0;
          auVar289._16_4_ = auVar23._16_4_ * 0.0 + auVar28._16_4_ + auVar27._16_4_ * 0.0;
          auVar289._20_4_ = auVar23._20_4_ * 0.0 + auVar28._20_4_ + auVar27._20_4_ * 0.0;
          auVar289._24_4_ = auVar23._24_4_ * 0.0 + auVar28._24_4_ + auVar27._24_4_ * 0.0;
          auVar289._28_4_ = auVar288._28_4_ + auVar28._28_4_ + auVar29._28_4_;
          auVar26 = vrcpps_avx(auVar289);
          fVar245 = auVar26._0_4_;
          fVar246 = auVar26._4_4_;
          auVar67._4_4_ = auVar289._4_4_ * fVar246;
          auVar67._0_4_ = auVar289._0_4_ * fVar245;
          fVar247 = auVar26._8_4_;
          auVar67._8_4_ = auVar289._8_4_ * fVar247;
          fVar261 = auVar26._12_4_;
          auVar67._12_4_ = auVar289._12_4_ * fVar261;
          fVar262 = auVar26._16_4_;
          auVar67._16_4_ = auVar289._16_4_ * fVar262;
          fVar263 = auVar26._20_4_;
          auVar67._20_4_ = auVar289._20_4_ * fVar263;
          fVar266 = auVar26._24_4_;
          auVar67._24_4_ = auVar289._24_4_ * fVar266;
          auVar67._28_4_ = auVar173._28_4_;
          auVar336._8_4_ = 0x3f800000;
          auVar336._0_8_ = 0x3f8000003f800000;
          auVar336._12_4_ = 0x3f800000;
          auVar336._16_4_ = 0x3f800000;
          auVar336._20_4_ = 0x3f800000;
          auVar336._24_4_ = 0x3f800000;
          auVar336._28_4_ = 0x3f800000;
          auVar29 = vsubps_avx(auVar336,auVar67);
          fVar245 = auVar29._0_4_ * fVar245 + fVar245;
          fVar246 = auVar29._4_4_ * fVar246 + fVar246;
          fVar247 = auVar29._8_4_ * fVar247 + fVar247;
          fVar261 = auVar29._12_4_ * fVar261 + fVar261;
          fVar262 = auVar29._16_4_ * fVar262 + fVar262;
          fVar263 = auVar29._20_4_ * fVar263 + fVar263;
          fVar266 = auVar29._24_4_ * fVar266 + fVar266;
          auVar68._4_4_ =
               (auVar23._4_4_ * fVar250 + auVar27._4_4_ * fVar248 + auVar28._4_4_ * fVar206) *
               fVar246;
          auVar68._0_4_ =
               (auVar23._0_4_ * fVar244 + auVar27._0_4_ * fVar243 + auVar28._0_4_ * fVar165) *
               fVar245;
          auVar68._8_4_ =
               (auVar23._8_4_ * fVar265 + auVar27._8_4_ * fVar264 + auVar28._8_4_ * fVar166) *
               fVar247;
          auVar68._12_4_ =
               (auVar23._12_4_ * fVar296 + auVar27._12_4_ * fVar325 + auVar28._12_4_ * fVar185) *
               fVar261;
          auVar68._16_4_ =
               (auVar23._16_4_ * fVar204 + auVar27._16_4_ * fVar299 + auVar28._16_4_ * fVar278) *
               fVar262;
          auVar68._20_4_ =
               (auVar23._20_4_ * fVar232 + auVar27._20_4_ * fVar301 + auVar28._20_4_ * fVar225) *
               fVar263;
          auVar68._24_4_ =
               (auVar23._24_4_ * fVar277 + auVar27._24_4_ * fVar249 + auVar28._24_4_ * fVar228) *
               fVar266;
          auVar68._28_4_ = auVar24._28_4_ + auVar149._28_4_ + auVar25._28_4_;
          auVar191 = vpermilps_avx((undefined1  [16])aVar8,0xff);
          auVar217._16_16_ = auVar191;
          auVar217._0_16_ = auVar191;
          auVar23 = vcmpps_avx(auVar217,auVar68,2);
          fVar233 = ray->tfar;
          auVar257._4_4_ = fVar233;
          auVar257._0_4_ = fVar233;
          auVar257._8_4_ = fVar233;
          auVar257._12_4_ = fVar233;
          auVar257._16_4_ = fVar233;
          auVar257._20_4_ = fVar233;
          auVar257._24_4_ = fVar233;
          auVar257._28_4_ = fVar233;
          auVar25 = vcmpps_avx(auVar68,auVar257,2);
          auVar23 = vandps_avx(auVar25,auVar23);
          auVar191 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
          auVar254 = vpand_avx(auVar254,auVar191);
          auVar191 = vpmovsxwd_avx(auVar254);
          auVar183 = vpshufd_avx(auVar254,0xee);
          auVar183 = vpmovsxwd_avx(auVar183);
          auVar216._16_16_ = auVar183;
          auVar216._0_16_ = auVar191;
          if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar216 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar216 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar216 >> 0x7f,0) == '\0') &&
                (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar183 >> 0x3f,0) == '\0') &&
              (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar183[0xf]) goto LAB_0102661f;
          auVar23 = vcmpps_avx(ZEXT832(0) << 0x20,auVar289,4);
          auVar191 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
          auVar254 = vpand_avx(auVar254,auVar191);
          auVar191 = vpmovsxwd_avx(auVar254);
          auVar254 = vpunpckhwd_avx(auVar254,auVar254);
          auVar219 = ZEXT1664(auVar254);
          auVar272._16_16_ = auVar254;
          auVar272._0_16_ = auVar191;
          auVar259._8_8_ = local_4e0._40_8_;
          auVar259._0_8_ = local_4e0._32_8_;
          auVar259._16_8_ = local_4e0._48_8_;
          auVar259._24_8_ = local_4e0._56_8_;
          auVar295 = ZEXT3264(auVar147);
          auVar312 = ZEXT3264(auVar306);
          auVar337._4_4_ = fVar159;
          auVar337._0_4_ = fVar143;
          auVar337._8_4_ = fStack_778;
          auVar337._12_4_ = fStack_774;
          auVar337._16_4_ = fStack_770;
          auVar337._20_4_ = fStack_76c;
          auVar337._24_4_ = fStack_768;
          auVar337._28_4_ = fStack_764;
          if ((((((((auVar272 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar272 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar272 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar272 >> 0x7f,0) != '\0') ||
                (auVar272 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar254 >> 0x3f,0) != '\0') ||
              (auVar272 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar254[0xf] < '\0') {
            auVar218._0_4_ = auVar288._0_4_ * fVar245;
            auVar218._4_4_ = auVar288._4_4_ * fVar246;
            auVar218._8_4_ = auVar288._8_4_ * fVar247;
            auVar218._12_4_ = auVar288._12_4_ * fVar261;
            auVar218._16_4_ = auVar288._16_4_ * fVar262;
            auVar218._20_4_ = auVar288._20_4_ * fVar263;
            auVar218._24_4_ = auVar288._24_4_ * fVar266;
            auVar218._28_4_ = 0;
            auVar69._4_4_ = auVar239._4_4_ * fVar246;
            auVar69._0_4_ = auVar239._0_4_ * fVar245;
            auVar69._8_4_ = auVar239._8_4_ * fVar247;
            auVar69._12_4_ = auVar239._12_4_ * fVar261;
            auVar69._16_4_ = auVar239._16_4_ * fVar262;
            auVar69._20_4_ = auVar239._20_4_ * fVar263;
            auVar69._24_4_ = auVar239._24_4_ * fVar266;
            auVar69._28_4_ = auVar29._28_4_ + auVar26._28_4_;
            auVar258._8_4_ = 0x3f800000;
            auVar258._0_8_ = 0x3f8000003f800000;
            auVar258._12_4_ = 0x3f800000;
            auVar258._16_4_ = 0x3f800000;
            auVar258._20_4_ = 0x3f800000;
            auVar258._24_4_ = 0x3f800000;
            auVar258._28_4_ = 0x3f800000;
            auVar147 = vsubps_avx(auVar258,auVar218);
            auVar242 = ZEXT3264(auVar147);
            auVar147 = vblendvps_avx(auVar147,auVar218,auVar22);
            auVar295 = ZEXT3264(auVar147);
            auVar147 = vsubps_avx(auVar258,auVar69);
            auVar219 = ZEXT3264(auVar147);
            _local_3c0 = vblendvps_avx(auVar147,auVar69,auVar22);
            auVar312 = ZEXT3264(auVar68);
            auVar259 = auVar272;
          }
        }
        auVar331 = ZEXT3264(_local_700);
        if ((((((((auVar259 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar259 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar259 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar259 >> 0x7f,0) != '\0') ||
              (auVar259 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar259 >> 0xbf,0) != '\0') ||
            (auVar259 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar259[0x1f] < '\0') {
          auVar147 = vsubps_avx(local_680._0_32_,auVar337);
          fVar243 = auVar337._0_4_ + auVar295._0_4_ * auVar147._0_4_;
          fVar244 = auVar337._4_4_ + auVar295._4_4_ * auVar147._4_4_;
          fVar245 = auVar337._8_4_ + auVar295._8_4_ * auVar147._8_4_;
          fVar246 = auVar337._12_4_ + auVar295._12_4_ * auVar147._12_4_;
          fVar247 = auVar337._16_4_ + auVar295._16_4_ * auVar147._16_4_;
          fVar248 = auVar337._20_4_ + auVar295._20_4_ * auVar147._20_4_;
          fVar250 = auVar337._24_4_ + auVar295._24_4_ * auVar147._24_4_;
          fVar261 = auVar337._28_4_ + auVar147._28_4_;
          fVar233 = local_7a0->depth_scale;
          auVar70._4_4_ = (fVar244 + fVar244) * fVar233;
          auVar70._0_4_ = (fVar243 + fVar243) * fVar233;
          auVar70._8_4_ = (fVar245 + fVar245) * fVar233;
          auVar70._12_4_ = (fVar246 + fVar246) * fVar233;
          auVar70._16_4_ = (fVar247 + fVar247) * fVar233;
          auVar70._20_4_ = (fVar248 + fVar248) * fVar233;
          auVar70._24_4_ = (fVar250 + fVar250) * fVar233;
          auVar70._28_4_ = fVar261 + fVar261;
          local_2e0 = auVar312._0_32_;
          auVar147 = vcmpps_avx(local_2e0,auVar70,6);
          auVar306 = auVar259 & auVar147;
          if ((((((((auVar306 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar306 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar306 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar306 >> 0x7f,0) != '\0') ||
                (auVar306 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar306 >> 0xbf,0) != '\0') ||
              (auVar306 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar306[0x1f] < '\0') {
            local_260 = vandps_avx(auVar147,auVar259);
            local_3c0._0_4_ = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
            local_3c0._4_4_ = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
            uStack_3b8._0_4_ = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
            uStack_3b8._4_4_ = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
            uStack_3b0._0_4_ = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
            uStack_3b0._4_4_ = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
            uStack_3a8._0_4_ = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
            uStack_3a8._4_4_ = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
            local_320 = auVar295._0_32_;
            auVar130 = _local_3c0;
            auVar147 = _local_3c0;
            local_300 = (float)local_3c0._0_4_;
            fStack_2fc = (float)local_3c0._4_4_;
            fStack_2f8 = (float)uStack_3b8;
            fStack_2f4 = uStack_3b8._4_4_;
            fStack_2f0 = (float)uStack_3b0;
            fStack_2ec = uStack_3b0._4_4_;
            fStack_2e8 = (float)uStack_3a8;
            fStack_2e4 = uStack_3a8._4_4_;
            local_2c0 = 0;
            local_2bc = uVar19;
            local_2b0 = local_790;
            uStack_2a8 = local_790._8_8_;
            local_2a0 = local_5b0;
            uStack_298 = uStack_5a8;
            local_290 = local_5c0;
            uStack_288 = uStack_5b8;
            local_280 = local_5d0;
            uStack_278 = uStack_5c8;
            if ((pGVar138->mask & ray->mask) != 0) {
              local_780 = (uint)pGVar138;
              uStack_77c = (undefined4)((ulong)pGVar138 >> 0x20);
              pGVar133 = (Geometry *)context->args;
              _local_3c0 = auVar147;
              if ((((Geometry *)context->args)->device != (Device *)0x0) ||
                 (bVar140 = true, pGVar133 = pGVar138, _local_5d0 = auVar11, _local_5c0 = auVar13,
                 _local_5b0 = auVar14, pGVar138->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar189._0_4_ = 1.0 / auVar209._0_4_;
                auVar189._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar254 = vshufps_avx(auVar189,auVar189,0);
                local_240[0] = auVar254._0_4_ * (auVar295._0_4_ + 0.0);
                local_240[1] = auVar254._4_4_ * (auVar295._4_4_ + 1.0);
                local_240[2] = auVar254._8_4_ * (auVar295._8_4_ + 2.0);
                local_240[3] = auVar254._12_4_ * (auVar295._12_4_ + 3.0);
                fStack_230 = auVar254._0_4_ * (auVar295._16_4_ + 4.0);
                fStack_22c = auVar254._4_4_ * (auVar295._20_4_ + 5.0);
                fStack_228 = auVar254._8_4_ * (auVar295._24_4_ + 6.0);
                fStack_224 = auVar295._28_4_ + 7.0;
                uStack_3b0 = auVar130._16_8_;
                uStack_3a8 = auVar147._24_8_;
                local_220 = local_3c0;
                uStack_218 = uStack_3b8;
                uStack_210 = uStack_3b0;
                uStack_208 = uStack_3a8;
                local_200 = local_2e0;
                iVar132 = vmovmskps_avx(local_260);
                uVar137 = CONCAT44((int)((ulong)pGVar133 >> 0x20),iVar132);
                lVar134 = 0;
                if (uVar137 != 0) {
                  for (; (uVar137 >> lVar134 & 1) == 0; lVar134 = lVar134 + 1) {
                  }
                }
                if (iVar132 == 0) {
                  bVar140 = false;
                  _local_5d0 = auVar11;
                  _local_5c0 = auVar13;
                  _local_5b0 = auVar14;
                }
                else {
                  local_720 = (undefined1  [8])uVar137;
                  local_4e0._4_28_ = auVar24._4_28_;
                  local_4e0._0_4_ = ray->tfar;
                  local_6c0 = auVar295._0_32_;
                  local_6e0 = local_2e0;
                  fVar233 = (float)local_790._0_4_;
                  fVar243 = (float)local_790._4_4_;
                  fVar244 = (float)uStack_788;
                  fVar245 = uStack_788._4_4_;
                  _local_790 = auVar12;
                  _local_5d0 = auVar11;
                  _local_5c0 = auVar13;
                  _local_5b0 = auVar14;
                  _local_380 = auVar15;
                  do {
                    local_5f4 = local_240[lVar134];
                    local_5f0 = *(undefined4 *)((long)&local_220 + lVar134 * 4);
                    local_680._0_8_ = lVar134;
                    ray->tfar = *(float *)(local_200 + lVar134 * 4);
                    local_650.context = context->user;
                    fVar220 = 1.0 - local_5f4;
                    fVar205 = local_5f4 * fVar220 * 4.0;
                    auVar254 = ZEXT416((uint)(local_5f4 * local_5f4 * 0.5));
                    auVar254 = vshufps_avx(auVar254,auVar254,0);
                    auVar191 = ZEXT416((uint)((fVar220 * fVar220 + fVar205) * 0.5));
                    auVar191 = vshufps_avx(auVar191,auVar191,0);
                    auVar183 = ZEXT416((uint)((-local_5f4 * local_5f4 - fVar205) * 0.5));
                    auVar183 = vshufps_avx(auVar183,auVar183,0);
                    auVar236._0_4_ = auVar183._0_4_ * (float)local_5b0._0_4_;
                    auVar236._4_4_ = auVar183._4_4_ * (float)local_5b0._4_4_;
                    auVar236._8_4_ = auVar183._8_4_ * (float)uStack_5a8;
                    auVar236._12_4_ = auVar183._12_4_ * uStack_5a8._4_4_;
                    auVar242 = ZEXT1664(auVar236);
                    auVar183 = ZEXT416((uint)(fVar220 * -fVar220 * 0.5));
                    auVar183 = vshufps_avx(auVar183,auVar183,0);
                    auVar210._0_4_ = fVar233 * auVar183._0_4_;
                    auVar210._4_4_ = fVar243 * auVar183._4_4_;
                    auVar210._8_4_ = fVar244 * auVar183._8_4_;
                    auVar210._12_4_ = fVar245 * auVar183._12_4_;
                    auVar219 = ZEXT1664(auVar210);
                    auVar190._0_4_ =
                         auVar210._0_4_ +
                         auVar236._0_4_ +
                         auVar254._0_4_ * (float)local_5d0._0_4_ +
                         auVar191._0_4_ * (float)local_5c0._0_4_;
                    auVar190._4_4_ =
                         auVar210._4_4_ +
                         auVar236._4_4_ +
                         auVar254._4_4_ * (float)local_5d0._4_4_ +
                         auVar191._4_4_ * (float)local_5c0._4_4_;
                    auVar190._8_4_ =
                         auVar210._8_4_ +
                         auVar236._8_4_ +
                         auVar254._8_4_ * (float)uStack_5c8 + auVar191._8_4_ * (float)uStack_5b8;
                    auVar190._12_4_ =
                         auVar210._12_4_ +
                         auVar236._12_4_ +
                         auVar254._12_4_ * uStack_5c8._4_4_ + auVar191._12_4_ * uStack_5b8._4_4_;
                    local_600 = vmovlps_avx(auVar190);
                    local_5f8 = vextractps_avx(auVar190,2);
                    local_5ec = local_794;
                    local_5e8 = uVar136;
                    local_5e4 = (local_650.context)->instID[0];
                    local_5e0 = (local_650.context)->instPrimID[0];
                    local_7a4 = -1;
                    local_650.valid = &local_7a4;
                    local_650.geometryUserPtr = *(void **)(CONCAT44(uStack_77c,local_780) + 0x18);
                    local_650.ray = (RTCRayN *)ray;
                    local_650.hit = (RTCHitN *)&local_600;
                    local_650.N = 1;
                    pcVar20 = *(code **)(CONCAT44(uStack_77c,local_780) + 0x48);
                    if (pcVar20 == (code *)0x0) {
LAB_010256b6:
                      p_Var21 = context->args->filter;
                      if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(CONCAT44(uStack_77c,local_780) + 0x3e) & 0x40) != 0)))) {
                        auVar219 = ZEXT1664(auVar219._0_16_);
                        auVar242 = ZEXT1664(auVar242._0_16_);
                        (*p_Var21)(&local_650);
                        if (*local_650.valid == 0) goto LAB_010256ff;
                      }
                      bVar140 = true;
                      auVar295 = ZEXT3264(local_6c0);
                      auVar312 = ZEXT3264(local_6e0);
                      auVar331 = ZEXT3264(_local_700);
                      fVar186 = (float)local_740._0_4_;
                      fVar198 = (float)local_740._4_4_;
                      fVar200 = fStack_738;
                      fVar202 = fStack_734;
                      fVar224 = fStack_730;
                      fVar227 = fStack_72c;
                      fVar230 = fStack_728;
                      goto LAB_0102532f;
                    }
                    auVar219 = ZEXT1664(auVar210);
                    auVar242 = ZEXT1664(auVar236);
                    (*pcVar20)(&local_650);
                    if (*local_650.valid != 0) goto LAB_010256b6;
LAB_010256ff:
                    ray->tfar = (float)local_4e0._0_4_;
                    uVar137 = (ulong)local_720 ^ 1L << (local_680._0_8_ & 0x3f);
                    lVar134 = 0;
                    if (uVar137 != 0) {
                      for (; (uVar137 >> lVar134 & 1) == 0; lVar134 = lVar134 + 1) {
                      }
                    }
                    bVar140 = false;
                    local_720 = (undefined1  [8])uVar137;
                    auVar295 = ZEXT3264(local_6c0);
                    auVar312 = ZEXT3264(local_6e0);
                    auVar331 = ZEXT3264(_local_700);
                    fVar318 = (float)local_6a0._0_4_;
                    fVar322 = (float)local_6a0._4_4_;
                    fVar323 = fStack_698;
                    fVar324 = fStack_694;
                    fVar205 = fStack_690;
                    fVar220 = fStack_68c;
                    fVar221 = fStack_688;
                    fVar222 = fStack_684;
                    fVar233 = (float)local_790._0_4_;
                    fVar243 = (float)local_790._4_4_;
                    fVar244 = (float)uStack_788;
                    fVar245 = uStack_788._4_4_;
                    fVar186 = (float)local_740._0_4_;
                    fVar198 = (float)local_740._4_4_;
                    fVar200 = fStack_738;
                    fVar202 = fStack_734;
                    fVar224 = fStack_730;
                    fVar227 = fStack_72c;
                    fVar230 = fStack_728;
                    auVar12 = _local_790;
                  } while (uVar137 != 0);
                }
              }
              goto LAB_01025341;
            }
          }
          goto LAB_01024c90;
        }
        bVar140 = false;
        _local_790 = auVar12;
LAB_0102532f:
        fVar318 = (float)local_6a0._0_4_;
        fVar322 = (float)local_6a0._4_4_;
        fVar323 = fStack_698;
        fVar324 = fStack_694;
        fVar205 = fStack_690;
        fVar220 = fStack_68c;
        fVar221 = fStack_688;
        fVar222 = fStack_684;
        auVar12 = _local_790;
      }
LAB_01025341:
      _local_790 = auVar12;
      if (8 < (int)uVar19) {
        _local_380 = vpshufd_avx(ZEXT416(uVar19),0);
        auVar254 = vshufps_avx(local_750,local_750,0);
        local_3a0._16_16_ = auVar254;
        local_3a0._0_16_ = auVar254;
        auVar254 = vpermilps_avx(local_5a0._0_16_,0xff);
        local_c0._16_16_ = auVar254;
        local_c0._0_16_ = auVar254;
        auVar146._0_4_ = 1.0 / (float)local_460._0_4_;
        auVar146._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar254 = vshufps_avx(auVar146,auVar146,0);
        _fStack_450 = auVar254;
        _local_460 = auVar254;
        auVar157 = ZEXT3264(_local_460);
        lVar134 = 8;
        local_6c0 = auVar295._0_32_;
        local_6e0 = auVar312._0_32_;
        do {
          pauVar2 = (undefined1 (*) [28])(bspline_basis0 + lVar134 * 4 + lVar139);
          fVar233 = *(float *)*pauVar2;
          fVar243 = *(float *)(*pauVar2 + 4);
          fVar244 = *(float *)(*pauVar2 + 8);
          fVar245 = *(float *)(*pauVar2 + 0xc);
          fVar246 = *(float *)(*pauVar2 + 0x10);
          fVar247 = *(float *)(*pauVar2 + 0x14);
          fVar248 = *(float *)(*pauVar2 + 0x18);
          auVar129 = *pauVar2;
          fVar250 = *(float *)pauVar2[1];
          pauVar2 = (undefined1 (*) [28])(lVar139 + 0x21aefac + lVar134 * 4);
          fVar261 = *(float *)*pauVar2;
          fVar262 = *(float *)(*pauVar2 + 4);
          fVar263 = *(float *)(*pauVar2 + 8);
          fVar264 = *(float *)(*pauVar2 + 0xc);
          fVar265 = *(float *)(*pauVar2 + 0x10);
          fVar266 = *(float *)(*pauVar2 + 0x14);
          fVar290 = *(float *)(*pauVar2 + 0x18);
          auVar128 = *pauVar2;
          pfVar3 = (float *)(lVar139 + 0x21af430 + lVar134 * 4);
          fVar223 = *pfVar3;
          fVar325 = pfVar3[1];
          fVar296 = pfVar3[2];
          fVar297 = pfVar3[3];
          fVar226 = pfVar3[4];
          fVar326 = pfVar3[5];
          fVar299 = pfVar3[6];
          pfVar3 = (float *)(lVar139 + 0x21af8b4 + lVar134 * 4);
          local_560 = *pfVar3;
          fStack_55c = pfVar3[1];
          fStack_558 = pfVar3[2];
          fStack_554 = pfVar3[3];
          fStack_550 = pfVar3[4];
          fStack_54c = pfVar3[5];
          fStack_548 = pfVar3[6];
          fStack_544 = pfVar3[7];
          fVar229 = auVar219._28_4_;
          fVar204 = fVar229 + pfVar3[7];
          fStack_764 = fVar229 + fVar229 + auVar157._28_4_;
          fVar249 = fVar229 + fVar204;
          local_5a0._0_4_ =
               (float)local_180._0_4_ * fVar233 +
               (float)local_420._0_4_ * fVar261 +
               auVar331._0_4_ * fVar223 + (float)local_440._0_4_ * local_560;
          local_5a0._4_4_ =
               (float)local_180._4_4_ * fVar243 +
               (float)local_420._4_4_ * fVar262 +
               auVar331._4_4_ * fVar325 + (float)local_440._4_4_ * fStack_55c;
          local_5a0._8_4_ =
               fStack_178 * fVar244 +
               fStack_418 * fVar263 + auVar331._8_4_ * fVar296 + fStack_438 * fStack_558;
          local_5a0._12_4_ =
               fStack_174 * fVar245 +
               fStack_414 * fVar264 + auVar331._12_4_ * fVar297 + fStack_434 * fStack_554;
          local_5a0._16_4_ =
               fStack_170 * fVar246 +
               fStack_410 * fVar265 + auVar331._16_4_ * fVar226 + fStack_430 * fStack_550;
          local_5a0._20_4_ =
               fStack_16c * fVar247 +
               fStack_40c * fVar266 + auVar331._20_4_ * fVar326 + fStack_42c * fStack_54c;
          local_5a0._24_4_ =
               fStack_168 * fVar248 +
               fStack_408 * fVar290 + auVar331._24_4_ * fVar299 + fStack_428 * fStack_548;
          local_5a0._28_4_ = fVar204 + fStack_764;
          auVar197._0_4_ =
               (float)local_100._0_4_ * fVar233 +
               (float)local_e0._0_4_ * fVar261 + fVar186 * fVar223 + fVar318 * local_560;
          auVar197._4_4_ =
               (float)local_100._4_4_ * fVar243 +
               (float)local_e0._4_4_ * fVar262 + fVar198 * fVar325 + fVar322 * fStack_55c;
          auVar197._8_4_ =
               fStack_f8 * fVar244 + fStack_d8 * fVar263 + fVar200 * fVar296 + fVar323 * fStack_558;
          auVar197._12_4_ =
               fStack_f4 * fVar245 + fStack_d4 * fVar264 + fVar202 * fVar297 + fVar324 * fStack_554;
          auVar197._16_4_ =
               fStack_f0 * fVar246 + fStack_d0 * fVar265 + fVar224 * fVar226 + fVar205 * fStack_550;
          auVar197._20_4_ =
               fStack_ec * fVar247 + fStack_cc * fVar266 + fVar227 * fVar326 + fVar220 * fStack_54c;
          auVar197._24_4_ =
               fStack_e8 * fVar248 + fStack_c8 * fVar290 + fVar230 * fVar299 + fVar221 * fStack_548;
          auVar197._28_4_ = fStack_764 + fVar229 + fVar229 + auVar242._28_4_;
          fVar144 = fVar233 * (float)local_160._0_4_ +
                    (float)local_a0._0_4_ * fVar261 +
                    fVar223 * (float)local_120._0_4_ + local_560 * (float)local_140._0_4_;
          fVar160 = fVar243 * (float)local_160._4_4_ +
                    (float)local_a0._4_4_ * fVar262 +
                    fVar325 * (float)local_120._4_4_ + fStack_55c * (float)local_140._4_4_;
          fStack_778 = fVar244 * fStack_158 +
                       fStack_98 * fVar263 + fVar296 * fStack_118 + fStack_558 * fStack_138;
          fStack_774 = fVar245 * fStack_154 +
                       fStack_94 * fVar264 + fVar297 * fStack_114 + fStack_554 * fStack_134;
          fStack_770 = fVar246 * fStack_150 +
                       fStack_90 * fVar265 + fVar226 * fStack_110 + fStack_550 * fStack_130;
          fStack_76c = fVar247 * fStack_14c +
                       fStack_8c * fVar266 + fVar326 * fStack_10c + fStack_54c * fStack_12c;
          fStack_768 = fVar248 * fStack_148 +
                       fStack_88 * fVar290 + fVar299 * fStack_108 + fStack_548 * fStack_128;
          fStack_764 = fStack_764 + fVar249;
          auVar130 = *(undefined1 (*) [24])(bspline_basis1 + lVar134 * 4 + lVar139);
          pauVar2 = (undefined1 (*) [28])(lVar139 + 0x21b13cc + lVar134 * 4);
          fVar261 = *(float *)*pauVar2;
          fVar262 = *(float *)(*pauVar2 + 4);
          fVar263 = *(float *)(*pauVar2 + 8);
          fVar264 = *(float *)(*pauVar2 + 0xc);
          fVar265 = *(float *)(*pauVar2 + 0x10);
          fVar266 = *(float *)(*pauVar2 + 0x14);
          fVar290 = *(float *)(*pauVar2 + 0x18);
          auVar131 = *pauVar2;
          auVar147 = *(undefined1 (*) [32])(lVar139 + 0x21b1850 + lVar134 * 4);
          auVar157 = ZEXT3264(auVar147);
          pfVar3 = (float *)(lVar139 + 0x21b1cd4 + lVar134 * 4);
          fVar204 = *pfVar3;
          fVar229 = pfVar3[1];
          fVar327 = pfVar3[2];
          fVar300 = pfVar3[3];
          fVar301 = pfVar3[4];
          fVar232 = pfVar3[5];
          fVar184 = pfVar3[6];
          fVar233 = auVar147._0_4_;
          fVar243 = auVar147._4_4_;
          fVar244 = auVar147._8_4_;
          fVar245 = auVar147._12_4_;
          fVar246 = auVar147._16_4_;
          fVar247 = auVar147._20_4_;
          fVar248 = auVar147._24_4_;
          fVar277 = fVar250 + pfVar3[7];
          fVar249 = fVar250 + fVar250 + fVar249;
          local_720._0_4_ = auVar130._0_4_;
          local_720._4_4_ = auVar130._4_4_;
          auStack_718._0_4_ = auVar130._8_4_;
          auStack_718._4_4_ = auVar130._12_4_;
          auStack_710._0_4_ = auVar130._16_4_;
          auStack_710._4_4_ = auVar130._20_4_;
          fStack_708 = (float)*(undefined8 *)
                               ((undefined1 (*) [24])(bspline_basis1 + lVar134 * 4 + lVar139))[1];
          local_360._0_4_ =
               (float)local_180._0_4_ * (float)local_720._0_4_ +
               (float)local_420._0_4_ * fVar261 +
               auVar331._0_4_ * fVar233 + (float)local_440._0_4_ * fVar204;
          local_360._4_4_ =
               (float)local_180._4_4_ * (float)local_720._4_4_ +
               (float)local_420._4_4_ * fVar262 +
               auVar331._4_4_ * fVar243 + (float)local_440._4_4_ * fVar229;
          local_360._8_4_ =
               fStack_178 * (float)auStack_718._0_4_ +
               fStack_418 * fVar263 + auVar331._8_4_ * fVar244 + fStack_438 * fVar327;
          local_360._12_4_ =
               fStack_174 * (float)auStack_718._4_4_ +
               fStack_414 * fVar264 + auVar331._12_4_ * fVar245 + fStack_434 * fVar300;
          local_360._16_4_ =
               fStack_170 * (float)auStack_710._0_4_ +
               fStack_410 * fVar265 + auVar331._16_4_ * fVar246 + fStack_430 * fVar301;
          local_360._20_4_ =
               fStack_16c * (float)auStack_710._4_4_ +
               fStack_40c * fVar266 + auVar331._20_4_ * fVar247 + fStack_42c * fVar232;
          local_360._24_4_ =
               fStack_168 * fStack_708 +
               fStack_408 * fVar290 + auVar331._24_4_ * fVar248 + fStack_428 * fVar184;
          local_360._28_4_ = fVar277 + fVar249;
          local_4e0._0_4_ =
               (float)local_100._0_4_ * (float)local_720._0_4_ +
               (float)local_e0._0_4_ * fVar261 + fVar186 * fVar233 + fVar318 * fVar204;
          local_4e0._4_4_ =
               (float)local_100._4_4_ * (float)local_720._4_4_ +
               (float)local_e0._4_4_ * fVar262 + fVar198 * fVar243 + fVar322 * fVar229;
          local_4e0._8_4_ =
               fStack_f8 * (float)auStack_718._0_4_ +
               fStack_d8 * fVar263 + fVar200 * fVar244 + fVar323 * fVar327;
          local_4e0._12_4_ =
               fStack_f4 * (float)auStack_718._4_4_ +
               fStack_d4 * fVar264 + fVar202 * fVar245 + fVar324 * fVar300;
          local_4e0._16_4_ =
               fStack_f0 * (float)auStack_710._0_4_ +
               fStack_d0 * fVar265 + fVar224 * fVar246 + fVar205 * fVar301;
          local_4e0._20_4_ =
               fStack_ec * (float)auStack_710._4_4_ +
               fStack_cc * fVar266 + fVar227 * fVar247 + fVar220 * fVar232;
          local_4e0._24_4_ =
               fStack_e8 * fStack_708 + fStack_c8 * fVar290 + fVar230 * fVar248 + fVar221 * fVar184;
          local_4e0._28_4_ = fVar249 + fVar250 + fVar250 + fVar222;
          auVar309._0_4_ =
               (float)local_a0._0_4_ * fVar261 +
               fVar233 * (float)local_120._0_4_ + fVar204 * (float)local_140._0_4_ +
               (float)local_720._0_4_ * (float)local_160._0_4_;
          auVar309._4_4_ =
               (float)local_a0._4_4_ * fVar262 +
               fVar243 * (float)local_120._4_4_ + fVar229 * (float)local_140._4_4_ +
               (float)local_720._4_4_ * (float)local_160._4_4_;
          auVar309._8_4_ =
               fStack_98 * fVar263 + fVar244 * fStack_118 + fVar327 * fStack_138 +
               (float)auStack_718._0_4_ * fStack_158;
          auVar309._12_4_ =
               fStack_94 * fVar264 + fVar245 * fStack_114 + fVar300 * fStack_134 +
               (float)auStack_718._4_4_ * fStack_154;
          auVar309._16_4_ =
               fStack_90 * fVar265 + fVar246 * fStack_110 + fVar301 * fStack_130 +
               (float)auStack_710._0_4_ * fStack_150;
          auVar309._20_4_ =
               fStack_8c * fVar266 + fVar247 * fStack_10c + fVar232 * fStack_12c +
               (float)auStack_710._4_4_ * fStack_14c;
          auVar309._24_4_ =
               fStack_88 * fVar290 + fVar248 * fStack_108 + fVar184 * fStack_128 +
               fStack_708 * fStack_148;
          auVar309._28_4_ = fVar250 + fVar277 + fVar249;
          auVar219 = ZEXT3264(auVar331._0_32_);
          auVar23 = vsubps_avx(local_360,local_5a0);
          auVar24 = vsubps_avx(local_4e0._0_32_,auVar197);
          fVar250 = auVar23._0_4_;
          fVar261 = auVar23._4_4_;
          auVar71._4_4_ = fVar261 * auVar197._4_4_;
          auVar71._0_4_ = fVar250 * auVar197._0_4_;
          fVar262 = auVar23._8_4_;
          auVar71._8_4_ = fVar262 * auVar197._8_4_;
          fVar263 = auVar23._12_4_;
          auVar71._12_4_ = fVar263 * auVar197._12_4_;
          fVar264 = auVar23._16_4_;
          auVar71._16_4_ = fVar264 * auVar197._16_4_;
          fVar265 = auVar23._20_4_;
          auVar71._20_4_ = fVar265 * auVar197._20_4_;
          fVar266 = auVar23._24_4_;
          auVar71._24_4_ = fVar266 * auVar197._24_4_;
          auVar71._28_4_ = fVar249;
          fVar205 = auVar24._0_4_;
          fVar220 = auVar24._4_4_;
          auVar72._4_4_ = local_5a0._4_4_ * fVar220;
          auVar72._0_4_ = (float)local_5a0._0_4_ * fVar205;
          fVar221 = auVar24._8_4_;
          auVar72._8_4_ = local_5a0._8_4_ * fVar221;
          fVar222 = auVar24._12_4_;
          auVar72._12_4_ = local_5a0._12_4_ * fVar222;
          fVar224 = auVar24._16_4_;
          auVar72._16_4_ = local_5a0._16_4_ * fVar224;
          fVar227 = auVar24._20_4_;
          auVar72._20_4_ = local_5a0._20_4_ * fVar227;
          fVar230 = auVar24._24_4_;
          auVar72._24_4_ = local_5a0._24_4_ * fVar230;
          auVar72._28_4_ = local_4e0._28_4_;
          auVar25 = vsubps_avx(auVar71,auVar72);
          auVar121._4_4_ = fVar160;
          auVar121._0_4_ = fVar144;
          auVar121._8_4_ = fStack_778;
          auVar121._12_4_ = fStack_774;
          auVar121._16_4_ = fStack_770;
          auVar121._20_4_ = fStack_76c;
          auVar121._24_4_ = fStack_768;
          auVar121._28_4_ = fStack_764;
          auVar306 = vmaxps_avx(auVar121,auVar309);
          auVar73._4_4_ = auVar306._4_4_ * auVar306._4_4_ * (fVar261 * fVar261 + fVar220 * fVar220);
          auVar73._0_4_ = auVar306._0_4_ * auVar306._0_4_ * (fVar250 * fVar250 + fVar205 * fVar205);
          auVar73._8_4_ = auVar306._8_4_ * auVar306._8_4_ * (fVar262 * fVar262 + fVar221 * fVar221);
          auVar73._12_4_ =
               auVar306._12_4_ * auVar306._12_4_ * (fVar263 * fVar263 + fVar222 * fVar222);
          auVar73._16_4_ =
               auVar306._16_4_ * auVar306._16_4_ * (fVar264 * fVar264 + fVar224 * fVar224);
          auVar73._20_4_ =
               auVar306._20_4_ * auVar306._20_4_ * (fVar265 * fVar265 + fVar227 * fVar227);
          auVar73._24_4_ =
               auVar306._24_4_ * auVar306._24_4_ * (fVar266 * fVar266 + fVar230 * fVar230);
          auVar73._28_4_ = fVar277 + local_4e0._28_4_;
          auVar74._4_4_ = auVar25._4_4_ * auVar25._4_4_;
          auVar74._0_4_ = auVar25._0_4_ * auVar25._0_4_;
          auVar74._8_4_ = auVar25._8_4_ * auVar25._8_4_;
          auVar74._12_4_ = auVar25._12_4_ * auVar25._12_4_;
          auVar74._16_4_ = auVar25._16_4_ * auVar25._16_4_;
          auVar74._20_4_ = auVar25._20_4_ * auVar25._20_4_;
          auVar74._24_4_ = auVar25._24_4_ * auVar25._24_4_;
          auVar74._28_4_ = auVar25._28_4_;
          auVar242 = ZEXT3264(auVar74);
          auVar306 = vcmpps_avx(auVar74,auVar73,2);
          local_750._0_8_ = lVar134;
          local_2c0 = (uint)lVar134;
          auVar191 = vpshufd_avx(ZEXT416(local_2c0),0);
          auVar254 = vpor_avx(auVar191,_DAT_01f7fcf0);
          auVar191 = vpor_avx(auVar191,_DAT_01fafea0);
          auVar254 = vpcmpgtd_avx(_local_380,auVar254);
          auVar191 = vpcmpgtd_avx(_local_380,auVar191);
          register0x00001250 = auVar191;
          _local_4a0 = auVar254;
          auVar25 = _local_4a0 & auVar306;
          fVar318 = (float)local_6a0._0_4_;
          fVar322 = (float)local_6a0._4_4_;
          fVar323 = fStack_698;
          fVar324 = fStack_694;
          fVar205 = fStack_690;
          fVar220 = fStack_68c;
          fVar221 = fStack_688;
          fVar222 = fStack_684;
          fVar186 = (float)local_740._0_4_;
          fVar198 = (float)local_740._4_4_;
          fVar200 = fStack_738;
          fVar202 = fStack_734;
          fVar224 = fStack_730;
          fVar227 = fStack_72c;
          fVar230 = fStack_728;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0x7f,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0xbf,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar25[0x1f]) {
            auVar295 = ZEXT3264(local_6c0);
            auVar312 = ZEXT3264(local_6e0);
            auVar331 = ZEXT3264(auVar331._0_32_);
          }
          else {
            local_580._0_4_ = auVar131._0_4_;
            local_580._4_4_ = auVar131._4_4_;
            fStack_578 = auVar131._8_4_;
            fStack_574 = auVar131._12_4_;
            fStack_570 = auVar131._16_4_;
            fStack_56c = auVar131._20_4_;
            fStack_568 = auVar131._24_4_;
            fVar250 = (float)local_400._0_4_ * (float)local_580._0_4_;
            fVar261 = (float)local_400._4_4_ * (float)local_580._4_4_;
            fVar262 = fStack_3f8 * fStack_578;
            fVar263 = fStack_3f4 * fStack_574;
            fVar264 = fStack_3f0 * fStack_570;
            fVar265 = fStack_3ec * fStack_56c;
            fVar266 = fStack_3e8 * fStack_568;
            _local_580 = auVar306;
            local_480 = (float)local_720._0_4_ * (float)local_1a0._0_4_ +
                        fVar250 + (float)local_340._0_4_ * fVar233 +
                                  (float)local_620._0_4_ * fVar204;
            fStack_47c = (float)local_720._4_4_ * (float)local_1a0._4_4_ +
                         fVar261 + (float)local_340._4_4_ * fVar243 +
                                   (float)local_620._4_4_ * fVar229;
            fStack_478 = (float)auStack_718._0_4_ * fStack_198 +
                         fVar262 + fStack_338 * fVar244 + fStack_618 * fVar327;
            fStack_474 = (float)auStack_718._4_4_ * fStack_194 +
                         fVar263 + fStack_334 * fVar245 + fStack_614 * fVar300;
            fStack_470 = (float)auStack_710._0_4_ * fStack_190 +
                         fVar264 + fStack_330 * fVar246 + fStack_610 * fVar301;
            fStack_46c = (float)auStack_710._4_4_ * fStack_18c +
                         fVar265 + fStack_32c * fVar247 + fStack_60c * fVar232;
            fStack_468 = fStack_708 * fStack_188 +
                         fVar266 + fStack_328 * fVar248 + fStack_608 * fVar184;
            fStack_464 = auVar309._28_4_ + auVar147._28_4_ + auVar191._12_4_ + 0.0;
            local_520._0_4_ = auVar128._0_4_;
            local_520._4_4_ = auVar128._4_4_;
            fStack_518 = auVar128._8_4_;
            fStack_514 = auVar128._12_4_;
            fStack_510 = auVar128._16_4_;
            fStack_50c = auVar128._20_4_;
            fStack_508 = auVar128._24_4_;
            pfVar3 = (float *)(lVar139 + 0x21b0640 + lVar134 * 4);
            fVar233 = *pfVar3;
            fVar243 = pfVar3[1];
            fVar244 = pfVar3[2];
            fVar245 = pfVar3[3];
            fVar246 = pfVar3[4];
            fVar247 = pfVar3[5];
            fVar248 = pfVar3[6];
            pfVar4 = (float *)(lVar139 + 0x21b0ac4 + lVar134 * 4);
            fVar250 = *pfVar4;
            fVar261 = pfVar4[1];
            fVar262 = pfVar4[2];
            fVar263 = pfVar4[3];
            fVar264 = pfVar4[4];
            fVar265 = pfVar4[5];
            fVar266 = pfVar4[6];
            pfVar5 = (float *)(lVar139 + 0x21b01bc + lVar134 * 4);
            fVar290 = *pfVar5;
            fVar204 = pfVar5[1];
            fVar229 = pfVar5[2];
            fVar327 = pfVar5[3];
            fVar300 = pfVar5[4];
            fVar301 = pfVar5[5];
            fVar232 = pfVar5[6];
            fVar166 = pfVar3[7] + pfVar4[7];
            fVar185 = pfVar4[7] + fStack_e4 + 0.0;
            fVar278 = fStack_e4 + fStack_164 + fStack_e4 + 0.0;
            pfVar3 = (float *)(lVar139 + 0x21afd38 + lVar134 * 4);
            fVar184 = *pfVar3;
            fVar249 = pfVar3[1];
            fVar277 = pfVar3[2];
            fVar163 = pfVar3[3];
            fVar164 = pfVar3[4];
            fVar165 = pfVar3[5];
            fVar206 = pfVar3[6];
            local_540 = (float)local_180._0_4_ * fVar184 +
                        fVar290 * (float)local_420._0_4_ +
                        fVar233 * (float)local_700._0_4_ + (float)local_440._0_4_ * fVar250;
            fStack_53c = (float)local_180._4_4_ * fVar249 +
                         fVar204 * (float)local_420._4_4_ +
                         fVar243 * (float)local_700._4_4_ + (float)local_440._4_4_ * fVar261;
            fStack_538 = fStack_178 * fVar277 +
                         fVar229 * fStack_418 + fVar244 * fStack_6f8 + fStack_438 * fVar262;
            fStack_534 = fStack_174 * fVar163 +
                         fVar327 * fStack_414 + fVar245 * fStack_6f4 + fStack_434 * fVar263;
            fStack_530 = fStack_170 * fVar164 +
                         fVar300 * fStack_410 + fVar246 * fStack_6f0 + fStack_430 * fVar264;
            fStack_52c = fStack_16c * fVar165 +
                         fVar301 * fStack_40c + fVar247 * fStack_6ec + fStack_42c * fVar265;
            fStack_528 = fStack_168 * fVar206 +
                         fVar232 * fStack_408 + fVar248 * fStack_6e8 + fStack_428 * fVar266;
            fStack_524 = fVar166 + fVar185;
            auVar176._0_4_ =
                 (float)local_100._0_4_ * fVar184 +
                 (float)local_740._0_4_ * fVar233 + (float)local_6a0._0_4_ * fVar250 +
                 (float)local_e0._0_4_ * fVar290;
            auVar176._4_4_ =
                 (float)local_100._4_4_ * fVar249 +
                 (float)local_740._4_4_ * fVar243 + (float)local_6a0._4_4_ * fVar261 +
                 (float)local_e0._4_4_ * fVar204;
            auVar176._8_4_ =
                 fStack_f8 * fVar277 +
                 fStack_738 * fVar244 + fStack_698 * fVar262 + fStack_d8 * fVar229;
            auVar176._12_4_ =
                 fStack_f4 * fVar163 +
                 fStack_734 * fVar245 + fStack_694 * fVar263 + fStack_d4 * fVar327;
            auVar176._16_4_ =
                 fStack_f0 * fVar164 +
                 fStack_730 * fVar246 + fStack_690 * fVar264 + fStack_d0 * fVar300;
            auVar176._20_4_ =
                 fStack_ec * fVar165 +
                 fStack_72c * fVar247 + fStack_68c * fVar265 + fStack_cc * fVar301;
            auVar176._24_4_ =
                 fStack_e8 * fVar206 +
                 fStack_728 * fVar248 + fStack_688 * fVar266 + fStack_c8 * fVar232;
            auVar176._28_4_ = fVar185 + fVar278;
            auVar347._0_4_ =
                 fVar290 * (float)local_400._0_4_ +
                 (float)local_340._0_4_ * fVar233 + (float)local_620._0_4_ * fVar250 +
                 fVar184 * (float)local_1a0._0_4_;
            auVar347._4_4_ =
                 fVar204 * (float)local_400._4_4_ +
                 (float)local_340._4_4_ * fVar243 + (float)local_620._4_4_ * fVar261 +
                 fVar249 * (float)local_1a0._4_4_;
            auVar347._8_4_ =
                 fVar229 * fStack_3f8 + fStack_338 * fVar244 + fStack_618 * fVar262 +
                 fVar277 * fStack_198;
            auVar347._12_4_ =
                 fVar327 * fStack_3f4 + fStack_334 * fVar245 + fStack_614 * fVar263 +
                 fVar163 * fStack_194;
            auVar347._16_4_ =
                 fVar300 * fStack_3f0 + fStack_330 * fVar246 + fStack_610 * fVar264 +
                 fVar164 * fStack_190;
            auVar347._20_4_ =
                 fVar301 * fStack_3ec + fStack_32c * fVar247 + fStack_60c * fVar265 +
                 fVar165 * fStack_18c;
            auVar347._24_4_ =
                 fVar232 * fStack_3e8 + fStack_328 * fVar248 + fStack_608 * fVar266 +
                 fVar206 * fStack_188;
            auVar347._28_4_ = pfVar5[7] + fVar166 + fVar278;
            pfVar3 = (float *)(lVar139 + 0x21b2a60 + lVar134 * 4);
            fVar233 = *pfVar3;
            fVar243 = pfVar3[1];
            fVar244 = pfVar3[2];
            fVar245 = pfVar3[3];
            fVar246 = pfVar3[4];
            fVar247 = pfVar3[5];
            fVar248 = pfVar3[6];
            pfVar4 = (float *)(lVar139 + 0x21b2ee4 + lVar134 * 4);
            fVar250 = *pfVar4;
            fVar261 = pfVar4[1];
            fVar262 = pfVar4[2];
            fVar263 = pfVar4[3];
            fVar264 = pfVar4[4];
            fVar265 = pfVar4[5];
            fVar266 = pfVar4[6];
            pfVar5 = (float *)(lVar139 + 0x21b25dc + lVar134 * 4);
            fVar290 = *pfVar5;
            fVar204 = pfVar5[1];
            fVar229 = pfVar5[2];
            fVar327 = pfVar5[3];
            fVar300 = pfVar5[4];
            fVar301 = pfVar5[5];
            fVar232 = pfVar5[6];
            pfVar6 = (float *)(lVar139 + 0x21b2158 + lVar134 * 4);
            fVar184 = *pfVar6;
            fVar249 = pfVar6[1];
            fVar277 = pfVar6[2];
            fVar163 = pfVar6[3];
            fVar164 = pfVar6[4];
            fVar165 = pfVar6[5];
            fVar206 = pfVar6[6];
            auVar310._0_4_ =
                 fVar184 * (float)local_180._0_4_ +
                 fVar290 * (float)local_420._0_4_ +
                 fVar233 * (float)local_700._0_4_ + fVar250 * (float)local_440._0_4_;
            auVar310._4_4_ =
                 fVar249 * (float)local_180._4_4_ +
                 fVar204 * (float)local_420._4_4_ +
                 fVar243 * (float)local_700._4_4_ + fVar261 * (float)local_440._4_4_;
            auVar310._8_4_ =
                 fVar277 * fStack_178 +
                 fVar229 * fStack_418 + fVar244 * fStack_6f8 + fVar262 * fStack_438;
            auVar310._12_4_ =
                 fVar163 * fStack_174 +
                 fVar327 * fStack_414 + fVar245 * fStack_6f4 + fVar263 * fStack_434;
            auVar310._16_4_ =
                 fVar164 * fStack_170 +
                 fVar300 * fStack_410 + fVar246 * fStack_6f0 + fVar264 * fStack_430;
            auVar310._20_4_ =
                 fVar165 * fStack_16c +
                 fVar301 * fStack_40c + fVar247 * fStack_6ec + fVar265 * fStack_42c;
            auVar310._24_4_ =
                 fVar206 * fStack_168 +
                 fVar232 * fStack_408 + fVar248 * fStack_6e8 + fVar266 * fStack_428;
            auVar310._28_4_ = fStack_604 + fStack_604 + fStack_164 + fStack_424;
            auVar338._0_4_ =
                 (float)local_100._0_4_ * fVar184 +
                 fVar290 * (float)local_e0._0_4_ +
                 (float)local_740._0_4_ * fVar233 + fVar250 * (float)local_6a0._0_4_;
            auVar338._4_4_ =
                 (float)local_100._4_4_ * fVar249 +
                 fVar204 * (float)local_e0._4_4_ +
                 (float)local_740._4_4_ * fVar243 + fVar261 * (float)local_6a0._4_4_;
            auVar338._8_4_ =
                 fStack_f8 * fVar277 +
                 fVar229 * fStack_d8 + fStack_738 * fVar244 + fVar262 * fStack_698;
            auVar338._12_4_ =
                 fStack_f4 * fVar163 +
                 fVar327 * fStack_d4 + fStack_734 * fVar245 + fVar263 * fStack_694;
            auVar338._16_4_ =
                 fStack_f0 * fVar164 +
                 fVar300 * fStack_d0 + fStack_730 * fVar246 + fVar264 * fStack_690;
            auVar338._20_4_ =
                 fStack_ec * fVar165 +
                 fVar301 * fStack_cc + fStack_72c * fVar247 + fVar265 * fStack_68c;
            auVar338._24_4_ =
                 fStack_e8 * fVar206 +
                 fVar232 * fStack_c8 + fStack_728 * fVar248 + fVar266 * fStack_688;
            auVar338._28_4_ = fStack_604 + fStack_604 + fStack_c4 + fStack_604;
            auVar260._8_4_ = 0x7fffffff;
            auVar260._0_8_ = 0x7fffffff7fffffff;
            auVar260._12_4_ = 0x7fffffff;
            auVar260._16_4_ = 0x7fffffff;
            auVar260._20_4_ = 0x7fffffff;
            auVar260._24_4_ = 0x7fffffff;
            auVar260._28_4_ = 0x7fffffff;
            auVar125._4_4_ = fStack_53c;
            auVar125._0_4_ = local_540;
            auVar125._8_4_ = fStack_538;
            auVar125._12_4_ = fStack_534;
            auVar125._16_4_ = fStack_530;
            auVar125._20_4_ = fStack_52c;
            auVar125._24_4_ = fStack_528;
            auVar125._28_4_ = fStack_524;
            auVar147 = vandps_avx(auVar125,auVar260);
            auVar25 = vandps_avx(auVar176,auVar260);
            auVar25 = vmaxps_avx(auVar147,auVar25);
            auVar147 = vandps_avx(auVar347,auVar260);
            auVar25 = vmaxps_avx(auVar25,auVar147);
            auVar25 = vcmpps_avx(auVar25,local_3a0,1);
            auVar26 = vblendvps_avx(auVar125,auVar23,auVar25);
            auVar154._0_4_ =
                 fVar184 * (float)local_1a0._0_4_ +
                 fVar290 * (float)local_400._0_4_ +
                 fVar250 * (float)local_620._0_4_ + (float)local_340._0_4_ * fVar233;
            auVar154._4_4_ =
                 fVar249 * (float)local_1a0._4_4_ +
                 fVar204 * (float)local_400._4_4_ +
                 fVar261 * (float)local_620._4_4_ + (float)local_340._4_4_ * fVar243;
            auVar154._8_4_ =
                 fVar277 * fStack_198 +
                 fVar229 * fStack_3f8 + fVar262 * fStack_618 + fStack_338 * fVar244;
            auVar154._12_4_ =
                 fVar163 * fStack_194 +
                 fVar327 * fStack_3f4 + fVar263 * fStack_614 + fStack_334 * fVar245;
            auVar154._16_4_ =
                 fVar164 * fStack_190 +
                 fVar300 * fStack_3f0 + fVar264 * fStack_610 + fStack_330 * fVar246;
            auVar154._20_4_ =
                 fVar165 * fStack_18c +
                 fVar301 * fStack_3ec + fVar265 * fStack_60c + fStack_32c * fVar247;
            auVar154._24_4_ =
                 fVar206 * fStack_188 +
                 fVar232 * fStack_3e8 + fVar266 * fStack_608 + fStack_328 * fVar248;
            auVar154._28_4_ = auVar147._28_4_ + pfVar5[7] + pfVar4[7] + pfVar3[7];
            auVar27 = vblendvps_avx(auVar176,auVar24,auVar25);
            auVar147 = vandps_avx(auVar310,auVar260);
            auVar25 = vandps_avx(auVar338,auVar260);
            auVar28 = vmaxps_avx(auVar147,auVar25);
            auVar147 = vandps_avx(auVar154,auVar260);
            auVar147 = vmaxps_avx(auVar28,auVar147);
            local_500._0_4_ = auVar129._0_4_;
            local_500._4_4_ = auVar129._4_4_;
            fStack_4f8 = auVar129._8_4_;
            fStack_4f4 = auVar129._12_4_;
            fStack_4f0 = auVar129._16_4_;
            fStack_4ec = auVar129._20_4_;
            fStack_4e8 = auVar129._24_4_;
            auVar25 = vcmpps_avx(auVar147,local_3a0,1);
            auVar147 = vblendvps_avx(auVar310,auVar23,auVar25);
            auVar155._0_4_ =
                 (float)local_1a0._0_4_ * (float)local_500._0_4_ +
                 (float)local_400._0_4_ * (float)local_520._0_4_ +
                 (float)local_340._0_4_ * fVar223 + (float)local_620._0_4_ * local_560;
            auVar155._4_4_ =
                 (float)local_1a0._4_4_ * (float)local_500._4_4_ +
                 (float)local_400._4_4_ * (float)local_520._4_4_ +
                 (float)local_340._4_4_ * fVar325 + (float)local_620._4_4_ * fStack_55c;
            auVar155._8_4_ =
                 fStack_198 * fStack_4f8 +
                 fStack_3f8 * fStack_518 + fStack_338 * fVar296 + fStack_618 * fStack_558;
            auVar155._12_4_ =
                 fStack_194 * fStack_4f4 +
                 fStack_3f4 * fStack_514 + fStack_334 * fVar297 + fStack_614 * fStack_554;
            auVar155._16_4_ =
                 fStack_190 * fStack_4f0 +
                 fStack_3f0 * fStack_510 + fStack_330 * fVar226 + fStack_610 * fStack_550;
            auVar155._20_4_ =
                 fStack_18c * fStack_4ec +
                 fStack_3ec * fStack_50c + fStack_32c * fVar326 + fStack_60c * fStack_54c;
            auVar155._24_4_ =
                 fStack_188 * fStack_4e8 +
                 fStack_3e8 * fStack_508 + fStack_328 * fVar299 + fStack_608 * fStack_548;
            auVar155._28_4_ = auVar28._28_4_ + fStack_464 + auVar191._12_4_ + 0.0;
            auVar25 = vblendvps_avx(auVar338,auVar24,auVar25);
            fVar166 = auVar26._0_4_;
            fVar185 = auVar26._4_4_;
            fVar278 = auVar26._8_4_;
            fVar225 = auVar26._12_4_;
            fVar228 = auVar26._16_4_;
            fVar231 = auVar26._20_4_;
            fVar142 = auVar26._24_4_;
            fVar143 = auVar26._28_4_;
            fVar290 = auVar147._0_4_;
            fVar325 = auVar147._4_4_;
            fVar297 = auVar147._8_4_;
            fVar326 = auVar147._12_4_;
            fVar204 = auVar147._16_4_;
            fVar327 = auVar147._20_4_;
            fVar301 = auVar147._24_4_;
            fVar233 = auVar27._0_4_;
            fVar244 = auVar27._4_4_;
            fVar246 = auVar27._8_4_;
            fVar248 = auVar27._12_4_;
            fVar261 = auVar27._16_4_;
            fVar263 = auVar27._20_4_;
            fVar265 = auVar27._24_4_;
            auVar321._0_4_ = fVar233 * fVar233 + fVar166 * fVar166;
            auVar321._4_4_ = fVar244 * fVar244 + fVar185 * fVar185;
            auVar321._8_4_ = fVar246 * fVar246 + fVar278 * fVar278;
            auVar321._12_4_ = fVar248 * fVar248 + fVar225 * fVar225;
            auVar321._16_4_ = fVar261 * fVar261 + fVar228 * fVar228;
            auVar321._20_4_ = fVar263 * fVar263 + fVar231 * fVar231;
            auVar321._24_4_ = fVar265 * fVar265 + fVar142 * fVar142;
            auVar321._28_4_ = auVar23._28_4_ + auVar24._28_4_;
            auVar23 = vrsqrtps_avx(auVar321);
            fVar243 = auVar23._0_4_;
            fVar245 = auVar23._4_4_;
            auVar75._4_4_ = fVar245 * 1.5;
            auVar75._0_4_ = fVar243 * 1.5;
            fVar247 = auVar23._8_4_;
            auVar75._8_4_ = fVar247 * 1.5;
            fVar250 = auVar23._12_4_;
            auVar75._12_4_ = fVar250 * 1.5;
            fVar262 = auVar23._16_4_;
            auVar75._16_4_ = fVar262 * 1.5;
            fVar264 = auVar23._20_4_;
            auVar75._20_4_ = fVar264 * 1.5;
            fVar266 = auVar23._24_4_;
            auVar75._24_4_ = fVar266 * 1.5;
            auVar75._28_4_ = auVar338._28_4_;
            auVar76._4_4_ = fVar245 * fVar245 * fVar245 * auVar321._4_4_ * 0.5;
            auVar76._0_4_ = fVar243 * fVar243 * fVar243 * auVar321._0_4_ * 0.5;
            auVar76._8_4_ = fVar247 * fVar247 * fVar247 * auVar321._8_4_ * 0.5;
            auVar76._12_4_ = fVar250 * fVar250 * fVar250 * auVar321._12_4_ * 0.5;
            auVar76._16_4_ = fVar262 * fVar262 * fVar262 * auVar321._16_4_ * 0.5;
            auVar76._20_4_ = fVar264 * fVar264 * fVar264 * auVar321._20_4_ * 0.5;
            auVar76._24_4_ = fVar266 * fVar266 * fVar266 * auVar321._24_4_ * 0.5;
            auVar76._28_4_ = auVar321._28_4_;
            auVar24 = vsubps_avx(auVar75,auVar76);
            fVar184 = auVar24._0_4_;
            fVar249 = auVar24._4_4_;
            fVar277 = auVar24._8_4_;
            fVar163 = auVar24._12_4_;
            fVar164 = auVar24._16_4_;
            fVar165 = auVar24._20_4_;
            fVar206 = auVar24._24_4_;
            fVar243 = auVar25._0_4_;
            fVar245 = auVar25._4_4_;
            fVar247 = auVar25._8_4_;
            fVar250 = auVar25._12_4_;
            fVar262 = auVar25._16_4_;
            fVar264 = auVar25._20_4_;
            fVar266 = auVar25._24_4_;
            auVar294._0_4_ = fVar243 * fVar243 + fVar290 * fVar290;
            auVar294._4_4_ = fVar245 * fVar245 + fVar325 * fVar325;
            auVar294._8_4_ = fVar247 * fVar247 + fVar297 * fVar297;
            auVar294._12_4_ = fVar250 * fVar250 + fVar326 * fVar326;
            auVar294._16_4_ = fVar262 * fVar262 + fVar204 * fVar204;
            auVar294._20_4_ = fVar264 * fVar264 + fVar327 * fVar327;
            auVar294._24_4_ = fVar266 * fVar266 + fVar301 * fVar301;
            auVar294._28_4_ = auVar23._28_4_ + auVar147._28_4_;
            auVar147 = vrsqrtps_avx(auVar294);
            fVar223 = auVar147._0_4_;
            fVar296 = auVar147._4_4_;
            auVar77._4_4_ = fVar296 * 1.5;
            auVar77._0_4_ = fVar223 * 1.5;
            fVar226 = auVar147._8_4_;
            auVar77._8_4_ = fVar226 * 1.5;
            fVar299 = auVar147._12_4_;
            auVar77._12_4_ = fVar299 * 1.5;
            fVar229 = auVar147._16_4_;
            auVar77._16_4_ = fVar229 * 1.5;
            fVar300 = auVar147._20_4_;
            auVar77._20_4_ = fVar300 * 1.5;
            fVar232 = auVar147._24_4_;
            auVar77._24_4_ = fVar232 * 1.5;
            auVar77._28_4_ = auVar338._28_4_;
            auVar78._4_4_ = fVar296 * fVar296 * fVar296 * auVar294._4_4_ * 0.5;
            auVar78._0_4_ = fVar223 * fVar223 * fVar223 * auVar294._0_4_ * 0.5;
            auVar78._8_4_ = fVar226 * fVar226 * fVar226 * auVar294._8_4_ * 0.5;
            auVar78._12_4_ = fVar299 * fVar299 * fVar299 * auVar294._12_4_ * 0.5;
            auVar78._16_4_ = fVar229 * fVar229 * fVar229 * auVar294._16_4_ * 0.5;
            auVar78._20_4_ = fVar300 * fVar300 * fVar300 * auVar294._20_4_ * 0.5;
            auVar78._24_4_ = fVar232 * fVar232 * fVar232 * auVar294._24_4_ * 0.5;
            auVar78._28_4_ = auVar294._28_4_;
            auVar23 = vsubps_avx(auVar77,auVar78);
            fVar223 = auVar23._0_4_;
            fVar296 = auVar23._4_4_;
            fVar226 = auVar23._8_4_;
            fVar299 = auVar23._12_4_;
            fVar229 = auVar23._16_4_;
            fVar300 = auVar23._20_4_;
            fVar232 = auVar23._24_4_;
            fVar233 = fVar144 * fVar184 * fVar233;
            fVar244 = fVar160 * fVar249 * fVar244;
            auVar79._4_4_ = fVar244;
            auVar79._0_4_ = fVar233;
            fVar246 = fStack_778 * fVar277 * fVar246;
            auVar79._8_4_ = fVar246;
            fVar248 = fStack_774 * fVar163 * fVar248;
            auVar79._12_4_ = fVar248;
            fVar261 = fStack_770 * fVar164 * fVar261;
            auVar79._16_4_ = fVar261;
            fVar263 = fStack_76c * fVar165 * fVar263;
            auVar79._20_4_ = fVar263;
            fVar265 = fStack_768 * fVar206 * fVar265;
            auVar79._24_4_ = fVar265;
            auVar79._28_4_ = auVar147._28_4_;
            local_500._4_4_ = fVar244 + local_5a0._4_4_;
            local_500._0_4_ = fVar233 + (float)local_5a0._0_4_;
            fStack_4f8 = fVar246 + local_5a0._8_4_;
            fStack_4f4 = fVar248 + local_5a0._12_4_;
            fStack_4f0 = fVar261 + local_5a0._16_4_;
            fStack_4ec = fVar263 + local_5a0._20_4_;
            fStack_4e8 = fVar265 + local_5a0._24_4_;
            fStack_4e4 = auVar147._28_4_ + local_5a0._28_4_;
            fVar233 = fVar144 * fVar184 * -fVar166;
            fVar244 = fVar160 * fVar249 * -fVar185;
            auVar80._4_4_ = fVar244;
            auVar80._0_4_ = fVar233;
            fVar246 = fStack_778 * fVar277 * -fVar278;
            auVar80._8_4_ = fVar246;
            fVar248 = fStack_774 * fVar163 * -fVar225;
            auVar80._12_4_ = fVar248;
            fVar261 = fStack_770 * fVar164 * -fVar228;
            auVar80._16_4_ = fVar261;
            fVar263 = fStack_76c * fVar165 * -fVar231;
            auVar80._20_4_ = fVar263;
            fVar265 = fStack_768 * fVar206 * -fVar142;
            auVar80._24_4_ = fVar265;
            auVar80._28_4_ = -fVar143;
            local_520._4_4_ = auVar197._4_4_ + fVar244;
            local_520._0_4_ = auVar197._0_4_ + fVar233;
            fStack_518 = auVar197._8_4_ + fVar246;
            fStack_514 = auVar197._12_4_ + fVar248;
            fStack_510 = auVar197._16_4_ + fVar261;
            fStack_50c = auVar197._20_4_ + fVar263;
            fStack_508 = auVar197._24_4_ + fVar265;
            fStack_504 = auVar197._28_4_ + -fVar143;
            fVar233 = fVar184 * 0.0 * fVar144;
            fVar244 = fVar249 * 0.0 * fVar160;
            auVar81._4_4_ = fVar244;
            auVar81._0_4_ = fVar233;
            fVar246 = fVar277 * 0.0 * fStack_778;
            auVar81._8_4_ = fVar246;
            fVar248 = fVar163 * 0.0 * fStack_774;
            auVar81._12_4_ = fVar248;
            fVar261 = fVar164 * 0.0 * fStack_770;
            auVar81._16_4_ = fVar261;
            fVar263 = fVar165 * 0.0 * fStack_76c;
            auVar81._20_4_ = fVar263;
            fVar265 = fVar206 * 0.0 * fStack_768;
            auVar81._24_4_ = fVar265;
            auVar81._28_4_ = fVar143;
            auVar147 = vsubps_avx(local_5a0,auVar79);
            auVar367._0_4_ = fVar233 + auVar155._0_4_;
            auVar367._4_4_ = fVar244 + auVar155._4_4_;
            auVar367._8_4_ = fVar246 + auVar155._8_4_;
            auVar367._12_4_ = fVar248 + auVar155._12_4_;
            auVar367._16_4_ = fVar261 + auVar155._16_4_;
            auVar367._20_4_ = fVar263 + auVar155._20_4_;
            auVar367._24_4_ = fVar265 + auVar155._24_4_;
            auVar367._28_4_ = fVar143 + auVar155._28_4_;
            fVar233 = auVar309._0_4_ * fVar223 * fVar243;
            fVar243 = auVar309._4_4_ * fVar296 * fVar245;
            auVar82._4_4_ = fVar243;
            auVar82._0_4_ = fVar233;
            fVar244 = auVar309._8_4_ * fVar226 * fVar247;
            auVar82._8_4_ = fVar244;
            fVar245 = auVar309._12_4_ * fVar299 * fVar250;
            auVar82._12_4_ = fVar245;
            fVar246 = auVar309._16_4_ * fVar229 * fVar262;
            auVar82._16_4_ = fVar246;
            fVar247 = auVar309._20_4_ * fVar300 * fVar264;
            auVar82._20_4_ = fVar247;
            fVar248 = auVar309._24_4_ * fVar232 * fVar266;
            auVar82._24_4_ = fVar248;
            auVar82._28_4_ = fStack_764;
            auVar149 = vsubps_avx(auVar197,auVar80);
            auVar348._0_4_ = local_360._0_4_ + fVar233;
            auVar348._4_4_ = local_360._4_4_ + fVar243;
            auVar348._8_4_ = local_360._8_4_ + fVar244;
            auVar348._12_4_ = local_360._12_4_ + fVar245;
            auVar348._16_4_ = local_360._16_4_ + fVar246;
            auVar348._20_4_ = local_360._20_4_ + fVar247;
            auVar348._24_4_ = local_360._24_4_ + fVar248;
            auVar348._28_4_ = local_360._28_4_ + fStack_764;
            fVar233 = fVar223 * -fVar290 * auVar309._0_4_;
            fVar243 = fVar296 * -fVar325 * auVar309._4_4_;
            auVar83._4_4_ = fVar243;
            auVar83._0_4_ = fVar233;
            fVar244 = fVar226 * -fVar297 * auVar309._8_4_;
            auVar83._8_4_ = fVar244;
            fVar245 = fVar299 * -fVar326 * auVar309._12_4_;
            auVar83._12_4_ = fVar245;
            fVar246 = fVar229 * -fVar204 * auVar309._16_4_;
            auVar83._16_4_ = fVar246;
            fVar247 = fVar300 * -fVar327 * auVar309._20_4_;
            auVar83._20_4_ = fVar247;
            fVar248 = fVar232 * -fVar301 * auVar309._24_4_;
            auVar83._24_4_ = fVar248;
            auVar83._28_4_ = local_5a0._28_4_;
            auVar171 = vsubps_avx(auVar155,auVar81);
            auVar240._0_4_ = (float)local_4e0._0_4_ + fVar233;
            auVar240._4_4_ = local_4e0._4_4_ + fVar243;
            auVar240._8_4_ = local_4e0._8_4_ + fVar244;
            auVar240._12_4_ = local_4e0._12_4_ + fVar245;
            auVar240._16_4_ = local_4e0._16_4_ + fVar246;
            auVar240._20_4_ = local_4e0._20_4_ + fVar247;
            auVar240._24_4_ = local_4e0._24_4_ + fVar248;
            auVar240._28_4_ = local_4e0._28_4_ + local_5a0._28_4_;
            fVar233 = fVar223 * 0.0 * auVar309._0_4_;
            fVar243 = fVar296 * 0.0 * auVar309._4_4_;
            auVar84._4_4_ = fVar243;
            auVar84._0_4_ = fVar233;
            fVar244 = fVar226 * 0.0 * auVar309._8_4_;
            auVar84._8_4_ = fVar244;
            fVar245 = fVar299 * 0.0 * auVar309._12_4_;
            auVar84._12_4_ = fVar245;
            fVar246 = fVar229 * 0.0 * auVar309._16_4_;
            auVar84._16_4_ = fVar246;
            fVar247 = fVar300 * 0.0 * auVar309._20_4_;
            auVar84._20_4_ = fVar247;
            fVar248 = fVar232 * 0.0 * auVar309._24_4_;
            auVar84._24_4_ = fVar248;
            auVar84._28_4_ = auVar155._28_4_;
            auVar24 = vsubps_avx(local_360,auVar82);
            auVar126._4_4_ = fStack_47c;
            auVar126._0_4_ = local_480;
            auVar126._8_4_ = fStack_478;
            auVar126._12_4_ = fStack_474;
            auVar126._16_4_ = fStack_470;
            auVar126._20_4_ = fStack_46c;
            auVar126._24_4_ = fStack_468;
            auVar126._28_4_ = fStack_464;
            auVar311._0_4_ = local_480 + fVar233;
            auVar311._4_4_ = fStack_47c + fVar243;
            auVar311._8_4_ = fStack_478 + fVar244;
            auVar311._12_4_ = fStack_474 + fVar245;
            auVar311._16_4_ = fStack_470 + fVar246;
            auVar311._20_4_ = fStack_46c + fVar247;
            auVar311._24_4_ = fStack_468 + fVar248;
            auVar311._28_4_ = fStack_464 + auVar155._28_4_;
            auVar25 = vsubps_avx(local_4e0._0_32_,auVar83);
            auVar26 = vsubps_avx(auVar126,auVar84);
            auVar27 = vsubps_avx(auVar240,auVar149);
            auVar28 = vsubps_avx(auVar311,auVar171);
            auVar85._4_4_ = auVar171._4_4_ * auVar27._4_4_;
            auVar85._0_4_ = auVar171._0_4_ * auVar27._0_4_;
            auVar85._8_4_ = auVar171._8_4_ * auVar27._8_4_;
            auVar85._12_4_ = auVar171._12_4_ * auVar27._12_4_;
            auVar85._16_4_ = auVar171._16_4_ * auVar27._16_4_;
            auVar85._20_4_ = auVar171._20_4_ * auVar27._20_4_;
            auVar85._24_4_ = auVar171._24_4_ * auVar27._24_4_;
            auVar85._28_4_ = auVar338._28_4_;
            auVar86._4_4_ = auVar149._4_4_ * auVar28._4_4_;
            auVar86._0_4_ = auVar149._0_4_ * auVar28._0_4_;
            auVar86._8_4_ = auVar149._8_4_ * auVar28._8_4_;
            auVar86._12_4_ = auVar149._12_4_ * auVar28._12_4_;
            auVar86._16_4_ = auVar149._16_4_ * auVar28._16_4_;
            auVar86._20_4_ = auVar149._20_4_ * auVar28._20_4_;
            auVar86._24_4_ = auVar149._24_4_ * auVar28._24_4_;
            auVar86._28_4_ = local_4e0._28_4_;
            auVar29 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = auVar147._4_4_ * auVar28._4_4_;
            auVar87._0_4_ = auVar147._0_4_ * auVar28._0_4_;
            auVar87._8_4_ = auVar147._8_4_ * auVar28._8_4_;
            auVar87._12_4_ = auVar147._12_4_ * auVar28._12_4_;
            auVar87._16_4_ = auVar147._16_4_ * auVar28._16_4_;
            auVar87._20_4_ = auVar147._20_4_ * auVar28._20_4_;
            auVar87._24_4_ = auVar147._24_4_ * auVar28._24_4_;
            auVar87._28_4_ = auVar28._28_4_;
            auVar28 = vsubps_avx(auVar348,auVar147);
            auVar88._4_4_ = auVar171._4_4_ * auVar28._4_4_;
            auVar88._0_4_ = auVar171._0_4_ * auVar28._0_4_;
            auVar88._8_4_ = auVar171._8_4_ * auVar28._8_4_;
            auVar88._12_4_ = auVar171._12_4_ * auVar28._12_4_;
            auVar88._16_4_ = auVar171._16_4_ * auVar28._16_4_;
            auVar88._20_4_ = auVar171._20_4_ * auVar28._20_4_;
            auVar88._24_4_ = auVar171._24_4_ * auVar28._24_4_;
            auVar88._28_4_ = auVar23._28_4_;
            auVar30 = vsubps_avx(auVar88,auVar87);
            auVar89._4_4_ = auVar149._4_4_ * auVar28._4_4_;
            auVar89._0_4_ = auVar149._0_4_ * auVar28._0_4_;
            auVar89._8_4_ = auVar149._8_4_ * auVar28._8_4_;
            auVar89._12_4_ = auVar149._12_4_ * auVar28._12_4_;
            auVar89._16_4_ = auVar149._16_4_ * auVar28._16_4_;
            auVar89._20_4_ = auVar149._20_4_ * auVar28._20_4_;
            auVar89._24_4_ = auVar149._24_4_ * auVar28._24_4_;
            auVar89._28_4_ = auVar23._28_4_;
            auVar90._4_4_ = auVar147._4_4_ * auVar27._4_4_;
            auVar90._0_4_ = auVar147._0_4_ * auVar27._0_4_;
            auVar90._8_4_ = auVar147._8_4_ * auVar27._8_4_;
            auVar90._12_4_ = auVar147._12_4_ * auVar27._12_4_;
            auVar90._16_4_ = auVar147._16_4_ * auVar27._16_4_;
            auVar90._20_4_ = auVar147._20_4_ * auVar27._20_4_;
            auVar90._24_4_ = auVar147._24_4_ * auVar27._24_4_;
            auVar90._28_4_ = auVar27._28_4_;
            auVar23 = vsubps_avx(auVar90,auVar89);
            auVar177._0_4_ = auVar29._0_4_ * 0.0 + auVar23._0_4_ + auVar30._0_4_ * 0.0;
            auVar177._4_4_ = auVar29._4_4_ * 0.0 + auVar23._4_4_ + auVar30._4_4_ * 0.0;
            auVar177._8_4_ = auVar29._8_4_ * 0.0 + auVar23._8_4_ + auVar30._8_4_ * 0.0;
            auVar177._12_4_ = auVar29._12_4_ * 0.0 + auVar23._12_4_ + auVar30._12_4_ * 0.0;
            auVar177._16_4_ = auVar29._16_4_ * 0.0 + auVar23._16_4_ + auVar30._16_4_ * 0.0;
            auVar177._20_4_ = auVar29._20_4_ * 0.0 + auVar23._20_4_ + auVar30._20_4_ * 0.0;
            auVar177._24_4_ = auVar29._24_4_ * 0.0 + auVar23._24_4_ + auVar30._24_4_ * 0.0;
            auVar177._28_4_ = auVar29._28_4_ + auVar23._28_4_ + auVar30._28_4_;
            auVar148 = vcmpps_avx(auVar177,ZEXT832(0) << 0x20,2);
            auVar23 = vblendvps_avx(auVar24,_local_500,auVar148);
            auVar219 = ZEXT3264(auVar23);
            auVar24 = vblendvps_avx(auVar25,_local_520,auVar148);
            auVar25 = vblendvps_avx(auVar26,auVar367,auVar148);
            auVar26 = vblendvps_avx(auVar147,auVar348,auVar148);
            auVar27 = vblendvps_avx(auVar149,auVar240,auVar148);
            auVar28 = vblendvps_avx(auVar171,auVar311,auVar148);
            auVar29 = vblendvps_avx(auVar348,auVar147,auVar148);
            auVar30 = vblendvps_avx(auVar240,auVar149,auVar148);
            auVar22 = vblendvps_avx(auVar311,auVar171,auVar148);
            auVar147 = vandps_avx(_local_4a0,auVar306);
            auVar29 = vsubps_avx(auVar29,auVar23);
            auVar172 = vsubps_avx(auVar30,auVar24);
            auVar22 = vsubps_avx(auVar22,auVar25);
            auVar306 = vsubps_avx(auVar24,auVar27);
            fVar233 = auVar172._0_4_;
            fVar181 = auVar25._0_4_;
            fVar250 = auVar172._4_4_;
            fVar182 = auVar25._4_4_;
            auVar91._4_4_ = fVar182 * fVar250;
            auVar91._0_4_ = fVar181 * fVar233;
            fVar290 = auVar172._8_4_;
            fVar187 = auVar25._8_4_;
            auVar91._8_4_ = fVar187 * fVar290;
            fVar299 = auVar172._12_4_;
            fVar199 = auVar25._12_4_;
            auVar91._12_4_ = fVar199 * fVar299;
            fVar184 = auVar172._16_4_;
            fVar201 = auVar25._16_4_;
            auVar91._16_4_ = fVar201 * fVar184;
            fVar166 = auVar172._20_4_;
            fVar203 = auVar25._20_4_;
            auVar91._20_4_ = fVar203 * fVar166;
            fVar143 = auVar172._24_4_;
            fVar267 = auVar25._24_4_;
            auVar91._24_4_ = fVar267 * fVar143;
            auVar91._28_4_ = auVar30._28_4_;
            fVar243 = auVar24._0_4_;
            fVar274 = auVar22._0_4_;
            fVar261 = auVar24._4_4_;
            fVar275 = auVar22._4_4_;
            auVar92._4_4_ = fVar275 * fVar261;
            auVar92._0_4_ = fVar274 * fVar243;
            fVar223 = auVar24._8_4_;
            fVar276 = auVar22._8_4_;
            auVar92._8_4_ = fVar276 * fVar223;
            fVar204 = auVar24._12_4_;
            fVar298 = auVar22._12_4_;
            auVar92._12_4_ = fVar298 * fVar204;
            fVar249 = auVar24._16_4_;
            fVar303 = auVar22._16_4_;
            auVar92._16_4_ = fVar303 * fVar249;
            fVar185 = auVar24._20_4_;
            fVar313 = auVar22._20_4_;
            auVar92._20_4_ = fVar313 * fVar185;
            fVar158 = auVar24._24_4_;
            fVar315 = auVar22._24_4_;
            uVar7 = auVar149._28_4_;
            auVar92._24_4_ = fVar315 * fVar158;
            auVar92._28_4_ = uVar7;
            auVar30 = vsubps_avx(auVar92,auVar91);
            fVar244 = auVar23._0_4_;
            fVar262 = auVar23._4_4_;
            auVar93._4_4_ = fVar275 * fVar262;
            auVar93._0_4_ = fVar274 * fVar244;
            fVar325 = auVar23._8_4_;
            auVar93._8_4_ = fVar276 * fVar325;
            fVar229 = auVar23._12_4_;
            auVar93._12_4_ = fVar298 * fVar229;
            fVar277 = auVar23._16_4_;
            auVar93._16_4_ = fVar303 * fVar277;
            fVar278 = auVar23._20_4_;
            auVar93._20_4_ = fVar313 * fVar278;
            fVar159 = auVar23._24_4_;
            auVar93._24_4_ = fVar315 * fVar159;
            auVar93._28_4_ = uVar7;
            fVar245 = auVar29._0_4_;
            fVar263 = auVar29._4_4_;
            auVar94._4_4_ = fVar182 * fVar263;
            auVar94._0_4_ = fVar181 * fVar245;
            fVar296 = auVar29._8_4_;
            auVar94._8_4_ = fVar187 * fVar296;
            fVar327 = auVar29._12_4_;
            auVar94._12_4_ = fVar199 * fVar327;
            fVar163 = auVar29._16_4_;
            auVar94._16_4_ = fVar201 * fVar163;
            fVar225 = auVar29._20_4_;
            auVar94._20_4_ = fVar203 * fVar225;
            fVar161 = auVar29._24_4_;
            auVar94._24_4_ = fVar267 * fVar161;
            auVar94._28_4_ = auVar348._28_4_;
            auVar149 = vsubps_avx(auVar94,auVar93);
            auVar95._4_4_ = fVar261 * fVar263;
            auVar95._0_4_ = fVar243 * fVar245;
            auVar95._8_4_ = fVar223 * fVar296;
            auVar95._12_4_ = fVar204 * fVar327;
            auVar95._16_4_ = fVar249 * fVar163;
            auVar95._20_4_ = fVar185 * fVar225;
            auVar95._24_4_ = fVar158 * fVar161;
            auVar95._28_4_ = uVar7;
            auVar96._4_4_ = fVar262 * fVar250;
            auVar96._0_4_ = fVar244 * fVar233;
            auVar96._8_4_ = fVar325 * fVar290;
            auVar96._12_4_ = fVar229 * fVar299;
            auVar96._16_4_ = fVar277 * fVar184;
            auVar96._20_4_ = fVar278 * fVar166;
            auVar96._24_4_ = fVar159 * fVar143;
            auVar96._28_4_ = auVar171._28_4_;
            auVar171 = vsubps_avx(auVar96,auVar95);
            auVar173 = vsubps_avx(auVar25,auVar28);
            fVar247 = auVar171._28_4_ + auVar149._28_4_;
            local_5a0._0_4_ = auVar171._0_4_ + auVar149._0_4_ * 0.0 + auVar30._0_4_ * 0.0;
            local_5a0._4_4_ = auVar171._4_4_ + auVar149._4_4_ * 0.0 + auVar30._4_4_ * 0.0;
            local_5a0._8_4_ = auVar171._8_4_ + auVar149._8_4_ * 0.0 + auVar30._8_4_ * 0.0;
            local_5a0._12_4_ = auVar171._12_4_ + auVar149._12_4_ * 0.0 + auVar30._12_4_ * 0.0;
            local_5a0._16_4_ = auVar171._16_4_ + auVar149._16_4_ * 0.0 + auVar30._16_4_ * 0.0;
            local_5a0._20_4_ = auVar171._20_4_ + auVar149._20_4_ * 0.0 + auVar30._20_4_ * 0.0;
            local_5a0._24_4_ = auVar171._24_4_ + auVar149._24_4_ * 0.0 + auVar30._24_4_ * 0.0;
            local_5a0._28_4_ = fVar247 + auVar30._28_4_;
            fVar246 = auVar306._0_4_;
            fVar264 = auVar306._4_4_;
            auVar97._4_4_ = auVar28._4_4_ * fVar264;
            auVar97._0_4_ = auVar28._0_4_ * fVar246;
            fVar297 = auVar306._8_4_;
            auVar97._8_4_ = auVar28._8_4_ * fVar297;
            fVar300 = auVar306._12_4_;
            auVar97._12_4_ = auVar28._12_4_ * fVar300;
            fVar164 = auVar306._16_4_;
            auVar97._16_4_ = auVar28._16_4_ * fVar164;
            fVar228 = auVar306._20_4_;
            auVar97._20_4_ = auVar28._20_4_ * fVar228;
            fVar162 = auVar306._24_4_;
            auVar97._24_4_ = auVar28._24_4_ * fVar162;
            auVar97._28_4_ = fVar247;
            fVar247 = auVar173._0_4_;
            fVar265 = auVar173._4_4_;
            auVar98._4_4_ = auVar27._4_4_ * fVar265;
            auVar98._0_4_ = auVar27._0_4_ * fVar247;
            fVar226 = auVar173._8_4_;
            auVar98._8_4_ = auVar27._8_4_ * fVar226;
            fVar301 = auVar173._12_4_;
            auVar98._12_4_ = auVar27._12_4_ * fVar301;
            fVar165 = auVar173._16_4_;
            auVar98._16_4_ = auVar27._16_4_ * fVar165;
            fVar231 = auVar173._20_4_;
            auVar98._20_4_ = auVar27._20_4_ * fVar231;
            fVar167 = auVar173._24_4_;
            auVar98._24_4_ = auVar27._24_4_ * fVar167;
            auVar98._28_4_ = auVar171._28_4_;
            auVar306 = vsubps_avx(auVar98,auVar97);
            auVar149 = vsubps_avx(auVar23,auVar26);
            fVar248 = auVar149._0_4_;
            fVar266 = auVar149._4_4_;
            auVar99._4_4_ = auVar28._4_4_ * fVar266;
            auVar99._0_4_ = auVar28._0_4_ * fVar248;
            fVar326 = auVar149._8_4_;
            auVar99._8_4_ = auVar28._8_4_ * fVar326;
            fVar232 = auVar149._12_4_;
            auVar99._12_4_ = auVar28._12_4_ * fVar232;
            fVar206 = auVar149._16_4_;
            auVar99._16_4_ = auVar28._16_4_ * fVar206;
            fVar142 = auVar149._20_4_;
            auVar99._20_4_ = auVar28._20_4_ * fVar142;
            fVar180 = auVar149._24_4_;
            auVar99._24_4_ = auVar28._24_4_ * fVar180;
            auVar99._28_4_ = auVar28._28_4_;
            auVar100._4_4_ = fVar265 * auVar26._4_4_;
            auVar100._0_4_ = fVar247 * auVar26._0_4_;
            auVar100._8_4_ = fVar226 * auVar26._8_4_;
            auVar100._12_4_ = fVar301 * auVar26._12_4_;
            auVar100._16_4_ = fVar165 * auVar26._16_4_;
            auVar100._20_4_ = fVar231 * auVar26._20_4_;
            auVar100._24_4_ = fVar167 * auVar26._24_4_;
            auVar100._28_4_ = auVar30._28_4_;
            auVar28 = vsubps_avx(auVar99,auVar100);
            auVar101._4_4_ = auVar27._4_4_ * fVar266;
            auVar101._0_4_ = auVar27._0_4_ * fVar248;
            auVar101._8_4_ = auVar27._8_4_ * fVar326;
            auVar101._12_4_ = auVar27._12_4_ * fVar232;
            auVar101._16_4_ = auVar27._16_4_ * fVar206;
            auVar101._20_4_ = auVar27._20_4_ * fVar142;
            auVar101._24_4_ = auVar27._24_4_ * fVar180;
            auVar101._28_4_ = auVar27._28_4_;
            auVar102._4_4_ = fVar264 * auVar26._4_4_;
            auVar102._0_4_ = fVar246 * auVar26._0_4_;
            auVar102._8_4_ = fVar297 * auVar26._8_4_;
            auVar102._12_4_ = fVar300 * auVar26._12_4_;
            auVar102._16_4_ = fVar164 * auVar26._16_4_;
            auVar102._20_4_ = fVar228 * auVar26._20_4_;
            auVar102._24_4_ = fVar162 * auVar26._24_4_;
            auVar102._28_4_ = auVar26._28_4_;
            auVar26 = vsubps_avx(auVar102,auVar101);
            auVar156._0_4_ = auVar306._0_4_ * 0.0 + auVar26._0_4_ + auVar28._0_4_ * 0.0;
            auVar156._4_4_ = auVar306._4_4_ * 0.0 + auVar26._4_4_ + auVar28._4_4_ * 0.0;
            auVar156._8_4_ = auVar306._8_4_ * 0.0 + auVar26._8_4_ + auVar28._8_4_ * 0.0;
            auVar156._12_4_ = auVar306._12_4_ * 0.0 + auVar26._12_4_ + auVar28._12_4_ * 0.0;
            auVar156._16_4_ = auVar306._16_4_ * 0.0 + auVar26._16_4_ + auVar28._16_4_ * 0.0;
            auVar156._20_4_ = auVar306._20_4_ * 0.0 + auVar26._20_4_ + auVar28._20_4_ * 0.0;
            auVar156._24_4_ = auVar306._24_4_ * 0.0 + auVar26._24_4_ + auVar28._24_4_ * 0.0;
            auVar156._28_4_ = auVar28._28_4_ + auVar26._28_4_ + auVar28._28_4_;
            auVar157 = ZEXT3264(auVar156);
            auVar306 = vmaxps_avx(local_5a0,auVar156);
            auVar306 = vcmpps_avx(auVar306,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar242 = ZEXT3264(auVar147);
            auVar26 = auVar147 & auVar306;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0x7f,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0xbf,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar26[0x1f]) {
LAB_01026586:
              auVar179._8_8_ = local_4e0._40_8_;
              auVar179._0_8_ = local_4e0._32_8_;
              auVar179._16_8_ = local_4e0._48_8_;
              auVar179._24_8_ = local_4e0._56_8_;
              auVar340._4_4_ = fVar160;
              auVar340._0_4_ = fVar144;
              auVar340._8_4_ = fStack_778;
              auVar340._12_4_ = fStack_774;
              auVar340._16_4_ = fStack_770;
              auVar340._20_4_ = fStack_76c;
              auVar340._24_4_ = fStack_768;
              auVar340._28_4_ = fStack_764;
            }
            else {
              auVar26 = vandps_avx(auVar306,auVar147);
              auVar103._4_4_ = fVar265 * fVar250;
              auVar103._0_4_ = fVar247 * fVar233;
              auVar103._8_4_ = fVar226 * fVar290;
              auVar103._12_4_ = fVar301 * fVar299;
              auVar103._16_4_ = fVar165 * fVar184;
              auVar103._20_4_ = fVar231 * fVar166;
              auVar103._24_4_ = fVar167 * fVar143;
              auVar103._28_4_ = auVar147._28_4_;
              auVar104._4_4_ = fVar264 * fVar275;
              auVar104._0_4_ = fVar246 * fVar274;
              auVar104._8_4_ = fVar297 * fVar276;
              auVar104._12_4_ = fVar300 * fVar298;
              auVar104._16_4_ = fVar164 * fVar303;
              auVar104._20_4_ = fVar228 * fVar313;
              auVar104._24_4_ = fVar162 * fVar315;
              auVar104._28_4_ = auVar306._28_4_;
              auVar27 = vsubps_avx(auVar104,auVar103);
              auVar105._4_4_ = fVar266 * fVar275;
              auVar105._0_4_ = fVar248 * fVar274;
              auVar105._8_4_ = fVar326 * fVar276;
              auVar105._12_4_ = fVar232 * fVar298;
              auVar105._16_4_ = fVar206 * fVar303;
              auVar105._20_4_ = fVar142 * fVar313;
              auVar105._24_4_ = fVar180 * fVar315;
              auVar105._28_4_ = auVar22._28_4_;
              auVar106._4_4_ = fVar265 * fVar263;
              auVar106._0_4_ = fVar247 * fVar245;
              auVar106._8_4_ = fVar226 * fVar296;
              auVar106._12_4_ = fVar301 * fVar327;
              auVar106._16_4_ = fVar165 * fVar163;
              auVar106._20_4_ = fVar231 * fVar225;
              auVar106._24_4_ = fVar167 * fVar161;
              auVar106._28_4_ = auVar173._28_4_;
              auVar28 = vsubps_avx(auVar106,auVar105);
              auVar107._4_4_ = fVar264 * fVar263;
              auVar107._0_4_ = fVar246 * fVar245;
              auVar107._8_4_ = fVar297 * fVar296;
              auVar107._12_4_ = fVar300 * fVar327;
              auVar107._16_4_ = fVar164 * fVar163;
              auVar107._20_4_ = fVar228 * fVar225;
              auVar107._24_4_ = fVar162 * fVar161;
              auVar107._28_4_ = auVar29._28_4_;
              auVar108._4_4_ = fVar266 * fVar250;
              auVar108._0_4_ = fVar248 * fVar233;
              auVar108._8_4_ = fVar326 * fVar290;
              auVar108._12_4_ = fVar232 * fVar299;
              auVar108._16_4_ = fVar206 * fVar184;
              auVar108._20_4_ = fVar142 * fVar166;
              auVar108._24_4_ = fVar180 * fVar143;
              auVar108._28_4_ = auVar172._28_4_;
              auVar30 = vsubps_avx(auVar108,auVar107);
              auVar178._0_4_ = auVar27._0_4_ * 0.0 + auVar30._0_4_ + auVar28._0_4_ * 0.0;
              auVar178._4_4_ = auVar27._4_4_ * 0.0 + auVar30._4_4_ + auVar28._4_4_ * 0.0;
              auVar178._8_4_ = auVar27._8_4_ * 0.0 + auVar30._8_4_ + auVar28._8_4_ * 0.0;
              auVar178._12_4_ = auVar27._12_4_ * 0.0 + auVar30._12_4_ + auVar28._12_4_ * 0.0;
              auVar178._16_4_ = auVar27._16_4_ * 0.0 + auVar30._16_4_ + auVar28._16_4_ * 0.0;
              auVar178._20_4_ = auVar27._20_4_ * 0.0 + auVar30._20_4_ + auVar28._20_4_ * 0.0;
              auVar178._24_4_ = auVar27._24_4_ * 0.0 + auVar30._24_4_ + auVar28._24_4_ * 0.0;
              auVar178._28_4_ = auVar172._28_4_ + auVar30._28_4_ + auVar29._28_4_;
              auVar306 = vrcpps_avx(auVar178);
              fVar245 = auVar306._0_4_;
              fVar246 = auVar306._4_4_;
              auVar109._4_4_ = auVar178._4_4_ * fVar246;
              auVar109._0_4_ = auVar178._0_4_ * fVar245;
              fVar247 = auVar306._8_4_;
              auVar109._8_4_ = auVar178._8_4_ * fVar247;
              fVar248 = auVar306._12_4_;
              auVar109._12_4_ = auVar178._12_4_ * fVar248;
              fVar250 = auVar306._16_4_;
              auVar109._16_4_ = auVar178._16_4_ * fVar250;
              fVar263 = auVar306._20_4_;
              auVar109._20_4_ = auVar178._20_4_ * fVar263;
              fVar264 = auVar306._24_4_;
              auVar109._24_4_ = auVar178._24_4_ * fVar264;
              auVar109._28_4_ = auVar173._28_4_;
              auVar339._8_4_ = 0x3f800000;
              auVar339._0_8_ = 0x3f8000003f800000;
              auVar339._12_4_ = 0x3f800000;
              auVar339._16_4_ = 0x3f800000;
              auVar339._20_4_ = 0x3f800000;
              auVar339._24_4_ = 0x3f800000;
              auVar339._28_4_ = 0x3f800000;
              auVar306 = vsubps_avx(auVar339,auVar109);
              fVar245 = auVar306._0_4_ * fVar245 + fVar245;
              fVar246 = auVar306._4_4_ * fVar246 + fVar246;
              fVar247 = auVar306._8_4_ * fVar247 + fVar247;
              fVar248 = auVar306._12_4_ * fVar248 + fVar248;
              fVar250 = auVar306._16_4_ * fVar250 + fVar250;
              fVar263 = auVar306._20_4_ * fVar263 + fVar263;
              fVar264 = auVar306._24_4_ * fVar264 + fVar264;
              auVar110._4_4_ =
                   (fVar262 * auVar27._4_4_ + auVar28._4_4_ * fVar261 + auVar30._4_4_ * fVar182) *
                   fVar246;
              auVar110._0_4_ =
                   (fVar244 * auVar27._0_4_ + auVar28._0_4_ * fVar243 + auVar30._0_4_ * fVar181) *
                   fVar245;
              auVar110._8_4_ =
                   (fVar325 * auVar27._8_4_ + auVar28._8_4_ * fVar223 + auVar30._8_4_ * fVar187) *
                   fVar247;
              auVar110._12_4_ =
                   (fVar229 * auVar27._12_4_ + auVar28._12_4_ * fVar204 + auVar30._12_4_ * fVar199)
                   * fVar248;
              auVar110._16_4_ =
                   (fVar277 * auVar27._16_4_ + auVar28._16_4_ * fVar249 + auVar30._16_4_ * fVar201)
                   * fVar250;
              auVar110._20_4_ =
                   (fVar278 * auVar27._20_4_ + auVar28._20_4_ * fVar185 + auVar30._20_4_ * fVar203)
                   * fVar263;
              auVar110._24_4_ =
                   (fVar159 * auVar27._24_4_ + auVar28._24_4_ * fVar158 + auVar30._24_4_ * fVar267)
                   * fVar264;
              auVar110._28_4_ = auVar23._28_4_ + auVar24._28_4_ + auVar25._28_4_;
              auVar219 = ZEXT3264(auVar110);
              fVar233 = ray->tfar;
              auVar241._4_4_ = fVar233;
              auVar241._0_4_ = fVar233;
              auVar241._8_4_ = fVar233;
              auVar241._12_4_ = fVar233;
              auVar241._16_4_ = fVar233;
              auVar241._20_4_ = fVar233;
              auVar241._24_4_ = fVar233;
              auVar241._28_4_ = fVar233;
              auVar306 = vcmpps_avx(local_c0,auVar110,2);
              auVar23 = vcmpps_avx(auVar110,auVar241,2);
              auVar242 = ZEXT3264(auVar23);
              auVar306 = vandps_avx(auVar306,auVar23);
              auVar24 = auVar26 & auVar306;
              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar24 >> 0x7f,0) == '\0') &&
                    (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar24 >> 0xbf,0) == '\0') &&
                  (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar24[0x1f]) goto LAB_01026586;
              auVar306 = vandps_avx(auVar26,auVar306);
              auVar24 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar178,4);
              auVar25 = auVar306 & auVar24;
              auVar179._8_8_ = local_4e0._40_8_;
              auVar179._0_8_ = local_4e0._32_8_;
              auVar179._16_8_ = local_4e0._48_8_;
              auVar179._24_8_ = local_4e0._56_8_;
              auVar340._4_4_ = fVar160;
              auVar340._0_4_ = fVar144;
              auVar340._8_4_ = fStack_778;
              auVar340._12_4_ = fStack_774;
              auVar340._16_4_ = fStack_770;
              auVar340._20_4_ = fStack_76c;
              auVar340._24_4_ = fStack_768;
              auVar340._28_4_ = fStack_764;
              if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar25 >> 0x7f,0) != '\0') ||
                    (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0xbf,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar25[0x1f] < '\0') {
                auVar179 = vandps_avx(auVar24,auVar306);
                auVar111._4_4_ = fVar246 * local_5a0._4_4_;
                auVar111._0_4_ = fVar245 * (float)local_5a0._0_4_;
                auVar111._8_4_ = fVar247 * local_5a0._8_4_;
                auVar111._12_4_ = fVar248 * local_5a0._12_4_;
                auVar111._16_4_ = fVar250 * local_5a0._16_4_;
                auVar111._20_4_ = fVar263 * local_5a0._20_4_;
                auVar111._24_4_ = fVar264 * local_5a0._24_4_;
                auVar111._28_4_ = auVar23._28_4_;
                auVar112._4_4_ = auVar156._4_4_ * fVar246;
                auVar112._0_4_ = auVar156._0_4_ * fVar245;
                auVar112._8_4_ = auVar156._8_4_ * fVar247;
                auVar112._12_4_ = auVar156._12_4_ * fVar248;
                auVar112._16_4_ = auVar156._16_4_ * fVar250;
                auVar112._20_4_ = auVar156._20_4_ * fVar263;
                auVar112._24_4_ = auVar156._24_4_ * fVar264;
                auVar112._28_4_ = auVar156._28_4_;
                auVar273._8_4_ = 0x3f800000;
                auVar273._0_8_ = 0x3f8000003f800000;
                auVar273._12_4_ = 0x3f800000;
                auVar273._16_4_ = 0x3f800000;
                auVar273._20_4_ = 0x3f800000;
                auVar273._24_4_ = 0x3f800000;
                auVar273._28_4_ = 0x3f800000;
                auVar306 = vsubps_avx(auVar273,auVar111);
                local_1c0 = vblendvps_avx(auVar306,auVar111,auVar148);
                auVar306 = vsubps_avx(auVar273,auVar112);
                auVar242 = ZEXT3264(auVar306);
                _local_3e0 = vblendvps_avx(auVar306,auVar112,auVar148);
                auVar157 = ZEXT3264(_local_3e0);
                local_1e0 = auVar110;
              }
            }
            auVar331 = ZEXT3264(_local_700);
            auVar312 = ZEXT3264(local_6e0);
            auVar295 = ZEXT3264(local_6c0);
            if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar179 >> 0x7f,0) != '\0') ||
                  (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar179 >> 0xbf,0) != '\0') ||
                (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar179[0x1f] < '\0') {
              auVar306 = vsubps_avx(auVar309,auVar340);
              auVar219 = ZEXT3264(local_1c0);
              fVar243 = auVar340._0_4_ + auVar306._0_4_ * local_1c0._0_4_;
              fVar244 = auVar340._4_4_ + auVar306._4_4_ * local_1c0._4_4_;
              fVar245 = auVar340._8_4_ + auVar306._8_4_ * local_1c0._8_4_;
              fVar246 = auVar340._12_4_ + auVar306._12_4_ * local_1c0._12_4_;
              fVar247 = auVar340._16_4_ + auVar306._16_4_ * local_1c0._16_4_;
              fVar248 = auVar340._20_4_ + auVar306._20_4_ * local_1c0._20_4_;
              fVar250 = auVar340._24_4_ + auVar306._24_4_ * local_1c0._24_4_;
              fVar261 = auVar340._28_4_ + auVar306._28_4_;
              fVar233 = local_7a0->depth_scale;
              auVar113._4_4_ = (fVar244 + fVar244) * fVar233;
              auVar113._0_4_ = (fVar243 + fVar243) * fVar233;
              auVar113._8_4_ = (fVar245 + fVar245) * fVar233;
              auVar113._12_4_ = (fVar246 + fVar246) * fVar233;
              auVar113._16_4_ = (fVar247 + fVar247) * fVar233;
              auVar113._20_4_ = (fVar248 + fVar248) * fVar233;
              auVar113._24_4_ = (fVar250 + fVar250) * fVar233;
              auVar113._28_4_ = fVar261 + fVar261;
              auVar242 = ZEXT3264(local_1e0);
              auVar306 = vcmpps_avx(local_1e0,auVar113,6);
              auVar157 = ZEXT3264(auVar306);
              auVar23 = auVar179 & auVar306;
              if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0x7f,0) != '\0') ||
                    (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0xbf,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar23[0x1f] < '\0') {
                local_260 = vandps_avx(auVar306,auVar179);
                auVar157 = ZEXT3264(local_260);
                local_300 = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
                fStack_2fc = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
                fStack_2f8 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
                fStack_2f4 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
                fStack_2f0 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
                fStack_2ec = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
                fStack_2e8 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
                fStack_2e4 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
                local_320 = local_1c0;
                local_2e0 = local_1e0;
                local_2bc = uVar19;
                local_2b0 = local_790;
                uStack_2a8 = uStack_788;
                local_2a0 = local_5b0;
                uStack_298 = uStack_5a8;
                local_290 = local_5c0;
                uStack_288 = uStack_5b8;
                local_280 = local_5d0;
                uStack_278 = uStack_5c8;
                local_680._0_8_ = (context->scene->geometries).items[uVar136].ptr;
                local_3e0._4_4_ = fStack_2fc;
                local_3e0._0_4_ = local_300;
                uStack_3d8._0_4_ = fStack_2f8;
                uStack_3d8._4_4_ = fStack_2f4;
                uStack_3d0._0_4_ = fStack_2f0;
                uStack_3d0._4_4_ = fStack_2ec;
                auVar130 = _local_3e0;
                uStack_3c8._0_4_ = fStack_2e8;
                uStack_3c8._4_4_ = fStack_2e4;
                auVar306 = _local_3e0;
                if ((((Geometry *)local_680._0_8_)->mask & ray->mask) == 0) {
                  pRVar135 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar135 = context->args;
                  if ((pRVar135->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar135 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar135 >> 8),1),
                     ((Geometry *)local_680._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_680._8_24_ = auVar147._8_24_;
                    auVar254 = vshufps_avx(ZEXT416((uint)(float)(int)local_2c0),
                                           ZEXT416((uint)(float)(int)local_2c0),0);
                    local_240[0] = (auVar254._0_4_ + local_1c0._0_4_ + 0.0) * (float)local_460._0_4_
                    ;
                    local_240[1] = (auVar254._4_4_ + local_1c0._4_4_ + 1.0) * (float)local_460._4_4_
                    ;
                    local_240[2] = (auVar254._8_4_ + local_1c0._8_4_ + 2.0) * fStack_458;
                    local_240[3] = (auVar254._12_4_ + local_1c0._12_4_ + 3.0) * fStack_454;
                    fStack_230 = (auVar254._0_4_ + local_1c0._16_4_ + 4.0) * fStack_450;
                    fStack_22c = (auVar254._4_4_ + local_1c0._20_4_ + 5.0) * fStack_44c;
                    fStack_228 = (auVar254._8_4_ + local_1c0._24_4_ + 6.0) * fStack_448;
                    fStack_224 = auVar254._12_4_ + (float)local_1c0._28_4_ + 7.0;
                    uStack_3d0 = auVar130._16_8_;
                    uStack_3c8 = auVar306._24_8_;
                    local_220 = local_3e0;
                    uStack_218 = uStack_3d8;
                    uStack_210 = uStack_3d0;
                    uStack_208 = uStack_3c8;
                    local_200 = local_1e0;
                    iVar132 = vmovmskps_avx(local_260);
                    local_720 = (undefined1  [8])CONCAT44((int)((ulong)pRVar135 >> 0x20),iVar132);
                    lVar134 = 0;
                    if (local_720 != (undefined1  [8])0x0) {
                      for (; ((ulong)local_720 >> lVar134 & 1) == 0; lVar134 = lVar134 + 1) {
                      }
                    }
                    local_780 = (uint)lVar134;
                    uStack_77c = (undefined4)((ulong)lVar134 >> 0x20);
                    _auStack_718 = auVar309._8_24_;
                    _local_3e0 = auVar306;
                    if (iVar132 == 0) {
                      pRVar135 = (RTCIntersectArguments *)0x0;
LAB_010265c6:
                      auVar295 = ZEXT3264(local_6c0);
                      auVar312 = ZEXT3264(local_6e0);
                      auVar331 = ZEXT3264(_local_700);
                    }
                    else {
                      local_5a0._0_4_ = ray->tfar;
                      pGVar138 = (Geometry *)local_680._0_8_;
                      do {
                        lVar134 = CONCAT44(uStack_77c,local_780);
                        local_5f4 = local_240[lVar134];
                        auVar157 = ZEXT464((uint)local_5f4);
                        local_5f0 = *(undefined4 *)((long)&local_220 + lVar134 * 4);
                        ray->tfar = *(float *)(local_200 + lVar134 * 4);
                        local_650.context = context->user;
                        fVar220 = 1.0 - local_5f4;
                        fVar205 = local_5f4 * fVar220 * 4.0;
                        auVar254 = ZEXT416((uint)(local_5f4 * local_5f4 * 0.5));
                        auVar254 = vshufps_avx(auVar254,auVar254,0);
                        auVar191 = ZEXT416((uint)((fVar220 * fVar220 + fVar205) * 0.5));
                        auVar191 = vshufps_avx(auVar191,auVar191,0);
                        auVar183 = ZEXT416((uint)((-local_5f4 * local_5f4 - fVar205) * 0.5));
                        auVar183 = vshufps_avx(auVar183,auVar183,0);
                        auVar237._0_4_ = auVar183._0_4_ * (float)local_5b0._0_4_;
                        auVar237._4_4_ = auVar183._4_4_ * (float)local_5b0._4_4_;
                        auVar237._8_4_ = auVar183._8_4_ * (float)uStack_5a8;
                        auVar237._12_4_ = auVar183._12_4_ * uStack_5a8._4_4_;
                        auVar242 = ZEXT1664(auVar237);
                        auVar183 = ZEXT416((uint)(fVar220 * -fVar220 * 0.5));
                        auVar183 = vshufps_avx(auVar183,auVar183,0);
                        auVar211._0_4_ = (float)local_790._0_4_ * auVar183._0_4_;
                        auVar211._4_4_ = (float)local_790._4_4_ * auVar183._4_4_;
                        auVar211._8_4_ = (float)uStack_788 * auVar183._8_4_;
                        auVar211._12_4_ = uStack_788._4_4_ * auVar183._12_4_;
                        auVar219 = ZEXT1664(auVar211);
                        auVar192._0_4_ =
                             auVar211._0_4_ +
                             auVar237._0_4_ +
                             auVar254._0_4_ * (float)local_5d0._0_4_ +
                             auVar191._0_4_ * (float)local_5c0._0_4_;
                        auVar192._4_4_ =
                             auVar211._4_4_ +
                             auVar237._4_4_ +
                             auVar254._4_4_ * (float)local_5d0._4_4_ +
                             auVar191._4_4_ * (float)local_5c0._4_4_;
                        auVar192._8_4_ =
                             auVar211._8_4_ +
                             auVar237._8_4_ +
                             auVar254._8_4_ * (float)uStack_5c8 + auVar191._8_4_ * (float)uStack_5b8
                        ;
                        auVar192._12_4_ =
                             auVar211._12_4_ +
                             auVar237._12_4_ +
                             auVar254._12_4_ * uStack_5c8._4_4_ + auVar191._12_4_ * uStack_5b8._4_4_
                        ;
                        local_600 = vmovlps_avx(auVar192);
                        local_5f8 = vextractps_avx(auVar192,2);
                        local_5ec = local_794;
                        local_5e8 = uVar136;
                        local_5e4 = (local_650.context)->instID[0];
                        local_5e0 = (local_650.context)->instPrimID[0];
                        local_7a4 = -1;
                        local_650.valid = &local_7a4;
                        local_650.geometryUserPtr = pGVar138->userPtr;
                        local_650.ray = (RTCRayN *)ray;
                        local_650.hit = (RTCHitN *)&local_600;
                        local_650.N = 1;
                        if (pGVar138->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0102646b:
                          p_Var21 = context->args->filter;
                          if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_680._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar219 = ZEXT1664(auVar219._0_16_);
                            auVar242 = ZEXT1664(auVar242._0_16_);
                            auVar157._0_8_ = (*p_Var21)(&local_650);
                            auVar157._8_56_ = extraout_var_00;
                            if (*local_650.valid == 0) goto LAB_010264b6;
                          }
                          pRVar135 = (RTCIntersectArguments *)0x1;
                          goto LAB_010265c6;
                        }
                        auVar219 = ZEXT1664(auVar211);
                        auVar242 = ZEXT1664(auVar237);
                        auVar157._0_8_ = (*pGVar138->occlusionFilterN)(&local_650);
                        auVar157._8_56_ = extraout_var;
                        if (*local_650.valid != 0) goto LAB_0102646b;
LAB_010264b6:
                        auVar157 = ZEXT464((uint)local_5a0._0_4_);
                        ray->tfar = (float)local_5a0._0_4_;
                        uVar137 = (ulong)local_720 ^ 1L << ((ulong)local_780 & 0x3f);
                        lVar134 = 0;
                        if (uVar137 != 0) {
                          for (; (uVar137 >> lVar134 & 1) == 0; lVar134 = lVar134 + 1) {
                          }
                        }
                        local_780 = (uint)lVar134;
                        uStack_77c = (undefined4)((ulong)lVar134 >> 0x20);
                        pRVar135 = (RTCIntersectArguments *)0x0;
                        local_720 = (undefined1  [8])uVar137;
                        auVar295 = ZEXT3264(local_6c0);
                        auVar312 = ZEXT3264(local_6e0);
                        auVar331 = ZEXT3264(_local_700);
                        pGVar138 = (Geometry *)local_680._0_8_;
                      } while (uVar137 != 0);
                    }
                  }
                }
                bVar140 = (bool)(bVar140 | (byte)pRVar135);
                lVar134 = local_750._0_8_;
                fVar318 = (float)local_6a0._0_4_;
                fVar322 = (float)local_6a0._4_4_;
                fVar323 = fStack_698;
                fVar324 = fStack_694;
                fVar205 = fStack_690;
                fVar220 = fStack_68c;
                fVar221 = fStack_688;
                fVar222 = fStack_684;
                fVar186 = (float)local_740._0_4_;
                fVar198 = (float)local_740._4_4_;
                fVar200 = fStack_738;
                fVar202 = fStack_734;
                fVar224 = fStack_730;
                fVar227 = fStack_72c;
                fVar230 = fStack_728;
              }
            }
          }
          lVar134 = lVar134 + 8;
        } while ((int)lVar134 < (int)uVar19);
      }
      if (bVar140 != false) {
        return bVar140;
      }
      fVar205 = ray->tfar;
      auVar153._4_4_ = fVar205;
      auVar153._0_4_ = fVar205;
      auVar153._8_4_ = fVar205;
      auVar153._12_4_ = fVar205;
      auVar153._16_4_ = fVar205;
      auVar153._20_4_ = fVar205;
      auVar153._24_4_ = fVar205;
      auVar153._28_4_ = fVar205;
      auVar147 = vcmpps_avx(local_80,auVar153,2);
      uVar136 = vmovmskps_avx(auVar147);
      uVar136 = (uint)uVar141 & uVar136;
    } while (uVar136 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }